

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined1 (*pauVar8) [32];
  Primitive PVar9;
  uint uVar10;
  uint uVar11;
  __int_type_conflict _Var12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [28];
  undefined1 auVar116 [28];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  uint uVar119;
  ulong uVar120;
  RTCIntersectArguments *pRVar121;
  ulong uVar122;
  long lVar123;
  ulong uVar124;
  Geometry *pGVar125;
  undefined4 uVar126;
  undefined8 unaff_R13;
  long lVar127;
  long lVar128;
  float fVar129;
  float fVar144;
  float fVar146;
  vint4 ai;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar135 [32];
  float fVar147;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar145;
  float fVar151;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar152;
  float fVar165;
  float fVar167;
  undefined1 auVar154 [16];
  float fVar153;
  undefined1 auVar155 [16];
  float fVar170;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar166;
  float fVar168;
  float fVar169;
  undefined1 auVar164 [64];
  float fVar171;
  float fVar186;
  float fVar187;
  vint4 bi_2;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar188;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  vint4 bi;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar192 [16];
  float fVar200;
  float fVar201;
  float fVar203;
  undefined1 auVar194 [32];
  float fVar199;
  float fVar202;
  float fVar204;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  float fVar205;
  float fVar220;
  float fVar221;
  vint4 bi_1;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  float fVar222;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar223;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar224;
  float fVar234;
  float fVar235;
  vint4 ai_1;
  undefined1 auVar227 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar233 [64];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar246;
  float fVar247;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  vint4 ai_2;
  undefined1 auVar248 [16];
  float fVar256;
  undefined1 auVar249 [16];
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar261 [16];
  float fVar265;
  float fVar266;
  float fVar268;
  float fVar270;
  float fVar271;
  undefined1 auVar262 [32];
  float fVar269;
  float fVar272;
  float fVar274;
  undefined1 auVar263 [32];
  float fVar267;
  float fVar273;
  undefined1 auVar264 [32];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar285;
  float fVar287;
  float fVar289;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar291;
  undefined1 auVar280 [16];
  float fVar290;
  float fVar292;
  undefined1 auVar288 [12];
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  float fVar286;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar308;
  float fVar309;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar311;
  undefined1 auVar305 [16];
  float fVar310;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar307 [64];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float fVar325;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  float fVar326;
  float fVar331;
  float fVar332;
  undefined1 auVar327 [16];
  float fVar333;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  uint local_7c0;
  undefined4 uStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [48];
  undefined1 local_770 [8];
  undefined8 uStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 (*local_748) [16];
  undefined1 (*local_740) [16];
  undefined1 (*local_738) [32];
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  LinearSpace3fa *local_5b0;
  Primitive *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_430 [16];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined1 local_360 [32];
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  RTCHitN local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar156 [24];
  undefined1 auVar306 [32];
  
  PVar9 = prim[1];
  uVar120 = (ulong)(byte)PVar9;
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 4 + 6)));
  auVar193 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 5 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 6 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 0xf + 6)));
  lVar127 = uVar120 * 0x25;
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 0x11 + 6)));
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 0x1a + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 0x1b + 6)));
  auVar227 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar227 = vinsertps_avx(auVar227,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar177 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar177 = vinsertps_avx(auVar177,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar227 = vsubps_avx(auVar227,*(undefined1 (*) [16])(prim + lVar127 + 6));
  fVar300 = *(float *)(prim + lVar127 + 0x12);
  auVar206._0_4_ = fVar300 * auVar227._0_4_;
  auVar206._4_4_ = fVar300 * auVar227._4_4_;
  auVar206._8_4_ = fVar300 * auVar227._8_4_;
  auVar206._12_4_ = fVar300 * auVar227._12_4_;
  auVar278._0_4_ = fVar300 * auVar177._0_4_;
  auVar278._4_4_ = fVar300 * auVar177._4_4_;
  auVar278._8_4_ = fVar300 * auVar177._8_4_;
  auVar278._12_4_ = fVar300 * auVar177._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar193);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar227 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 0x1c + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar177 = vshufps_avx(auVar278,auVar278,0x55);
  auVar193 = vshufps_avx(auVar278,auVar278,0xaa);
  fVar246 = auVar193._0_4_;
  fVar252 = auVar193._4_4_;
  fVar254 = auVar193._8_4_;
  fVar256 = auVar193._12_4_;
  fVar152 = auVar177._0_4_;
  fVar165 = auVar177._4_4_;
  fVar167 = auVar177._8_4_;
  fVar301 = auVar177._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar213);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar17 = vcvtdq2ps_avx(auVar227);
  auVar227 = vshufps_avx(auVar278,auVar278,0);
  fVar300 = auVar227._0_4_;
  fVar308 = auVar227._4_4_;
  fVar309 = auVar227._8_4_;
  fVar311 = auVar227._12_4_;
  auVar279._0_4_ = fVar300 * auVar16._0_4_ + fVar152 * auVar15._0_4_ + fVar246 * auVar20._0_4_;
  auVar279._4_4_ = fVar308 * auVar16._4_4_ + fVar165 * auVar15._4_4_ + fVar252 * auVar20._4_4_;
  auVar279._8_4_ = fVar309 * auVar16._8_4_ + fVar167 * auVar15._8_4_ + fVar254 * auVar20._8_4_;
  auVar279._12_4_ = fVar311 * auVar16._12_4_ + fVar301 * auVar15._12_4_ + fVar256 * auVar20._12_4_;
  auVar172._0_4_ = fVar300 * auVar21._0_4_ + fVar152 * auVar22._0_4_ + fVar246 * auVar23._0_4_;
  auVar172._4_4_ = fVar308 * auVar21._4_4_ + fVar165 * auVar22._4_4_ + fVar252 * auVar23._4_4_;
  auVar172._8_4_ = fVar309 * auVar21._8_4_ + fVar167 * auVar22._8_4_ + fVar254 * auVar23._8_4_;
  auVar172._12_4_ = fVar311 * auVar21._12_4_ + fVar301 * auVar22._12_4_ + fVar256 * auVar23._12_4_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar120 * 7 + 6);
  auVar131 = vpmovsxwd_avx(auVar227);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar303._0_4_ = fVar152 * auVar24._0_4_ + fVar246 * auVar17._0_4_ + fVar300 * auVar130._0_4_;
  auVar303._4_4_ = fVar165 * auVar24._4_4_ + fVar252 * auVar17._4_4_ + fVar308 * auVar130._4_4_;
  auVar303._8_4_ = fVar167 * auVar24._8_4_ + fVar254 * auVar17._8_4_ + fVar309 * auVar130._8_4_;
  auVar303._12_4_ = fVar301 * auVar24._12_4_ + fVar256 * auVar17._12_4_ + fVar311 * auVar130._12_4_;
  auVar227 = vshufps_avx(auVar206,auVar206,0xaa);
  fVar152 = auVar227._0_4_;
  fVar165 = auVar227._4_4_;
  fVar167 = auVar227._8_4_;
  fVar301 = auVar227._12_4_;
  auVar227 = vshufps_avx(auVar206,auVar206,0x55);
  fVar246 = auVar227._0_4_;
  fVar252 = auVar227._4_4_;
  fVar254 = auVar227._8_4_;
  fVar256 = auVar227._12_4_;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar120 * 0xb + 6);
  auVar132 = vpmovsxwd_avx(auVar177);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar120 * 9 + 6);
  auVar174 = vpmovsxwd_avx(auVar213);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar120 * 0xd + 6);
  auVar193 = vpmovsxwd_avx(auVar193);
  auVar227 = vshufps_avx(auVar206,auVar206,0);
  fVar300 = auVar227._0_4_;
  fVar308 = auVar227._4_4_;
  fVar309 = auVar227._8_4_;
  fVar311 = auVar227._12_4_;
  auVar261._0_4_ = fVar246 * auVar15._0_4_ + fVar152 * auVar20._0_4_ + auVar16._0_4_ * fVar300;
  auVar261._4_4_ = fVar252 * auVar15._4_4_ + fVar165 * auVar20._4_4_ + auVar16._4_4_ * fVar308;
  auVar261._8_4_ = fVar254 * auVar15._8_4_ + fVar167 * auVar20._8_4_ + auVar16._8_4_ * fVar309;
  auVar261._12_4_ = fVar256 * auVar15._12_4_ + fVar301 * auVar20._12_4_ + auVar16._12_4_ * fVar311;
  auVar207._0_4_ = auVar23._0_4_ * fVar152 + fVar246 * auVar22._0_4_ + fVar300 * auVar21._0_4_;
  auVar207._4_4_ = auVar23._4_4_ * fVar165 + fVar252 * auVar22._4_4_ + fVar308 * auVar21._4_4_;
  auVar207._8_4_ = auVar23._8_4_ * fVar167 + fVar254 * auVar22._8_4_ + fVar309 * auVar21._8_4_;
  auVar207._12_4_ = auVar23._12_4_ * fVar301 + fVar256 * auVar22._12_4_ + fVar311 * auVar21._12_4_;
  auVar327._8_4_ = 0x7fffffff;
  auVar327._0_8_ = 0x7fffffff7fffffff;
  auVar327._12_4_ = 0x7fffffff;
  auVar227 = vandps_avx(auVar279,auVar327);
  auVar318._8_4_ = 0x219392ef;
  auVar318._0_8_ = 0x219392ef219392ef;
  auVar318._12_4_ = 0x219392ef;
  auVar227 = vcmpps_avx(auVar227,auVar318,1);
  auVar177 = vblendvps_avx(auVar279,auVar318,auVar227);
  auVar227 = vandps_avx(auVar327,auVar172);
  auVar227 = vcmpps_avx(auVar227,auVar318,1);
  auVar213 = vblendvps_avx(auVar172,auVar318,auVar227);
  auVar227 = vandps_avx(auVar303,auVar327);
  auVar227 = vcmpps_avx(auVar227,auVar318,1);
  auVar227 = vblendvps_avx(auVar303,auVar318,auVar227);
  auVar240._0_4_ = fVar246 * auVar24._0_4_ + fVar152 * auVar17._0_4_ + auVar130._0_4_ * fVar300;
  auVar240._4_4_ = fVar252 * auVar24._4_4_ + fVar165 * auVar17._4_4_ + auVar130._4_4_ * fVar308;
  auVar240._8_4_ = fVar254 * auVar24._8_4_ + fVar167 * auVar17._8_4_ + auVar130._8_4_ * fVar309;
  auVar240._12_4_ = fVar256 * auVar24._12_4_ + fVar301 * auVar17._12_4_ + auVar130._12_4_ * fVar311;
  auVar15 = vrcpps_avx(auVar177);
  fVar246 = auVar15._0_4_;
  auVar248._0_4_ = fVar246 * auVar177._0_4_;
  fVar252 = auVar15._4_4_;
  auVar248._4_4_ = fVar252 * auVar177._4_4_;
  fVar254 = auVar15._8_4_;
  auVar248._8_4_ = fVar254 * auVar177._8_4_;
  fVar256 = auVar15._12_4_;
  auVar248._12_4_ = fVar256 * auVar177._12_4_;
  auVar319._8_4_ = 0x3f800000;
  auVar319._0_8_ = 0x3f8000003f800000;
  auVar319._12_4_ = 0x3f800000;
  auVar177 = vsubps_avx(auVar319,auVar248);
  fVar246 = fVar246 + fVar246 * auVar177._0_4_;
  fVar252 = fVar252 + fVar252 * auVar177._4_4_;
  fVar254 = fVar254 + fVar254 * auVar177._8_4_;
  fVar256 = fVar256 + fVar256 * auVar177._12_4_;
  auVar177 = vrcpps_avx(auVar213);
  fVar275 = auVar177._0_4_;
  auVar173._0_4_ = fVar275 * auVar213._0_4_;
  fVar285 = auVar177._4_4_;
  auVar173._4_4_ = fVar285 * auVar213._4_4_;
  fVar289 = auVar177._8_4_;
  auVar173._8_4_ = fVar289 * auVar213._8_4_;
  fVar291 = auVar177._12_4_;
  auVar173._12_4_ = fVar291 * auVar213._12_4_;
  auVar177 = vsubps_avx(auVar319,auVar173);
  fVar275 = fVar275 + fVar275 * auVar177._0_4_;
  fVar285 = fVar285 + fVar285 * auVar177._4_4_;
  fVar289 = fVar289 + fVar289 * auVar177._8_4_;
  fVar291 = fVar291 + fVar291 * auVar177._12_4_;
  auVar177 = vrcpps_avx(auVar227);
  fVar300 = auVar177._0_4_;
  auVar304._0_4_ = auVar227._0_4_ * fVar300;
  fVar308 = auVar177._4_4_;
  auVar304._4_4_ = auVar227._4_4_ * fVar308;
  fVar309 = auVar177._8_4_;
  auVar304._8_4_ = auVar227._8_4_ * fVar309;
  fVar311 = auVar177._12_4_;
  auVar304._12_4_ = auVar227._12_4_ * fVar311;
  auVar227 = vsubps_avx(auVar319,auVar304);
  fVar300 = auVar227._0_4_ * fVar300 + fVar300;
  fVar308 = auVar227._4_4_ * fVar308 + fVar308;
  fVar309 = auVar227._8_4_ * fVar309 + fVar309;
  fVar311 = auVar227._12_4_ * fVar311 + fVar311;
  auVar213 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                          *(float *)(prim + lVar127 + 0x16)) *
                                         *(float *)(prim + lVar127 + 0x1a))),0);
  auVar227 = vcvtdq2ps_avx(auVar131);
  auVar177 = vcvtdq2ps_avx(auVar132);
  auVar177 = vsubps_avx(auVar177,auVar227);
  fVar152 = auVar213._0_4_;
  fVar165 = auVar213._4_4_;
  fVar167 = auVar213._8_4_;
  fVar301 = auVar213._12_4_;
  auVar130._0_4_ = fVar152 * auVar177._0_4_ + auVar227._0_4_;
  auVar130._4_4_ = fVar165 * auVar177._4_4_ + auVar227._4_4_;
  auVar130._8_4_ = fVar167 * auVar177._8_4_ + auVar227._8_4_;
  auVar130._12_4_ = fVar301 * auVar177._12_4_ + auVar227._12_4_;
  auVar227 = vcvtdq2ps_avx(auVar174);
  auVar177 = vcvtdq2ps_avx(auVar193);
  auVar177 = vsubps_avx(auVar177,auVar227);
  auVar189._0_4_ = fVar152 * auVar177._0_4_ + auVar227._0_4_;
  auVar189._4_4_ = fVar165 * auVar177._4_4_ + auVar227._4_4_;
  auVar189._8_4_ = fVar167 * auVar177._8_4_ + auVar227._8_4_;
  auVar189._12_4_ = fVar301 * auVar177._12_4_ + auVar227._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar120 * 0x12 + 6);
  auVar227 = vpmovsxwd_avx(auVar15);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar120 * 0x16 + 6);
  auVar177 = vpmovsxwd_avx(auVar20);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar177 = vsubps_avx(auVar177,auVar227);
  auVar225._0_4_ = auVar177._0_4_ * fVar152 + auVar227._0_4_;
  auVar225._4_4_ = auVar177._4_4_ * fVar165 + auVar227._4_4_;
  auVar225._8_4_ = auVar177._8_4_ * fVar167 + auVar227._8_4_;
  auVar225._12_4_ = auVar177._12_4_ * fVar301 + auVar227._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar120 * 0x14 + 6);
  auVar227 = vpmovsxwd_avx(auVar22);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar120 * 0x18 + 6);
  auVar177 = vpmovsxwd_avx(auVar23);
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar177 = vsubps_avx(auVar177,auVar227);
  auVar297._0_4_ = auVar177._0_4_ * fVar152 + auVar227._0_4_;
  auVar297._4_4_ = auVar177._4_4_ * fVar165 + auVar227._4_4_;
  auVar297._8_4_ = auVar177._8_4_ * fVar167 + auVar227._8_4_;
  auVar297._12_4_ = auVar177._12_4_ * fVar301 + auVar227._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar120 * 0x1d + 6);
  auVar227 = vpmovsxwd_avx(auVar16);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar120 * 0x21 + 6);
  auVar177 = vpmovsxwd_avx(auVar21);
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar213 = vsubps_avx(auVar177,auVar227);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar120 * 0x1f + 6);
  auVar177 = vpmovsxwd_avx(auVar24);
  auVar320._0_4_ = auVar213._0_4_ * fVar152 + auVar227._0_4_;
  auVar320._4_4_ = auVar213._4_4_ * fVar165 + auVar227._4_4_;
  auVar320._8_4_ = auVar213._8_4_ * fVar167 + auVar227._8_4_;
  auVar320._12_4_ = auVar213._12_4_ * fVar301 + auVar227._12_4_;
  auVar227 = vcvtdq2ps_avx(auVar177);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar120 * 0x23 + 6);
  auVar177 = vpmovsxwd_avx(auVar17);
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar177 = vsubps_avx(auVar177,auVar227);
  auVar174._0_4_ = auVar227._0_4_ + auVar177._0_4_ * fVar152;
  auVar174._4_4_ = auVar227._4_4_ + auVar177._4_4_ * fVar165;
  auVar174._8_4_ = auVar227._8_4_ + auVar177._8_4_ * fVar167;
  auVar174._12_4_ = auVar227._12_4_ + auVar177._12_4_ * fVar301;
  auVar227 = vsubps_avx(auVar130,auVar261);
  auVar131._0_4_ = fVar246 * auVar227._0_4_;
  auVar131._4_4_ = fVar252 * auVar227._4_4_;
  auVar131._8_4_ = fVar254 * auVar227._8_4_;
  auVar131._12_4_ = fVar256 * auVar227._12_4_;
  auVar227 = vsubps_avx(auVar189,auVar261);
  auVar190._0_4_ = fVar246 * auVar227._0_4_;
  auVar190._4_4_ = fVar252 * auVar227._4_4_;
  auVar190._8_4_ = fVar254 * auVar227._8_4_;
  auVar190._12_4_ = fVar256 * auVar227._12_4_;
  auVar227 = vsubps_avx(auVar225,auVar207);
  auVar226._0_4_ = fVar275 * auVar227._0_4_;
  auVar226._4_4_ = fVar285 * auVar227._4_4_;
  auVar226._8_4_ = fVar289 * auVar227._8_4_;
  auVar226._12_4_ = fVar291 * auVar227._12_4_;
  auVar227 = vsubps_avx(auVar297,auVar207);
  auVar208._0_4_ = fVar275 * auVar227._0_4_;
  auVar208._4_4_ = fVar285 * auVar227._4_4_;
  auVar208._8_4_ = fVar289 * auVar227._8_4_;
  auVar208._12_4_ = fVar291 * auVar227._12_4_;
  auVar227 = vsubps_avx(auVar320,auVar240);
  auVar249._0_4_ = fVar300 * auVar227._0_4_;
  auVar249._4_4_ = fVar308 * auVar227._4_4_;
  auVar249._8_4_ = fVar309 * auVar227._8_4_;
  auVar249._12_4_ = fVar311 * auVar227._12_4_;
  auVar227 = vsubps_avx(auVar174,auVar240);
  auVar175._0_4_ = fVar300 * auVar227._0_4_;
  auVar175._4_4_ = fVar308 * auVar227._4_4_;
  auVar175._8_4_ = fVar309 * auVar227._8_4_;
  auVar175._12_4_ = fVar311 * auVar227._12_4_;
  auVar227 = vpminsd_avx(auVar131,auVar190);
  auVar177 = vpminsd_avx(auVar226,auVar208);
  auVar227 = vmaxps_avx(auVar227,auVar177);
  auVar177 = vpminsd_avx(auVar249,auVar175);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar280._4_4_ = uVar126;
  auVar280._0_4_ = uVar126;
  auVar280._8_4_ = uVar126;
  auVar280._12_4_ = uVar126;
  auVar177 = vmaxps_avx(auVar177,auVar280);
  auVar227 = vmaxps_avx(auVar227,auVar177);
  local_430._0_4_ = auVar227._0_4_ * 0.99999964;
  local_430._4_4_ = auVar227._4_4_ * 0.99999964;
  local_430._8_4_ = auVar227._8_4_ * 0.99999964;
  local_430._12_4_ = auVar227._12_4_ * 0.99999964;
  auVar227 = vpmaxsd_avx(auVar131,auVar190);
  auVar177 = vpmaxsd_avx(auVar226,auVar208);
  auVar227 = vminps_avx(auVar227,auVar177);
  auVar177 = vpmaxsd_avx(auVar249,auVar175);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar191._4_4_ = uVar126;
  auVar191._0_4_ = uVar126;
  auVar191._8_4_ = uVar126;
  auVar191._12_4_ = uVar126;
  auVar177 = vminps_avx(auVar177,auVar191);
  auVar227 = vminps_avx(auVar227,auVar177);
  auVar177 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar177 = vpcmpgtd_avx(auVar177,_DAT_01f4ad30);
  auVar132._0_4_ = auVar227._0_4_ * 1.0000004;
  auVar132._4_4_ = auVar227._4_4_ * 1.0000004;
  auVar132._8_4_ = auVar227._8_4_ * 1.0000004;
  auVar132._12_4_ = auVar227._12_4_ * 1.0000004;
  auVar227 = vcmpps_avx(local_430,auVar132,2);
  auVar227 = vandps_avx(auVar227,auVar177);
  uVar126 = vmovmskps_avx(auVar227);
  local_5a0 = mm_lookupmask_ps._16_8_;
  uStack_598 = mm_lookupmask_ps._24_8_;
  uStack_590 = mm_lookupmask_ps._16_8_;
  uStack_588 = mm_lookupmask_ps._24_8_;
  local_5b0 = pre->ray_space + k;
  local_738 = (undefined1 (*) [32])&local_180;
  uVar119 = 1 << ((byte)k & 0x1f);
  local_740 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar119 & 0xf) << 4));
  local_748 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar119 >> 4) * 0x10);
  local_5a8 = prim;
  for (uVar120 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar126); auVar161 = local_800,
      uVar120 != 0; uVar120 = (ulong)((uint)uVar120 & (uint)uVar120 + 0xf & uVar119)) {
    lVar127 = 0;
    if (uVar120 != 0) {
      for (; (uVar120 >> lVar127 & 1) == 0; lVar127 = lVar127 + 1) {
      }
    }
    uVar119 = *(uint *)(local_5a8 + 2);
    uVar10 = *(uint *)(local_5a8 + lVar127 * 4 + 6);
    pGVar125 = (context->scene->geometries).items[uVar119].ptr;
    uVar122 = (ulong)*(uint *)(*(long *)&pGVar125->field_0x58 +
                              (ulong)uVar10 *
                              pGVar125[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar300 = (pGVar125->time_range).lower;
    fVar300 = pGVar125->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar300) / ((pGVar125->time_range).upper - fVar300)
              );
    auVar227 = vroundss_avx(ZEXT416((uint)fVar300),ZEXT416((uint)fVar300),9);
    auVar227 = vminss_avx(auVar227,ZEXT416((uint)(pGVar125->fnumTimeSegments + -1.0)));
    auVar227 = vmaxss_avx(ZEXT816(0) << 0x20,auVar227);
    fVar300 = fVar300 - auVar227._0_4_;
    _Var12 = pGVar125[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar123 = (long)(int)auVar227._0_4_ * 0x38;
    lVar127 = *(long *)(_Var12 + 0x10 + lVar123);
    lVar128 = *(long *)(_Var12 + 0x38 + lVar123);
    lVar13 = *(long *)(_Var12 + 0x48 + lVar123);
    auVar227 = vshufps_avx(ZEXT416((uint)fVar300),ZEXT416((uint)fVar300),0);
    pfVar1 = (float *)(lVar128 + uVar122 * lVar13);
    fVar152 = auVar227._0_4_;
    fVar165 = auVar227._4_4_;
    fVar167 = auVar227._8_4_;
    fVar301 = auVar227._12_4_;
    pfVar2 = (float *)(lVar128 + (uVar122 + 1) * lVar13);
    uVar124 = (uVar122 + 2) * lVar13;
    pfVar3 = (float *)(lVar128 + uVar124);
    pfVar4 = (float *)(lVar128 + lVar13 * (uVar122 + 3));
    lVar128 = *(long *)(_Var12 + lVar123);
    auVar227 = vshufps_avx(ZEXT416((uint)(1.0 - fVar300)),ZEXT416((uint)(1.0 - fVar300)),0);
    pfVar5 = (float *)(lVar128 + lVar127 * uVar122);
    fVar300 = auVar227._0_4_;
    fVar308 = auVar227._4_4_;
    fVar309 = auVar227._8_4_;
    fVar311 = auVar227._12_4_;
    pfVar6 = (float *)(lVar128 + lVar127 * (uVar122 + 1));
    local_760 = (undefined1  [8])
                CONCAT44(fVar165 * pfVar1[1] + fVar308 * pfVar5[1],
                         fVar152 * *pfVar1 + fVar300 * *pfVar5);
    uStack_758._0_4_ = fVar167 * pfVar1[2] + fVar309 * pfVar5[2];
    uStack_758._4_4_ = fVar301 * pfVar1[3] + fVar311 * pfVar5[3];
    pfVar1 = (float *)(lVar128 + lVar127 * (uVar122 + 2));
    local_770 = (undefined1  [8])
                CONCAT44(fVar308 * pfVar6[1] + fVar165 * pfVar2[1],
                         fVar300 * *pfVar6 + fVar152 * *pfVar2);
    uStack_768._0_4_ = fVar309 * pfVar6[2] + fVar167 * pfVar2[2];
    uStack_768._4_4_ = fVar311 * pfVar6[3] + fVar301 * pfVar2[3];
    local_690 = (undefined1  [8])
                CONCAT44(fVar308 * pfVar1[1] + fVar165 * pfVar3[1],
                         fVar300 * *pfVar1 + fVar152 * *pfVar3);
    uStack_688._0_4_ = fVar309 * pfVar1[2] + fVar167 * pfVar3[2];
    uStack_688._4_4_ = fVar311 * pfVar1[3] + fVar301 * pfVar3[3];
    pfVar1 = (float *)(lVar128 + lVar127 * (uVar122 + 3));
    local_6a0 = (undefined1  [8])
                CONCAT44(fVar308 * pfVar1[1] + fVar165 * pfVar4[1],
                         fVar300 * *pfVar1 + fVar152 * *pfVar4);
    uStack_698._0_4_ = fVar309 * pfVar1[2] + fVar167 * pfVar4[2];
    uStack_698._4_4_ = fVar311 * pfVar1[3] + fVar301 * pfVar4[3];
    auVar227 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    uVar11 = (uint)pGVar125[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar193 = vinsertps_avx(auVar227,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar213 = vsubps_avx(_local_760,auVar193);
    auVar227 = vshufps_avx(auVar213,auVar213,0);
    auVar177 = vshufps_avx(auVar213,auVar213,0x55);
    auVar213 = vshufps_avx(auVar213,auVar213,0xaa);
    fVar300 = (local_5b0->vx).field_0.m128[0];
    fVar308 = (local_5b0->vx).field_0.m128[1];
    fVar309 = (local_5b0->vx).field_0.m128[2];
    fVar311 = (local_5b0->vx).field_0.m128[3];
    fVar152 = (local_5b0->vy).field_0.m128[0];
    fVar165 = (local_5b0->vy).field_0.m128[1];
    fVar167 = (local_5b0->vy).field_0.m128[2];
    fVar301 = (local_5b0->vy).field_0.m128[3];
    fVar246 = (local_5b0->vz).field_0.m128[0];
    fVar252 = (local_5b0->vz).field_0.m128[1];
    fVar254 = (local_5b0->vz).field_0.m128[2];
    fVar256 = (local_5b0->vz).field_0.m128[3];
    auVar209._0_8_ =
         CONCAT44(auVar227._4_4_ * fVar308 + auVar177._4_4_ * fVar165 + fVar252 * auVar213._4_4_,
                  auVar227._0_4_ * fVar300 + auVar177._0_4_ * fVar152 + fVar246 * auVar213._0_4_);
    auVar209._8_4_ = auVar227._8_4_ * fVar309 + auVar177._8_4_ * fVar167 + fVar254 * auVar213._8_4_;
    auVar209._12_4_ =
         auVar227._12_4_ * fVar311 + auVar177._12_4_ * fVar301 + fVar256 * auVar213._12_4_;
    auVar227 = vblendps_avx(auVar209,_local_760,8);
    auVar15 = vsubps_avx(_local_770,auVar193);
    auVar177 = vshufps_avx(auVar15,auVar15,0);
    auVar213 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    auVar210._0_4_ = auVar177._0_4_ * fVar300 + auVar213._0_4_ * fVar152 + fVar246 * auVar15._0_4_;
    auVar210._4_4_ = auVar177._4_4_ * fVar308 + auVar213._4_4_ * fVar165 + fVar252 * auVar15._4_4_;
    auVar210._8_4_ = auVar177._8_4_ * fVar309 + auVar213._8_4_ * fVar167 + fVar254 * auVar15._8_4_;
    auVar210._12_4_ =
         auVar177._12_4_ * fVar311 + auVar213._12_4_ * fVar301 + fVar256 * auVar15._12_4_;
    auVar177 = vblendps_avx(auVar210,_local_770,8);
    auVar20 = vsubps_avx(_local_690,auVar193);
    auVar213 = vshufps_avx(auVar20,auVar20,0);
    auVar15 = vshufps_avx(auVar20,auVar20,0x55);
    auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
    auVar211._0_4_ = auVar213._0_4_ * fVar300 + auVar15._0_4_ * fVar152 + fVar246 * auVar20._0_4_;
    auVar211._4_4_ = auVar213._4_4_ * fVar308 + auVar15._4_4_ * fVar165 + fVar252 * auVar20._4_4_;
    auVar211._8_4_ = auVar213._8_4_ * fVar309 + auVar15._8_4_ * fVar167 + fVar254 * auVar20._8_4_;
    auVar211._12_4_ =
         auVar213._12_4_ * fVar311 + auVar15._12_4_ * fVar301 + fVar256 * auVar20._12_4_;
    auVar213 = vblendps_avx(auVar211,_local_690,8);
    auVar20 = vsubps_avx(_local_6a0,auVar193);
    auVar193 = vshufps_avx(auVar20,auVar20,0);
    auVar15 = vshufps_avx(auVar20,auVar20,0x55);
    auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
    auVar154._0_4_ = auVar193._0_4_ * fVar300 + auVar15._0_4_ * fVar152 + fVar246 * auVar20._0_4_;
    auVar154._4_4_ = auVar193._4_4_ * fVar308 + auVar15._4_4_ * fVar165 + fVar252 * auVar20._4_4_;
    auVar154._8_4_ = auVar193._8_4_ * fVar309 + auVar15._8_4_ * fVar167 + fVar254 * auVar20._8_4_;
    auVar154._12_4_ =
         auVar193._12_4_ * fVar311 + auVar15._12_4_ * fVar301 + fVar256 * auVar20._12_4_;
    auVar193 = vblendps_avx(auVar154,_local_6a0,8);
    auVar192._8_4_ = 0x7fffffff;
    auVar192._0_8_ = 0x7fffffff7fffffff;
    auVar192._12_4_ = 0x7fffffff;
    auVar227 = vandps_avx(auVar227,auVar192);
    auVar177 = vandps_avx(auVar177,auVar192);
    auVar15 = vmaxps_avx(auVar227,auVar177);
    auVar227 = vandps_avx(auVar213,auVar192);
    auVar177 = vandps_avx(auVar193,auVar192);
    auVar227 = vmaxps_avx(auVar227,auVar177);
    auVar227 = vmaxps_avx(auVar15,auVar227);
    auVar177 = vmovshdup_avx(auVar227);
    auVar177 = vmaxss_avx(auVar177,auVar227);
    auVar227 = vshufpd_avx(auVar227,auVar227,1);
    auVar227 = vmaxss_avx(auVar227,auVar177);
    local_800._0_4_ = auVar227._0_4_;
    lVar127 = (long)(int)uVar11 * 0x44;
    fVar301 = *(float *)(bspline_basis0 + lVar127 + 0x908);
    fVar246 = *(float *)(bspline_basis0 + lVar127 + 0x90c);
    fVar252 = *(float *)(bspline_basis0 + lVar127 + 0x910);
    fVar254 = *(float *)(bspline_basis0 + lVar127 + 0x914);
    fVar256 = *(float *)(bspline_basis0 + lVar127 + 0x918);
    fVar275 = *(float *)(bspline_basis0 + lVar127 + 0x91c);
    fVar285 = *(float *)(bspline_basis0 + lVar127 + 0x920);
    fVar300 = *(float *)(bspline_basis0 + lVar127 + 0x924);
    auVar177 = vshufps_avx(auVar211,auVar211,0);
    auVar213 = vshufps_avx(auVar211,auVar211,0x55);
    fVar308 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar127 + 0xd8c);
    fVar309 = *(float *)(bspline_basis0 + lVar127 + 0xd90);
    fVar311 = *(float *)(bspline_basis0 + lVar127 + 0xd94);
    fVar152 = *(float *)(bspline_basis0 + lVar127 + 0xd98);
    fVar165 = *(float *)(bspline_basis0 + lVar127 + 0xd9c);
    fVar167 = *(float *)(bspline_basis0 + lVar127 + 0xda0);
    fVar289 = *(float *)(bspline_basis0 + lVar127 + 0xda4);
    auVar115 = *(undefined1 (*) [28])(bspline_basis0 + lVar127 + 0xd8c);
    auVar193 = vshufps_avx(auVar154,auVar154,0);
    register0x00001490 = auVar193;
    _local_520 = auVar193;
    fVar239 = auVar193._0_4_;
    fVar269 = auVar193._4_4_;
    fVar272 = auVar193._8_4_;
    fVar276 = auVar193._12_4_;
    fVar153 = auVar177._0_4_;
    fVar166 = auVar177._4_4_;
    fVar168 = auVar177._8_4_;
    fVar169 = auVar177._12_4_;
    auVar177 = vshufps_avx(auVar154,auVar154,0x55);
    fVar326 = auVar177._0_4_;
    fVar331 = auVar177._4_4_;
    fVar332 = auVar177._8_4_;
    fVar333 = auVar177._12_4_;
    fVar171 = auVar213._0_4_;
    fVar186 = auVar213._4_4_;
    fVar187 = auVar213._8_4_;
    fVar188 = auVar213._12_4_;
    auVar177 = vshufps_avx(_local_690,_local_690,0xff);
    register0x00001510 = auVar177;
    _local_80 = auVar177;
    auVar213 = vshufps_avx(_local_6a0,_local_6a0,0xff);
    register0x00001410 = auVar213;
    _local_a0 = auVar213;
    fVar223 = auVar213._0_4_;
    fVar200 = auVar213._4_4_;
    fVar201 = auVar213._8_4_;
    fVar203 = auVar213._12_4_;
    fVar286 = auVar177._0_4_;
    fVar247 = auVar177._4_4_;
    fVar253 = auVar177._8_4_;
    auVar213 = vshufps_avx(auVar210,auVar210,0);
    register0x000012d0 = auVar213;
    _local_460 = auVar213;
    pauVar8 = (undefined1 (*) [32])(bspline_basis0 + lVar127 + 0x484);
    fVar291 = *(float *)*pauVar8;
    fVar325 = *(float *)(bspline_basis0 + lVar127 + 0x488);
    fVar314 = *(float *)(bspline_basis0 + lVar127 + 0x48c);
    fVar302 = *(float *)(bspline_basis0 + lVar127 + 0x490);
    fVar316 = *(float *)(bspline_basis0 + lVar127 + 0x494);
    fVar310 = *(float *)(bspline_basis0 + lVar127 + 0x498);
    fVar312 = *(float *)(bspline_basis0 + lVar127 + 0x49c);
    auVar116 = *(undefined1 (*) [28])*pauVar8;
    _auStack_670 = SUB3216(*pauVar8,0x10);
    fVar150 = auVar213._0_4_;
    fVar151 = auVar213._4_4_;
    fVar129 = auVar213._8_4_;
    fVar145 = auVar213._12_4_;
    auVar213 = vshufps_avx(auVar210,auVar210,0x55);
    register0x00001350 = auVar213;
    _local_7e0 = auVar213;
    fVar224 = auVar213._0_4_;
    fVar234 = auVar213._4_4_;
    fVar235 = auVar213._8_4_;
    fVar236 = auVar213._12_4_;
    auVar213 = vpermilps_avx(_local_770,0xff);
    register0x00001590 = auVar213;
    _local_280 = auVar213;
    fVar255 = auVar213._0_4_;
    fVar257 = auVar213._4_4_;
    fVar258 = auVar213._8_4_;
    fVar259 = auVar213._12_4_;
    auVar106._8_4_ = auVar209._8_4_;
    auVar106._0_8_ = auVar209._0_8_;
    auVar106._12_4_ = auVar209._12_4_;
    auVar213 = vshufps_avx(auVar106,auVar106,0);
    auVar214._16_16_ = auVar213;
    auVar214._0_16_ = auVar213;
    fVar199 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar127);
    fVar266 = *(float *)(bspline_basis0 + lVar127 + 4);
    fVar313 = *(float *)(bspline_basis0 + lVar127 + 8);
    fVar315 = *(float *)(bspline_basis0 + lVar127 + 0xc);
    fVar317 = *(float *)(bspline_basis0 + lVar127 + 0x10);
    fVar268 = *(float *)(bspline_basis0 + lVar127 + 0x14);
    fVar265 = *(float *)(bspline_basis0 + lVar127 + 0x18);
    auVar117 = *(undefined1 (*) [28])(bspline_basis0 + lVar127);
    fVar205 = auVar213._0_4_;
    fVar220 = auVar213._4_4_;
    fVar221 = auVar213._8_4_;
    fVar222 = auVar213._12_4_;
    auVar305._0_4_ = fVar205 * fVar199 + fVar150 * fVar291 + fVar153 * fVar301 + fVar239 * fVar308;
    auVar305._4_4_ = fVar220 * fVar266 + fVar151 * fVar325 + fVar166 * fVar246 + fVar269 * fVar309;
    auVar305._8_4_ = fVar221 * fVar313 + fVar129 * fVar314 + fVar168 * fVar252 + fVar272 * fVar311;
    auVar305._12_4_ = fVar222 * fVar315 + fVar145 * fVar302 + fVar169 * fVar254 + fVar276 * fVar152;
    auVar306._16_4_ = fVar205 * fVar317 + fVar150 * fVar316 + fVar153 * fVar256 + fVar239 * fVar165;
    auVar306._0_16_ = auVar305;
    auVar306._20_4_ = fVar220 * fVar268 + fVar151 * fVar310 + fVar166 * fVar275 + fVar269 * fVar167;
    auVar306._24_4_ = fVar221 * fVar265 + fVar129 * fVar312 + fVar168 * fVar285 + fVar272 * fVar289;
    auVar306._28_4_ = fVar300 + fVar145 + fVar169 + 0.0;
    auVar213 = vshufps_avx(auVar106,auVar106,0x55);
    register0x000015d0 = auVar213;
    _local_4a0 = auVar213;
    fVar260 = auVar213._0_4_;
    fVar277 = auVar213._4_4_;
    fVar287 = auVar213._8_4_;
    fVar290 = auVar213._12_4_;
    auVar250._0_4_ = fVar260 * fVar199 + fVar224 * fVar291 + fVar171 * fVar301 + fVar326 * fVar308;
    auVar250._4_4_ = fVar277 * fVar266 + fVar234 * fVar325 + fVar186 * fVar246 + fVar331 * fVar309;
    auVar250._8_4_ = fVar287 * fVar313 + fVar235 * fVar314 + fVar187 * fVar252 + fVar332 * fVar311;
    auVar250._12_4_ = fVar290 * fVar315 + fVar236 * fVar302 + fVar188 * fVar254 + fVar333 * fVar152;
    auVar250._16_4_ = fVar260 * fVar317 + fVar224 * fVar316 + fVar171 * fVar256 + fVar326 * fVar165;
    auVar250._20_4_ = fVar277 * fVar268 + fVar234 * fVar310 + fVar186 * fVar275 + fVar331 * fVar167;
    auVar250._24_4_ = fVar287 * fVar265 + fVar235 * fVar312 + fVar187 * fVar285 + fVar332 * fVar289;
    auVar250._28_4_ = fVar188 + 0.0 + 0.0 + 0.0;
    auVar213 = vpermilps_avx(_local_760,0xff);
    register0x00001450 = auVar213;
    _local_c0 = auVar213;
    fVar274 = auVar213._0_4_;
    fVar237 = auVar213._4_4_;
    fVar238 = auVar213._8_4_;
    auVar135._0_4_ = fVar274 * fVar199 + fVar255 * fVar291 + fVar286 * fVar301 + fVar223 * fVar308;
    auVar135._4_4_ = fVar237 * fVar266 + fVar257 * fVar325 + fVar247 * fVar246 + fVar200 * fVar309;
    auVar135._8_4_ = fVar238 * fVar313 + fVar258 * fVar314 + fVar253 * fVar252 + fVar201 * fVar311;
    auVar135._12_4_ =
         auVar213._12_4_ * fVar315 +
         fVar259 * fVar302 + auVar177._12_4_ * fVar254 + fVar203 * fVar152;
    auVar135._16_4_ = fVar274 * fVar317 + fVar255 * fVar316 + fVar286 * fVar256 + fVar223 * fVar165;
    auVar135._20_4_ = fVar237 * fVar268 + fVar257 * fVar310 + fVar247 * fVar275 + fVar200 * fVar167;
    auVar135._24_4_ = fVar238 * fVar265 + fVar258 * fVar312 + fVar253 * fVar285 + fVar201 * fVar289;
    auVar135._28_4_ = 0;
    fVar289 = *(float *)(bspline_basis1 + lVar127 + 0x908);
    fVar291 = *(float *)(bspline_basis1 + lVar127 + 0x90c);
    fVar325 = *(float *)(bspline_basis1 + lVar127 + 0x910);
    fVar314 = *(float *)(bspline_basis1 + lVar127 + 0x914);
    fVar302 = *(float *)(bspline_basis1 + lVar127 + 0x918);
    fVar316 = *(float *)(bspline_basis1 + lVar127 + 0x91c);
    fVar310 = *(float *)(bspline_basis1 + lVar127 + 0x920);
    fVar312 = *(float *)(bspline_basis1 + lVar127 + 0xd8c);
    fVar199 = *(float *)(bspline_basis1 + lVar127 + 0xd90);
    fVar266 = *(float *)(bspline_basis1 + lVar127 + 0xd94);
    fVar313 = *(float *)(bspline_basis1 + lVar127 + 0xd98);
    fVar315 = *(float *)(bspline_basis1 + lVar127 + 0xd9c);
    fVar317 = *(float *)(bspline_basis1 + lVar127 + 0xda0);
    fVar268 = *(float *)(bspline_basis1 + lVar127 + 0xda4);
    fVar265 = *(float *)(bspline_basis1 + lVar127 + 0x484);
    fVar267 = *(float *)(bspline_basis1 + lVar127 + 0x488);
    fVar202 = *(float *)(bspline_basis1 + lVar127 + 0x48c);
    fVar271 = *(float *)(bspline_basis1 + lVar127 + 0x490);
    fVar270 = *(float *)(bspline_basis1 + lVar127 + 0x494);
    fVar273 = *(float *)(bspline_basis1 + lVar127 + 0x498);
    fVar204 = *(float *)(bspline_basis1 + lVar127 + 0x49c);
    fVar308 = fVar145 + 0.0;
    fVar170 = *(float *)(bspline_basis1 + lVar127);
    fVar296 = *(float *)(bspline_basis1 + lVar127 + 4);
    fVar144 = *(float *)(bspline_basis1 + lVar127 + 8);
    fVar146 = *(float *)(bspline_basis1 + lVar127 + 0xc);
    fVar147 = *(float *)(bspline_basis1 + lVar127 + 0x10);
    fVar148 = *(float *)(bspline_basis1 + lVar127 + 0x14);
    fVar149 = *(float *)(bspline_basis1 + lVar127 + 0x18);
    auVar215._0_4_ = fVar170 * fVar205 + fVar150 * fVar265 + fVar289 * fVar153 + fVar239 * fVar312;
    auVar215._4_4_ = fVar296 * fVar220 + fVar151 * fVar267 + fVar291 * fVar166 + fVar269 * fVar199;
    auVar215._8_4_ = fVar144 * fVar221 + fVar129 * fVar202 + fVar325 * fVar168 + fVar272 * fVar266;
    auVar215._12_4_ = fVar146 * fVar222 + fVar145 * fVar271 + fVar314 * fVar169 + fVar276 * fVar313;
    auVar215._16_4_ = fVar147 * fVar205 + fVar150 * fVar270 + fVar302 * fVar153 + fVar239 * fVar315;
    auVar215._20_4_ = fVar148 * fVar220 + fVar151 * fVar273 + fVar316 * fVar166 + fVar269 * fVar317;
    auVar215._24_4_ = fVar149 * fVar221 + fVar129 * fVar204 + fVar310 * fVar168 + fVar272 * fVar268;
    auVar215._28_4_ = fVar259 + fVar308;
    local_640._0_4_ = fVar260 * fVar170 + fVar224 * fVar265 + fVar289 * fVar171 + fVar326 * fVar312;
    local_640._4_4_ = fVar277 * fVar296 + fVar234 * fVar267 + fVar291 * fVar186 + fVar331 * fVar199;
    fStack_638 = fVar287 * fVar144 + fVar235 * fVar202 + fVar325 * fVar187 + fVar332 * fVar266;
    fStack_634 = fVar290 * fVar146 + fVar236 * fVar271 + fVar314 * fVar188 + fVar333 * fVar313;
    fStack_630 = fVar260 * fVar147 + fVar224 * fVar270 + fVar302 * fVar171 + fVar326 * fVar315;
    fStack_62c = fVar277 * fVar148 + fVar234 * fVar273 + fVar316 * fVar186 + fVar331 * fVar317;
    fStack_628 = fVar287 * fVar149 + fVar235 * fVar204 + fVar310 * fVar187 + fVar332 * fVar268;
    fStack_624 = fVar308 + fVar145 + fVar300 + 0.0;
    local_7a0._0_4_ = fVar255 * fVar265 + fVar286 * fVar289 + fVar223 * fVar312 + fVar274 * fVar170;
    local_7a0._4_4_ = fVar257 * fVar267 + fVar247 * fVar291 + fVar200 * fVar199 + fVar237 * fVar296;
    local_7a0._8_4_ = fVar258 * fVar202 + fVar253 * fVar325 + fVar201 * fVar266 + fVar238 * fVar144;
    local_7a0._12_4_ =
         fVar259 * fVar271 + auVar177._12_4_ * fVar314 + fVar203 * fVar313 +
         auVar213._12_4_ * fVar146;
    local_7a0._16_4_ = fVar255 * fVar270 + fVar286 * fVar302 + fVar223 * fVar315 + fVar274 * fVar147
    ;
    local_7a0._20_4_ = fVar257 * fVar273 + fVar247 * fVar316 + fVar200 * fVar317 + fVar237 * fVar148
    ;
    local_7a0._24_4_ = fVar258 * fVar204 + fVar253 * fVar310 + fVar201 * fVar268 + fVar238 * fVar149
    ;
    local_7a0._28_4_ = fVar145 + fVar203 + fVar300 + fVar308;
    auVar25 = vsubps_avx(auVar215,auVar306);
    auVar26 = vsubps_avx(_local_640,auVar250);
    fVar223 = auVar25._0_4_;
    fVar200 = auVar25._4_4_;
    auVar18._4_4_ = fVar200 * auVar250._4_4_;
    auVar18._0_4_ = fVar223 * auVar250._0_4_;
    fVar201 = auVar25._8_4_;
    auVar18._8_4_ = fVar201 * auVar250._8_4_;
    fVar203 = auVar25._12_4_;
    auVar18._12_4_ = fVar203 * auVar250._12_4_;
    fVar274 = auVar25._16_4_;
    auVar18._16_4_ = fVar274 * auVar250._16_4_;
    fVar237 = auVar25._20_4_;
    auVar18._20_4_ = fVar237 * auVar250._20_4_;
    fVar238 = auVar25._24_4_;
    auVar18._24_4_ = fVar238 * auVar250._24_4_;
    auVar18._28_4_ = fVar308;
    fVar300 = auVar26._0_4_;
    fVar308 = auVar26._4_4_;
    auVar27._4_4_ = auVar305._4_4_ * fVar308;
    auVar27._0_4_ = auVar305._0_4_ * fVar300;
    fVar309 = auVar26._8_4_;
    auVar27._8_4_ = auVar305._8_4_ * fVar309;
    fVar311 = auVar26._12_4_;
    auVar27._12_4_ = auVar305._12_4_ * fVar311;
    fVar152 = auVar26._16_4_;
    auVar27._16_4_ = auVar306._16_4_ * fVar152;
    fVar165 = auVar26._20_4_;
    auVar27._20_4_ = auVar306._20_4_ * fVar165;
    fVar167 = auVar26._24_4_;
    auVar27._24_4_ = auVar306._24_4_ * fVar167;
    auVar27._28_4_ = fStack_624;
    auVar27 = vsubps_avx(auVar18,auVar27);
    auVar18 = vmaxps_avx(auVar135,local_7a0._0_32_);
    auVar32._4_4_ = auVar18._4_4_ * auVar18._4_4_ * (fVar200 * fVar200 + fVar308 * fVar308);
    auVar32._0_4_ = auVar18._0_4_ * auVar18._0_4_ * (fVar223 * fVar223 + fVar300 * fVar300);
    auVar32._8_4_ = auVar18._8_4_ * auVar18._8_4_ * (fVar201 * fVar201 + fVar309 * fVar309);
    auVar32._12_4_ = auVar18._12_4_ * auVar18._12_4_ * (fVar203 * fVar203 + fVar311 * fVar311);
    auVar32._16_4_ = auVar18._16_4_ * auVar18._16_4_ * (fVar274 * fVar274 + fVar152 * fVar152);
    auVar32._20_4_ = auVar18._20_4_ * auVar18._20_4_ * (fVar237 * fVar237 + fVar165 * fVar165);
    auVar32._24_4_ = auVar18._24_4_ * auVar18._24_4_ * (fVar238 * fVar238 + fVar167 * fVar167);
    auVar32._28_4_ = auVar215._28_4_ + fStack_624;
    auVar19._4_4_ = auVar27._4_4_ * auVar27._4_4_;
    auVar19._0_4_ = auVar27._0_4_ * auVar27._0_4_;
    auVar19._8_4_ = auVar27._8_4_ * auVar27._8_4_;
    auVar19._12_4_ = auVar27._12_4_ * auVar27._12_4_;
    auVar19._16_4_ = auVar27._16_4_ * auVar27._16_4_;
    auVar19._20_4_ = auVar27._20_4_ * auVar27._20_4_;
    auVar19._24_4_ = auVar27._24_4_ * auVar27._24_4_;
    auVar19._28_4_ = auVar27._28_4_;
    auVar212._0_4_ = (float)(int)uVar11;
    auVar212._4_12_ = auVar305._4_12_;
    auVar18 = vcmpps_avx(auVar19,auVar32,2);
    local_540._0_16_ = auVar212;
    auVar177 = vshufps_avx(auVar212,auVar212,0);
    auVar194._16_16_ = auVar177;
    auVar194._0_16_ = auVar177;
    auVar27 = vcmpps_avx(_DAT_01f7b060,auVar194,1);
    auVar198 = ZEXT3264(auVar27);
    auVar107._8_4_ = auVar209._8_4_;
    auVar107._0_8_ = auVar209._0_8_;
    auVar107._12_4_ = auVar209._12_4_;
    auVar177 = vpermilps_avx(auVar107,0xaa);
    register0x00001450 = auVar177;
    _local_2a0 = auVar177;
    auVar213 = vpermilps_avx(auVar210,0xaa);
    register0x00001550 = auVar213;
    _local_e0 = auVar213;
    auVar193 = vpermilps_avx(auVar211,0xaa);
    register0x00001590 = auVar193;
    _local_480 = auVar193;
    auVar15 = vpermilps_avx(auVar154,0xaa);
    auVar32 = auVar27 & auVar18;
    local_6e0._0_16_ = ZEXT416(uVar10);
    local_7c0 = *(uint *)(ray + k * 4 + 0x60);
    uStack_7bc = 0;
    fStack_7b8 = 0.0;
    fStack_7b4 = 0.0;
    auVar227 = ZEXT416((uint)(auVar227._0_4_ * 4.7683716e-07));
    fVar311 = auVar15._0_4_;
    fVar152 = auVar15._4_4_;
    fVar165 = auVar15._8_4_;
    fVar167 = auVar15._12_4_;
    fVar300 = fVar224;
    fVar308 = fVar234;
    fVar309 = fVar235;
    if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar32 >> 0x7f,0) == '\0') &&
          (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar32 >> 0xbf,0) == '\0') &&
        (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar32[0x1f]) {
      uVar124 = 0;
    }
    else {
      local_4c0 = vandps_avx(auVar18,auVar27);
      fVar200 = auVar177._0_4_;
      fVar201 = auVar177._4_4_;
      fVar203 = auVar177._8_4_;
      fVar237 = auVar177._12_4_;
      fVar274 = auVar213._0_4_;
      fVar238 = auVar213._4_4_;
      fVar286 = auVar213._8_4_;
      fVar247 = auVar213._12_4_;
      fVar253 = auVar193._0_4_;
      fVar255 = auVar193._4_4_;
      fVar257 = auVar193._8_4_;
      fVar258 = auVar193._12_4_;
      fVar223 = auVar27._28_4_ + *(float *)(bspline_basis1 + lVar127 + 0x924) + 0.0;
      local_800._16_16_ = auVar161._16_16_;
      local_800._0_16_ = auVar227;
      local_580 = fVar200 * fVar170 + fVar274 * fVar265 + fVar253 * fVar289 + fVar311 * fVar312;
      fStack_57c = fVar201 * fVar296 + fVar238 * fVar267 + fVar255 * fVar291 + fVar152 * fVar199;
      fStack_578 = fVar203 * fVar144 + fVar286 * fVar202 + fVar257 * fVar325 + fVar165 * fVar266;
      fStack_574 = fVar237 * fVar146 + fVar247 * fVar271 + fVar258 * fVar314 + fVar167 * fVar313;
      fStack_570 = fVar200 * fVar147 + fVar274 * fVar270 + fVar253 * fVar302 + fVar311 * fVar315;
      fStack_56c = fVar201 * fVar148 + fVar238 * fVar273 + fVar255 * fVar316 + fVar152 * fVar317;
      fStack_568 = fVar203 * fVar149 + fVar286 * fVar204 + fVar257 * fVar310 + fVar165 * fVar268;
      fStack_564 = local_4c0._28_4_ + fVar223;
      local_560._0_4_ = auVar117._0_4_;
      local_560._4_4_ = auVar117._4_4_;
      fStack_558 = auVar117._8_4_;
      fStack_554 = auVar117._12_4_;
      fStack_550 = auVar117._16_4_;
      fStack_54c = auVar117._20_4_;
      fStack_548 = auVar117._24_4_;
      local_680._0_4_ = auVar116._0_4_;
      local_680._4_4_ = auVar116._4_4_;
      fStack_678 = auVar116._8_4_;
      fStack_674 = auVar116._12_4_;
      auStack_670._0_4_ = auVar116._16_4_;
      auStack_670._4_4_ = auVar116._20_4_;
      fStack_668 = auVar116._24_4_;
      local_6c0._0_4_ = auVar115._0_4_;
      local_6c0._4_4_ = auVar115._4_4_;
      fStack_6b8 = auVar115._8_4_;
      fStack_6b4 = auVar115._12_4_;
      fStack_6b0 = auVar115._16_4_;
      fStack_6ac = auVar115._20_4_;
      fStack_6a8 = auVar115._24_4_;
      local_660 = fVar200 * (float)local_560._0_4_ +
                  fVar274 * (float)local_680._0_4_ +
                  fVar253 * fVar301 + fVar311 * (float)local_6c0._0_4_;
      fStack_65c = fVar201 * (float)local_560._4_4_ +
                   fVar238 * (float)local_680._4_4_ +
                   fVar255 * fVar246 + fVar152 * (float)local_6c0._4_4_;
      fStack_658 = fVar203 * fStack_558 +
                   fVar286 * fStack_678 + fVar257 * fVar252 + fVar165 * fStack_6b8;
      fStack_654 = fVar237 * fStack_554 +
                   fVar247 * fStack_674 + fVar258 * fVar254 + fVar167 * fStack_6b4;
      fStack_650 = fVar200 * fStack_550 +
                   fVar274 * (float)auStack_670._0_4_ + fVar253 * fVar256 + fVar311 * fStack_6b0;
      fStack_64c = fVar201 * fStack_54c +
                   fVar238 * (float)auStack_670._4_4_ + fVar255 * fVar275 + fVar152 * fStack_6ac;
      fStack_648 = fVar203 * fStack_548 +
                   fVar286 * fStack_668 + fVar257 * fVar285 + fVar165 * fStack_6a8;
      fStack_644 = fStack_564 + fVar223 + local_4c0._28_4_ + auVar27._28_4_;
      fVar301 = *(float *)(bspline_basis0 + lVar127 + 0x1210);
      fVar246 = *(float *)(bspline_basis0 + lVar127 + 0x1214);
      fVar252 = *(float *)(bspline_basis0 + lVar127 + 0x1218);
      fVar254 = *(float *)(bspline_basis0 + lVar127 + 0x121c);
      fVar256 = *(float *)(bspline_basis0 + lVar127 + 0x1220);
      fVar275 = *(float *)(bspline_basis0 + lVar127 + 0x1224);
      fVar285 = *(float *)(bspline_basis0 + lVar127 + 0x1228);
      fVar289 = *(float *)(bspline_basis0 + lVar127 + 0x1694);
      fVar291 = *(float *)(bspline_basis0 + lVar127 + 0x1698);
      fVar325 = *(float *)(bspline_basis0 + lVar127 + 0x169c);
      fVar314 = *(float *)(bspline_basis0 + lVar127 + 0x16a0);
      fVar302 = *(float *)(bspline_basis0 + lVar127 + 0x16a4);
      fVar316 = *(float *)(bspline_basis0 + lVar127 + 0x16a8);
      fVar310 = *(float *)(bspline_basis0 + lVar127 + 0x16ac);
      fVar312 = *(float *)(bspline_basis0 + lVar127 + 0x1b18);
      fVar199 = *(float *)(bspline_basis0 + lVar127 + 0x1b1c);
      fVar266 = *(float *)(bspline_basis0 + lVar127 + 0x1b20);
      fVar313 = *(float *)(bspline_basis0 + lVar127 + 0x1b24);
      fVar315 = *(float *)(bspline_basis0 + lVar127 + 0x1b28);
      fVar317 = *(float *)(bspline_basis0 + lVar127 + 0x1b2c);
      fVar268 = *(float *)(bspline_basis0 + lVar127 + 0x1b30);
      fVar265 = *(float *)(bspline_basis0 + lVar127 + 0x1f9c);
      fVar267 = *(float *)(bspline_basis0 + lVar127 + 0x1fa0);
      fVar202 = *(float *)(bspline_basis0 + lVar127 + 0x1fa4);
      fVar271 = *(float *)(bspline_basis0 + lVar127 + 0x1fa8);
      fVar270 = *(float *)(bspline_basis0 + lVar127 + 0x1fac);
      fVar273 = *(float *)(bspline_basis0 + lVar127 + 0x1fb0);
      fVar204 = *(float *)(bspline_basis0 + lVar127 + 0x1fb4);
      fVar170 = *(float *)(bspline_basis0 + lVar127 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar127 + 0x1fb8);
      fVar296 = *(float *)(bspline_basis0 + lVar127 + 0x16b0) + fVar170;
      local_560._4_4_ =
           fVar220 * fVar246 + fVar151 * fVar291 + fVar166 * fVar199 + fVar269 * fVar267;
      local_560._0_4_ =
           fVar205 * fVar301 + fVar150 * fVar289 + fVar153 * fVar312 + fVar239 * fVar265;
      fStack_558 = fVar221 * fVar252 + fVar129 * fVar325 + fVar168 * fVar266 + fVar272 * fVar202;
      fStack_554 = fVar222 * fVar254 + fVar145 * fVar314 + fVar169 * fVar313 + fVar276 * fVar271;
      fStack_550 = fVar205 * fVar256 + fVar150 * fVar302 + fVar153 * fVar315 + fVar239 * fVar270;
      fStack_54c = fVar220 * fVar275 + fVar151 * fVar316 + fVar166 * fVar317 + fVar269 * fVar273;
      fStack_548 = fVar221 * fVar285 + fVar129 * fVar310 + fVar168 * fVar268 + fVar272 * fVar204;
      fStack_544 = *(float *)(bspline_basis0 + lVar127 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar127 + 0x1fb8) +
                   fVar237 + *(float *)(bspline_basis1 + lVar127 + 0x4a0);
      auVar157._0_4_ = fVar260 * fVar301 + fVar224 * fVar289 + fVar171 * fVar312 + fVar326 * fVar265
      ;
      auVar157._4_4_ = fVar277 * fVar246 + fVar234 * fVar291 + fVar186 * fVar199 + fVar331 * fVar267
      ;
      auVar157._8_4_ = fVar287 * fVar252 + fVar235 * fVar325 + fVar187 * fVar266 + fVar332 * fVar202
      ;
      auVar157._12_4_ =
           fVar290 * fVar254 + fVar236 * fVar314 + fVar188 * fVar313 + fVar333 * fVar271;
      auVar157._16_4_ =
           fVar260 * fVar256 + fVar224 * fVar302 + fVar171 * fVar315 + fVar326 * fVar270;
      auVar157._20_4_ =
           fVar277 * fVar275 + fVar234 * fVar316 + fVar186 * fVar317 + fVar331 * fVar273;
      auVar157._24_4_ =
           fVar287 * fVar285 + fVar235 * fVar310 + fVar187 * fVar268 + fVar332 * fVar204;
      auVar157._28_4_ =
           fVar170 + fVar237 + *(float *)(bspline_basis1 + lVar127 + 0x4a0) + fVar237 + 0.0;
      auVar241._0_4_ = fVar274 * fVar289 + fVar253 * fVar312 + fVar311 * fVar265 + fVar200 * fVar301
      ;
      auVar241._4_4_ = fVar238 * fVar291 + fVar255 * fVar199 + fVar152 * fVar267 + fVar201 * fVar246
      ;
      auVar241._8_4_ = fVar286 * fVar325 + fVar257 * fVar266 + fVar165 * fVar202 + fVar203 * fVar252
      ;
      auVar241._12_4_ =
           fVar247 * fVar314 + fVar258 * fVar313 + fVar167 * fVar271 + fVar237 * fVar254;
      auVar241._16_4_ =
           fVar274 * fVar302 + fVar253 * fVar315 + fVar311 * fVar270 + fVar200 * fVar256;
      auVar241._20_4_ =
           fVar238 * fVar316 + fVar255 * fVar317 + fVar152 * fVar273 + fVar201 * fVar275;
      auVar241._24_4_ =
           fVar286 * fVar310 + fVar257 * fVar268 + fVar165 * fVar204 + fVar203 * fVar285;
      auVar241._28_4_ = fVar296 + *(float *)(bspline_basis0 + lVar127 + 0x122c);
      fVar301 = *(float *)(bspline_basis1 + lVar127 + 0x1b18);
      fVar246 = *(float *)(bspline_basis1 + lVar127 + 0x1b1c);
      fVar252 = *(float *)(bspline_basis1 + lVar127 + 0x1b20);
      fVar254 = *(float *)(bspline_basis1 + lVar127 + 0x1b24);
      fVar256 = *(float *)(bspline_basis1 + lVar127 + 0x1b28);
      fVar275 = *(float *)(bspline_basis1 + lVar127 + 0x1b2c);
      fVar285 = *(float *)(bspline_basis1 + lVar127 + 0x1b30);
      fVar289 = *(float *)(bspline_basis1 + lVar127 + 0x1f9c);
      fVar291 = *(float *)(bspline_basis1 + lVar127 + 0x1fa0);
      fVar325 = *(float *)(bspline_basis1 + lVar127 + 0x1fa4);
      fVar314 = *(float *)(bspline_basis1 + lVar127 + 0x1fa8);
      fVar302 = *(float *)(bspline_basis1 + lVar127 + 0x1fac);
      fVar316 = *(float *)(bspline_basis1 + lVar127 + 0x1fb0);
      fVar310 = *(float *)(bspline_basis1 + lVar127 + 0x1fb4);
      fVar312 = *(float *)(bspline_basis1 + lVar127 + 0x1694);
      fVar199 = *(float *)(bspline_basis1 + lVar127 + 0x1698);
      fVar266 = *(float *)(bspline_basis1 + lVar127 + 0x169c);
      fVar313 = *(float *)(bspline_basis1 + lVar127 + 0x16a0);
      fVar315 = *(float *)(bspline_basis1 + lVar127 + 0x16a4);
      fVar317 = *(float *)(bspline_basis1 + lVar127 + 0x16a8);
      fVar268 = *(float *)(bspline_basis1 + lVar127 + 0x16ac);
      fVar265 = *(float *)(bspline_basis1 + lVar127 + 0x1210);
      fVar267 = *(float *)(bspline_basis1 + lVar127 + 0x1214);
      fVar202 = *(float *)(bspline_basis1 + lVar127 + 0x1218);
      fVar271 = *(float *)(bspline_basis1 + lVar127 + 0x121c);
      fVar270 = *(float *)(bspline_basis1 + lVar127 + 0x1220);
      fVar273 = *(float *)(bspline_basis1 + lVar127 + 0x1224);
      fVar204 = *(float *)(bspline_basis1 + lVar127 + 0x1228);
      auVar262._0_4_ = fVar205 * fVar265 + fVar150 * fVar312 + fVar153 * fVar301 + fVar239 * fVar289
      ;
      auVar262._4_4_ = fVar220 * fVar267 + fVar151 * fVar199 + fVar166 * fVar246 + fVar269 * fVar291
      ;
      auVar262._8_4_ = fVar221 * fVar202 + fVar129 * fVar266 + fVar168 * fVar252 + fVar272 * fVar325
      ;
      auVar262._12_4_ =
           fVar222 * fVar271 + fVar145 * fVar313 + fVar169 * fVar254 + fVar276 * fVar314;
      auVar262._16_4_ =
           fVar205 * fVar270 + fVar150 * fVar315 + fVar153 * fVar256 + fVar239 * fVar302;
      auVar262._20_4_ =
           fVar220 * fVar273 + fVar151 * fVar317 + fVar166 * fVar275 + fVar269 * fVar316;
      auVar262._24_4_ =
           fVar221 * fVar204 + fVar129 * fVar268 + fVar168 * fVar285 + fVar272 * fVar310;
      auVar262._28_4_ = fVar188 + fVar188 + fVar296 + fVar276;
      auVar281._0_4_ = fVar260 * fVar265 + fVar224 * fVar312 + fVar171 * fVar301 + fVar326 * fVar289
      ;
      auVar281._4_4_ = fVar277 * fVar267 + fVar234 * fVar199 + fVar186 * fVar246 + fVar331 * fVar291
      ;
      auVar281._8_4_ = fVar287 * fVar202 + fVar235 * fVar266 + fVar187 * fVar252 + fVar332 * fVar325
      ;
      auVar281._12_4_ =
           fVar290 * fVar271 + fVar236 * fVar313 + fVar188 * fVar254 + fVar333 * fVar314;
      auVar281._16_4_ =
           fVar260 * fVar270 + fVar224 * fVar315 + fVar171 * fVar256 + fVar326 * fVar302;
      auVar281._20_4_ =
           fVar277 * fVar273 + fVar234 * fVar317 + fVar186 * fVar275 + fVar331 * fVar316;
      auVar281._24_4_ =
           fVar287 * fVar204 + fVar235 * fVar268 + fVar187 * fVar285 + fVar332 * fVar310;
      auVar281._28_4_ = fVar188 + fVar188 + fVar188 + fVar296;
      auVar181._0_4_ = fVar200 * fVar265 + fVar274 * fVar312 + fVar253 * fVar301 + fVar289 * fVar311
      ;
      auVar181._4_4_ = fVar201 * fVar267 + fVar238 * fVar199 + fVar255 * fVar246 + fVar291 * fVar152
      ;
      auVar181._8_4_ = fVar203 * fVar202 + fVar286 * fVar266 + fVar257 * fVar252 + fVar325 * fVar165
      ;
      auVar181._12_4_ =
           fVar237 * fVar271 + fVar247 * fVar313 + fVar258 * fVar254 + fVar314 * fVar167;
      auVar181._16_4_ =
           fVar200 * fVar270 + fVar274 * fVar315 + fVar253 * fVar256 + fVar302 * fVar311;
      auVar181._20_4_ =
           fVar201 * fVar273 + fVar238 * fVar317 + fVar255 * fVar275 + fVar316 * fVar152;
      auVar181._24_4_ =
           fVar203 * fVar204 + fVar286 * fVar268 + fVar257 * fVar285 + fVar310 * fVar165;
      auVar181._28_4_ =
           *(float *)(bspline_basis1 + lVar127 + 0x122c) +
           *(float *)(bspline_basis1 + lVar127 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar127 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar127 + 0x1fb8);
      auVar216._8_4_ = 0x7fffffff;
      auVar216._0_8_ = 0x7fffffff7fffffff;
      auVar216._12_4_ = 0x7fffffff;
      auVar216._16_4_ = 0x7fffffff;
      auVar216._20_4_ = 0x7fffffff;
      auVar216._24_4_ = 0x7fffffff;
      auVar216._28_4_ = 0x7fffffff;
      auVar161 = vandps_avx(_local_560,auVar216);
      auVar18 = vandps_avx(auVar157,auVar216);
      auVar18 = vmaxps_avx(auVar161,auVar18);
      auVar161 = vandps_avx(auVar241,auVar216);
      auVar161 = vmaxps_avx(auVar18,auVar161);
      auVar227 = vpermilps_avx(auVar227,0);
      auVar242._16_16_ = auVar227;
      auVar242._0_16_ = auVar227;
      auVar161 = vcmpps_avx(auVar161,auVar242,1);
      auVar27 = vblendvps_avx(_local_560,auVar25,auVar161);
      auVar32 = vblendvps_avx(auVar157,auVar26,auVar161);
      auVar161 = vandps_avx(auVar262,auVar216);
      auVar18 = vandps_avx(auVar281,auVar216);
      auVar19 = vmaxps_avx(auVar161,auVar18);
      auVar161 = vandps_avx(auVar181,auVar216);
      auVar161 = vmaxps_avx(auVar19,auVar161);
      auVar19 = vcmpps_avx(auVar161,auVar242,1);
      auVar161 = vblendvps_avx(auVar262,auVar25,auVar19);
      auVar25 = vblendvps_avx(auVar281,auVar26,auVar19);
      fVar296 = auVar27._0_4_;
      fVar144 = auVar27._4_4_;
      fVar146 = auVar27._8_4_;
      fVar147 = auVar27._12_4_;
      fVar148 = auVar27._16_4_;
      fVar149 = auVar27._20_4_;
      fVar150 = auVar27._24_4_;
      fVar151 = auVar161._0_4_;
      fVar129 = auVar161._4_4_;
      fVar145 = auVar161._8_4_;
      fVar223 = auVar161._12_4_;
      fVar200 = auVar161._16_4_;
      fVar201 = auVar161._20_4_;
      fVar203 = auVar161._24_4_;
      fVar274 = -auVar161._28_4_;
      fVar301 = auVar32._0_4_;
      fVar256 = auVar32._4_4_;
      fVar291 = auVar32._8_4_;
      fVar316 = auVar32._12_4_;
      fVar266 = auVar32._16_4_;
      fVar268 = auVar32._20_4_;
      fVar271 = auVar32._24_4_;
      auVar136._0_4_ = fVar301 * fVar301 + fVar296 * fVar296;
      auVar136._4_4_ = fVar256 * fVar256 + fVar144 * fVar144;
      auVar136._8_4_ = fVar291 * fVar291 + fVar146 * fVar146;
      auVar136._12_4_ = fVar316 * fVar316 + fVar147 * fVar147;
      auVar136._16_4_ = fVar266 * fVar266 + fVar148 * fVar148;
      auVar136._20_4_ = fVar268 * fVar268 + fVar149 * fVar149;
      auVar136._24_4_ = fVar271 * fVar271 + fVar150 * fVar150;
      auVar136._28_4_ = auVar281._28_4_ + auVar27._28_4_;
      auVar27 = vrsqrtps_avx(auVar136);
      fVar246 = auVar27._0_4_;
      fVar252 = auVar27._4_4_;
      auVar26._4_4_ = fVar252 * 1.5;
      auVar26._0_4_ = fVar246 * 1.5;
      fVar254 = auVar27._8_4_;
      auVar26._8_4_ = fVar254 * 1.5;
      fVar275 = auVar27._12_4_;
      auVar26._12_4_ = fVar275 * 1.5;
      fVar285 = auVar27._16_4_;
      auVar26._16_4_ = fVar285 * 1.5;
      fVar289 = auVar27._20_4_;
      auVar26._20_4_ = fVar289 * 1.5;
      fVar325 = auVar27._24_4_;
      fVar170 = auVar18._28_4_;
      auVar26._24_4_ = fVar325 * 1.5;
      auVar26._28_4_ = fVar170;
      auVar28._4_4_ = fVar252 * fVar252 * fVar252 * auVar136._4_4_ * 0.5;
      auVar28._0_4_ = fVar246 * fVar246 * fVar246 * auVar136._0_4_ * 0.5;
      auVar28._8_4_ = fVar254 * fVar254 * fVar254 * auVar136._8_4_ * 0.5;
      auVar28._12_4_ = fVar275 * fVar275 * fVar275 * auVar136._12_4_ * 0.5;
      auVar28._16_4_ = fVar285 * fVar285 * fVar285 * auVar136._16_4_ * 0.5;
      auVar28._20_4_ = fVar289 * fVar289 * fVar289 * auVar136._20_4_ * 0.5;
      auVar28._24_4_ = fVar325 * fVar325 * fVar325 * auVar136._24_4_ * 0.5;
      auVar28._28_4_ = auVar136._28_4_;
      auVar18 = vsubps_avx(auVar26,auVar28);
      fVar246 = auVar18._0_4_;
      fVar275 = auVar18._4_4_;
      fVar325 = auVar18._8_4_;
      fVar310 = auVar18._12_4_;
      fVar313 = auVar18._16_4_;
      fVar265 = auVar18._20_4_;
      fVar270 = auVar18._24_4_;
      fVar252 = auVar25._0_4_;
      fVar285 = auVar25._4_4_;
      fVar314 = auVar25._8_4_;
      fVar312 = auVar25._12_4_;
      fVar315 = auVar25._16_4_;
      fVar267 = auVar25._20_4_;
      fVar273 = auVar25._24_4_;
      auVar137._0_4_ = fVar252 * fVar252 + fVar151 * fVar151;
      auVar137._4_4_ = fVar285 * fVar285 + fVar129 * fVar129;
      auVar137._8_4_ = fVar314 * fVar314 + fVar145 * fVar145;
      auVar137._12_4_ = fVar312 * fVar312 + fVar223 * fVar223;
      auVar137._16_4_ = fVar315 * fVar315 + fVar200 * fVar200;
      auVar137._20_4_ = fVar267 * fVar267 + fVar201 * fVar201;
      auVar137._24_4_ = fVar273 * fVar273 + fVar203 * fVar203;
      auVar137._28_4_ = auVar161._28_4_ + auVar18._28_4_;
      auVar161 = vrsqrtps_avx(auVar137);
      fVar254 = auVar161._0_4_;
      fVar289 = auVar161._4_4_;
      auVar29._4_4_ = fVar289 * 1.5;
      auVar29._0_4_ = fVar254 * 1.5;
      fVar302 = auVar161._8_4_;
      auVar29._8_4_ = fVar302 * 1.5;
      fVar199 = auVar161._12_4_;
      auVar29._12_4_ = fVar199 * 1.5;
      fVar317 = auVar161._16_4_;
      auVar29._16_4_ = fVar317 * 1.5;
      fVar202 = auVar161._20_4_;
      auVar29._20_4_ = fVar202 * 1.5;
      fVar204 = auVar161._24_4_;
      auVar29._24_4_ = fVar204 * 1.5;
      auVar29._28_4_ = fVar170;
      auVar161._4_4_ = fVar289 * fVar289 * fVar289 * auVar137._4_4_ * 0.5;
      auVar161._0_4_ = fVar254 * fVar254 * fVar254 * auVar137._0_4_ * 0.5;
      auVar161._8_4_ = fVar302 * fVar302 * fVar302 * auVar137._8_4_ * 0.5;
      auVar161._12_4_ = fVar199 * fVar199 * fVar199 * auVar137._12_4_ * 0.5;
      auVar161._16_4_ = fVar317 * fVar317 * fVar317 * auVar137._16_4_ * 0.5;
      auVar161._20_4_ = fVar202 * fVar202 * fVar202 * auVar137._20_4_ * 0.5;
      auVar161._24_4_ = fVar204 * fVar204 * fVar204 * auVar137._24_4_ * 0.5;
      auVar161._28_4_ = auVar137._28_4_;
      auVar161 = vsubps_avx(auVar29,auVar161);
      fVar254 = auVar161._0_4_;
      fVar289 = auVar161._4_4_;
      fVar302 = auVar161._8_4_;
      fVar199 = auVar161._12_4_;
      fVar317 = auVar161._16_4_;
      fVar202 = auVar161._20_4_;
      fVar204 = auVar161._24_4_;
      fVar301 = auVar135._0_4_ * fVar301 * fVar246;
      fVar256 = auVar135._4_4_ * fVar256 * fVar275;
      auVar30._4_4_ = fVar256;
      auVar30._0_4_ = fVar301;
      fVar291 = auVar135._8_4_ * fVar291 * fVar325;
      auVar30._8_4_ = fVar291;
      fVar316 = auVar135._12_4_ * fVar316 * fVar310;
      auVar30._12_4_ = fVar316;
      fVar266 = auVar135._16_4_ * fVar266 * fVar313;
      auVar30._16_4_ = fVar266;
      fVar268 = auVar135._20_4_ * fVar268 * fVar265;
      auVar30._20_4_ = fVar268;
      fVar271 = auVar135._24_4_ * fVar271 * fVar270;
      auVar30._24_4_ = fVar271;
      auVar30._28_4_ = fVar274;
      local_6c0._4_4_ = fVar256 + auVar305._4_4_;
      local_6c0._0_4_ = fVar301 + auVar305._0_4_;
      fStack_6b8 = fVar291 + auVar305._8_4_;
      fStack_6b4 = fVar316 + auVar305._12_4_;
      fStack_6b0 = fVar266 + auVar306._16_4_;
      fStack_6ac = fVar268 + auVar306._20_4_;
      fStack_6a8 = fVar271 + auVar306._24_4_;
      fStack_6a4 = fVar274 + auVar306._28_4_;
      fVar301 = auVar135._0_4_ * fVar246 * -fVar296;
      fVar256 = auVar135._4_4_ * fVar275 * -fVar144;
      auVar33._4_4_ = fVar256;
      auVar33._0_4_ = fVar301;
      fVar291 = auVar135._8_4_ * fVar325 * -fVar146;
      auVar33._8_4_ = fVar291;
      fVar316 = auVar135._12_4_ * fVar310 * -fVar147;
      auVar33._12_4_ = fVar316;
      fVar266 = auVar135._16_4_ * fVar313 * -fVar148;
      auVar33._16_4_ = fVar266;
      fVar268 = auVar135._20_4_ * fVar265 * -fVar149;
      auVar33._20_4_ = fVar268;
      fVar271 = auVar135._24_4_ * fVar270 * -fVar150;
      auVar33._24_4_ = fVar271;
      auVar33._28_4_ = fVar170;
      local_680._4_4_ = fVar256 + auVar250._4_4_;
      local_680._0_4_ = fVar301 + auVar250._0_4_;
      fStack_678 = fVar291 + auVar250._8_4_;
      fStack_674 = fVar316 + auVar250._12_4_;
      auStack_670._0_4_ = fVar266 + auVar250._16_4_;
      auStack_670._4_4_ = fVar268 + auVar250._20_4_;
      fStack_668 = fVar271 + auVar250._24_4_;
      fStack_664 = fVar170 + auVar250._28_4_;
      fVar301 = fVar246 * 0.0 * auVar135._0_4_;
      fVar246 = fVar275 * 0.0 * auVar135._4_4_;
      auVar34._4_4_ = fVar246;
      auVar34._0_4_ = fVar301;
      fVar256 = fVar325 * 0.0 * auVar135._8_4_;
      auVar34._8_4_ = fVar256;
      fVar275 = fVar310 * 0.0 * auVar135._12_4_;
      auVar34._12_4_ = fVar275;
      fVar291 = fVar313 * 0.0 * auVar135._16_4_;
      auVar34._16_4_ = fVar291;
      fVar325 = fVar265 * 0.0 * auVar135._20_4_;
      auVar34._20_4_ = fVar325;
      fVar316 = fVar270 * 0.0 * auVar135._24_4_;
      auVar34._24_4_ = fVar316;
      auVar34._28_4_ = fVar333;
      auVar111._4_4_ = fStack_65c;
      auVar111._0_4_ = local_660;
      auVar111._8_4_ = fStack_658;
      auVar111._12_4_ = fStack_654;
      auVar111._16_4_ = fStack_650;
      auVar111._20_4_ = fStack_64c;
      auVar111._24_4_ = fStack_648;
      auVar111._28_4_ = fStack_644;
      auVar243._0_4_ = fVar301 + local_660;
      auVar243._4_4_ = fVar246 + fStack_65c;
      auVar243._8_4_ = fVar256 + fStack_658;
      auVar243._12_4_ = fVar275 + fStack_654;
      auVar243._16_4_ = fVar291 + fStack_650;
      auVar243._20_4_ = fVar325 + fStack_64c;
      auVar243._24_4_ = fVar316 + fStack_648;
      auVar243._28_4_ = fVar333 + fStack_644;
      fVar301 = (float)local_7a0._0_4_ * fVar252 * fVar254;
      fVar246 = local_7a0._4_4_ * fVar285 * fVar289;
      auVar35._4_4_ = fVar246;
      auVar35._0_4_ = fVar301;
      fVar252 = local_7a0._8_4_ * fVar314 * fVar302;
      auVar35._8_4_ = fVar252;
      fVar256 = local_7a0._12_4_ * fVar312 * fVar199;
      auVar35._12_4_ = fVar256;
      fVar275 = local_7a0._16_4_ * fVar315 * fVar317;
      auVar35._16_4_ = fVar275;
      fVar285 = local_7a0._20_4_ * fVar267 * fVar202;
      auVar35._20_4_ = fVar285;
      fVar291 = local_7a0._24_4_ * fVar273 * fVar204;
      auVar35._24_4_ = fVar291;
      auVar35._28_4_ = auVar25._28_4_;
      auVar19 = vsubps_avx(auVar306,auVar30);
      auVar282._0_4_ = auVar215._0_4_ + fVar301;
      auVar282._4_4_ = auVar215._4_4_ + fVar246;
      auVar282._8_4_ = auVar215._8_4_ + fVar252;
      auVar282._12_4_ = auVar215._12_4_ + fVar256;
      auVar282._16_4_ = auVar215._16_4_ + fVar275;
      auVar282._20_4_ = auVar215._20_4_ + fVar285;
      auVar282._24_4_ = auVar215._24_4_ + fVar291;
      auVar282._28_4_ = auVar215._28_4_ + auVar25._28_4_;
      fVar301 = (float)local_7a0._0_4_ * -fVar151 * fVar254;
      fVar246 = local_7a0._4_4_ * -fVar129 * fVar289;
      auVar25._4_4_ = fVar246;
      auVar25._0_4_ = fVar301;
      fVar252 = local_7a0._8_4_ * -fVar145 * fVar302;
      auVar25._8_4_ = fVar252;
      fVar256 = local_7a0._12_4_ * -fVar223 * fVar199;
      auVar25._12_4_ = fVar256;
      fVar275 = local_7a0._16_4_ * -fVar200 * fVar317;
      auVar25._16_4_ = fVar275;
      fVar285 = local_7a0._20_4_ * -fVar201 * fVar202;
      auVar25._20_4_ = fVar285;
      fVar291 = local_7a0._24_4_ * -fVar203 * fVar204;
      auVar25._24_4_ = fVar291;
      auVar25._28_4_ = fVar247;
      auVar194 = vsubps_avx(auVar250,auVar33);
      auVar298._0_4_ = fVar301 + (float)local_640._0_4_;
      auVar298._4_4_ = fVar246 + (float)local_640._4_4_;
      auVar298._8_4_ = fVar252 + fStack_638;
      auVar298._12_4_ = fVar256 + fStack_634;
      auVar298._16_4_ = fVar275 + fStack_630;
      auVar298._20_4_ = fVar285 + fStack_62c;
      auVar298._24_4_ = fVar291 + fStack_628;
      auVar298._28_4_ = fVar247 + fStack_624;
      fVar301 = fVar254 * 0.0 * (float)local_7a0._0_4_;
      fVar246 = fVar289 * 0.0 * local_7a0._4_4_;
      auVar36._4_4_ = fVar246;
      auVar36._0_4_ = fVar301;
      fVar252 = fVar302 * 0.0 * local_7a0._8_4_;
      auVar36._8_4_ = fVar252;
      fVar254 = fVar199 * 0.0 * local_7a0._12_4_;
      auVar36._12_4_ = fVar254;
      fVar256 = fVar317 * 0.0 * local_7a0._16_4_;
      auVar36._16_4_ = fVar256;
      fVar275 = fVar202 * 0.0 * local_7a0._20_4_;
      auVar36._20_4_ = fVar275;
      fVar285 = fVar204 * 0.0 * local_7a0._24_4_;
      auVar36._24_4_ = fVar285;
      auVar36._28_4_ = 0x3f000000;
      auVar306 = vsubps_avx(auVar111,auVar34);
      auVar113._4_4_ = fStack_57c;
      auVar113._0_4_ = local_580;
      auVar113._8_4_ = fStack_578;
      auVar113._12_4_ = fStack_574;
      auVar113._16_4_ = fStack_570;
      auVar113._20_4_ = fStack_56c;
      auVar113._24_4_ = fStack_568;
      auVar113._28_4_ = fStack_564;
      auVar334._0_4_ = fVar301 + local_580;
      auVar334._4_4_ = fVar246 + fStack_57c;
      auVar334._8_4_ = fVar252 + fStack_578;
      auVar334._12_4_ = fVar254 + fStack_574;
      auVar334._16_4_ = fVar256 + fStack_570;
      auVar334._20_4_ = fVar275 + fStack_56c;
      auVar334._24_4_ = fVar285 + fStack_568;
      auVar334._28_4_ = fStack_564 + 0.5;
      auVar161 = vsubps_avx(auVar215,auVar35);
      auVar18 = vsubps_avx(_local_640,auVar25);
      auVar28 = vsubps_avx(auVar113,auVar36);
      auVar27 = vsubps_avx(auVar298,auVar194);
      auVar25 = vsubps_avx(auVar334,auVar306);
      auVar37._4_4_ = auVar306._4_4_ * auVar27._4_4_;
      auVar37._0_4_ = auVar306._0_4_ * auVar27._0_4_;
      auVar37._8_4_ = auVar306._8_4_ * auVar27._8_4_;
      auVar37._12_4_ = auVar306._12_4_ * auVar27._12_4_;
      auVar37._16_4_ = auVar306._16_4_ * auVar27._16_4_;
      auVar37._20_4_ = auVar306._20_4_ * auVar27._20_4_;
      auVar37._24_4_ = auVar306._24_4_ * auVar27._24_4_;
      auVar37._28_4_ = fVar237;
      auVar38._4_4_ = auVar194._4_4_ * auVar25._4_4_;
      auVar38._0_4_ = auVar194._0_4_ * auVar25._0_4_;
      auVar38._8_4_ = auVar194._8_4_ * auVar25._8_4_;
      auVar38._12_4_ = auVar194._12_4_ * auVar25._12_4_;
      auVar38._16_4_ = auVar194._16_4_ * auVar25._16_4_;
      auVar38._20_4_ = auVar194._20_4_ * auVar25._20_4_;
      auVar38._24_4_ = auVar194._24_4_ * auVar25._24_4_;
      auVar38._28_4_ = fStack_624;
      auVar26 = vsubps_avx(auVar38,auVar37);
      auVar39._4_4_ = auVar19._4_4_ * auVar25._4_4_;
      auVar39._0_4_ = auVar19._0_4_ * auVar25._0_4_;
      auVar39._8_4_ = auVar19._8_4_ * auVar25._8_4_;
      auVar39._12_4_ = auVar19._12_4_ * auVar25._12_4_;
      auVar39._16_4_ = auVar19._16_4_ * auVar25._16_4_;
      auVar39._20_4_ = auVar19._20_4_ * auVar25._20_4_;
      auVar39._24_4_ = auVar19._24_4_ * auVar25._24_4_;
      auVar39._28_4_ = auVar25._28_4_;
      auVar32 = vsubps_avx(auVar282,auVar19);
      auVar40._4_4_ = auVar32._4_4_ * auVar306._4_4_;
      auVar40._0_4_ = auVar32._0_4_ * auVar306._0_4_;
      auVar40._8_4_ = auVar32._8_4_ * auVar306._8_4_;
      auVar40._12_4_ = auVar32._12_4_ * auVar306._12_4_;
      auVar40._16_4_ = auVar32._16_4_ * auVar306._16_4_;
      auVar40._20_4_ = auVar32._20_4_ * auVar306._20_4_;
      auVar40._24_4_ = auVar32._24_4_ * auVar306._24_4_;
      auVar40._28_4_ = auVar215._28_4_;
      auVar215 = vsubps_avx(auVar40,auVar39);
      auVar41._4_4_ = auVar32._4_4_ * auVar194._4_4_;
      auVar41._0_4_ = auVar32._0_4_ * auVar194._0_4_;
      auVar41._8_4_ = auVar32._8_4_ * auVar194._8_4_;
      auVar41._12_4_ = auVar32._12_4_ * auVar194._12_4_;
      auVar41._16_4_ = auVar32._16_4_ * auVar194._16_4_;
      auVar41._20_4_ = auVar32._20_4_ * auVar194._20_4_;
      auVar41._24_4_ = auVar32._24_4_ * auVar194._24_4_;
      auVar41._28_4_ = auVar25._28_4_;
      auVar42._4_4_ = auVar19._4_4_ * auVar27._4_4_;
      auVar42._0_4_ = auVar19._0_4_ * auVar27._0_4_;
      auVar42._8_4_ = auVar19._8_4_ * auVar27._8_4_;
      auVar42._12_4_ = auVar19._12_4_ * auVar27._12_4_;
      auVar42._16_4_ = auVar19._16_4_ * auVar27._16_4_;
      auVar42._20_4_ = auVar19._20_4_ * auVar27._20_4_;
      auVar42._24_4_ = auVar19._24_4_ * auVar27._24_4_;
      auVar42._28_4_ = auVar27._28_4_;
      auVar27 = vsubps_avx(auVar42,auVar41);
      auVar138._0_4_ = auVar26._0_4_ * 0.0 + auVar27._0_4_ + auVar215._0_4_ * 0.0;
      auVar138._4_4_ = auVar26._4_4_ * 0.0 + auVar27._4_4_ + auVar215._4_4_ * 0.0;
      auVar138._8_4_ = auVar26._8_4_ * 0.0 + auVar27._8_4_ + auVar215._8_4_ * 0.0;
      auVar138._12_4_ = auVar26._12_4_ * 0.0 + auVar27._12_4_ + auVar215._12_4_ * 0.0;
      auVar138._16_4_ = auVar26._16_4_ * 0.0 + auVar27._16_4_ + auVar215._16_4_ * 0.0;
      auVar138._20_4_ = auVar26._20_4_ * 0.0 + auVar27._20_4_ + auVar215._20_4_ * 0.0;
      auVar138._24_4_ = auVar26._24_4_ * 0.0 + auVar27._24_4_ + auVar215._24_4_ * 0.0;
      auVar138._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar215._28_4_;
      auVar250 = vcmpps_avx(auVar138,ZEXT432(0) << 0x20,2);
      auVar161 = vblendvps_avx(auVar161,_local_6c0,auVar250);
      auVar18 = vblendvps_avx(auVar18,_local_680,auVar250);
      auVar27 = vblendvps_avx(auVar28,auVar243,auVar250);
      auVar25 = vblendvps_avx(auVar19,auVar282,auVar250);
      auVar26 = vblendvps_avx(auVar194,auVar298,auVar250);
      auVar32 = vblendvps_avx(auVar306,auVar334,auVar250);
      auVar19 = vblendvps_avx(auVar282,auVar19,auVar250);
      auVar194 = vblendvps_avx(auVar298,auVar194,auVar250);
      auVar227 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
      auVar215 = vblendvps_avx(auVar334,auVar306,auVar250);
      auVar19 = vsubps_avx(auVar19,auVar161);
      auVar306 = vsubps_avx(auVar194,auVar18);
      auVar215 = vsubps_avx(auVar215,auVar27);
      auVar29 = vsubps_avx(auVar18,auVar26);
      fVar301 = auVar306._0_4_;
      fVar150 = auVar27._0_4_;
      fVar275 = auVar306._4_4_;
      fVar151 = auVar27._4_4_;
      auVar43._4_4_ = fVar151 * fVar275;
      auVar43._0_4_ = fVar150 * fVar301;
      fVar314 = auVar306._8_4_;
      fVar129 = auVar27._8_4_;
      auVar43._8_4_ = fVar129 * fVar314;
      fVar199 = auVar306._12_4_;
      fVar145 = auVar27._12_4_;
      auVar43._12_4_ = fVar145 * fVar199;
      fVar268 = auVar306._16_4_;
      fVar223 = auVar27._16_4_;
      auVar43._16_4_ = fVar223 * fVar268;
      fVar270 = auVar306._20_4_;
      fVar200 = auVar27._20_4_;
      auVar43._20_4_ = fVar200 * fVar270;
      fVar144 = auVar306._24_4_;
      fVar201 = auVar27._24_4_;
      auVar43._24_4_ = fVar201 * fVar144;
      auVar43._28_4_ = auVar194._28_4_;
      fVar246 = auVar18._0_4_;
      fVar276 = auVar215._0_4_;
      fVar285 = auVar18._4_4_;
      fVar286 = auVar215._4_4_;
      auVar44._4_4_ = fVar286 * fVar285;
      auVar44._0_4_ = fVar276 * fVar246;
      fVar302 = auVar18._8_4_;
      fVar247 = auVar215._8_4_;
      auVar44._8_4_ = fVar247 * fVar302;
      fVar266 = auVar18._12_4_;
      fVar253 = auVar215._12_4_;
      auVar44._12_4_ = fVar253 * fVar266;
      fVar265 = auVar18._16_4_;
      fVar255 = auVar215._16_4_;
      auVar44._16_4_ = fVar255 * fVar265;
      fVar273 = auVar18._20_4_;
      fVar257 = auVar215._20_4_;
      auVar44._20_4_ = fVar257 * fVar273;
      fVar146 = auVar18._24_4_;
      fVar258 = auVar215._24_4_;
      uVar126 = auVar28._28_4_;
      auVar44._24_4_ = fVar258 * fVar146;
      auVar44._28_4_ = uVar126;
      auVar18 = vsubps_avx(auVar44,auVar43);
      fVar252 = auVar161._0_4_;
      fVar289 = auVar161._4_4_;
      auVar45._4_4_ = fVar286 * fVar289;
      auVar45._0_4_ = fVar276 * fVar252;
      fVar316 = auVar161._8_4_;
      auVar45._8_4_ = fVar247 * fVar316;
      fVar313 = auVar161._12_4_;
      auVar45._12_4_ = fVar253 * fVar313;
      fVar267 = auVar161._16_4_;
      auVar45._16_4_ = fVar255 * fVar267;
      fVar204 = auVar161._20_4_;
      auVar45._20_4_ = fVar257 * fVar204;
      fVar147 = auVar161._24_4_;
      auVar45._24_4_ = fVar258 * fVar147;
      auVar45._28_4_ = uVar126;
      fVar254 = auVar19._0_4_;
      fVar291 = auVar19._4_4_;
      auVar46._4_4_ = fVar151 * fVar291;
      auVar46._0_4_ = fVar150 * fVar254;
      fVar310 = auVar19._8_4_;
      auVar46._8_4_ = fVar129 * fVar310;
      fVar315 = auVar19._12_4_;
      auVar46._12_4_ = fVar145 * fVar315;
      fVar202 = auVar19._16_4_;
      auVar46._16_4_ = fVar223 * fVar202;
      fVar170 = auVar19._20_4_;
      auVar46._20_4_ = fVar200 * fVar170;
      fVar148 = auVar19._24_4_;
      auVar46._24_4_ = fVar201 * fVar148;
      auVar46._28_4_ = auVar334._28_4_;
      auVar194 = vsubps_avx(auVar46,auVar45);
      auVar47._4_4_ = fVar285 * fVar291;
      auVar47._0_4_ = fVar246 * fVar254;
      auVar47._8_4_ = fVar302 * fVar310;
      auVar47._12_4_ = fVar266 * fVar315;
      auVar47._16_4_ = fVar265 * fVar202;
      auVar47._20_4_ = fVar273 * fVar170;
      auVar47._24_4_ = fVar146 * fVar148;
      auVar47._28_4_ = uVar126;
      auVar335._0_4_ = fVar252 * fVar301;
      auVar335._4_4_ = fVar289 * fVar275;
      auVar335._8_4_ = fVar316 * fVar314;
      auVar335._12_4_ = fVar313 * fVar199;
      auVar335._16_4_ = fVar267 * fVar268;
      auVar335._20_4_ = fVar204 * fVar270;
      auVar335._24_4_ = fVar147 * fVar144;
      auVar335._28_4_ = 0;
      auVar28 = vsubps_avx(auVar335,auVar47);
      auVar30 = vsubps_avx(auVar27,auVar32);
      fVar256 = auVar28._28_4_ + auVar194._28_4_;
      auVar158._0_4_ = auVar28._0_4_ + auVar194._0_4_ * 0.0 + auVar18._0_4_ * 0.0;
      auVar158._4_4_ = auVar28._4_4_ + auVar194._4_4_ * 0.0 + auVar18._4_4_ * 0.0;
      auVar158._8_4_ = auVar28._8_4_ + auVar194._8_4_ * 0.0 + auVar18._8_4_ * 0.0;
      auVar158._12_4_ = auVar28._12_4_ + auVar194._12_4_ * 0.0 + auVar18._12_4_ * 0.0;
      auVar158._16_4_ = auVar28._16_4_ + auVar194._16_4_ * 0.0 + auVar18._16_4_ * 0.0;
      auVar158._20_4_ = auVar28._20_4_ + auVar194._20_4_ * 0.0 + auVar18._20_4_ * 0.0;
      auVar158._24_4_ = auVar28._24_4_ + auVar194._24_4_ * 0.0 + auVar18._24_4_ * 0.0;
      auVar158._28_4_ = fVar256 + auVar18._28_4_;
      fVar203 = auVar29._0_4_;
      fVar274 = auVar29._4_4_;
      auVar48._4_4_ = fVar274 * auVar32._4_4_;
      auVar48._0_4_ = fVar203 * auVar32._0_4_;
      fVar237 = auVar29._8_4_;
      auVar48._8_4_ = fVar237 * auVar32._8_4_;
      fVar238 = auVar29._12_4_;
      auVar48._12_4_ = fVar238 * auVar32._12_4_;
      fVar239 = auVar29._16_4_;
      auVar48._16_4_ = fVar239 * auVar32._16_4_;
      fVar269 = auVar29._20_4_;
      auVar48._20_4_ = fVar269 * auVar32._20_4_;
      fVar272 = auVar29._24_4_;
      auVar48._24_4_ = fVar272 * auVar32._24_4_;
      auVar48._28_4_ = fVar256;
      fVar256 = auVar30._0_4_;
      fVar325 = auVar30._4_4_;
      auVar49._4_4_ = auVar26._4_4_ * fVar325;
      auVar49._0_4_ = auVar26._0_4_ * fVar256;
      fVar312 = auVar30._8_4_;
      auVar49._8_4_ = auVar26._8_4_ * fVar312;
      fVar317 = auVar30._12_4_;
      auVar49._12_4_ = auVar26._12_4_ * fVar317;
      fVar271 = auVar30._16_4_;
      auVar49._16_4_ = auVar26._16_4_ * fVar271;
      fVar296 = auVar30._20_4_;
      auVar49._20_4_ = auVar26._20_4_ * fVar296;
      fVar149 = auVar30._24_4_;
      auVar49._24_4_ = auVar26._24_4_ * fVar149;
      auVar49._28_4_ = auVar28._28_4_;
      auVar194 = vsubps_avx(auVar49,auVar48);
      auVar28 = vsubps_avx(auVar161,auVar25);
      fVar259 = auVar28._0_4_;
      fVar260 = auVar28._4_4_;
      auVar50._4_4_ = fVar260 * auVar32._4_4_;
      auVar50._0_4_ = fVar259 * auVar32._0_4_;
      fVar277 = auVar28._8_4_;
      auVar50._8_4_ = fVar277 * auVar32._8_4_;
      fVar287 = auVar28._12_4_;
      auVar50._12_4_ = fVar287 * auVar32._12_4_;
      fVar290 = auVar28._16_4_;
      auVar50._16_4_ = fVar290 * auVar32._16_4_;
      fVar292 = auVar28._20_4_;
      auVar50._20_4_ = fVar292 * auVar32._20_4_;
      fVar293 = auVar28._24_4_;
      auVar50._24_4_ = fVar293 * auVar32._24_4_;
      auVar50._28_4_ = auVar32._28_4_;
      auVar51._4_4_ = auVar25._4_4_ * fVar325;
      auVar51._0_4_ = auVar25._0_4_ * fVar256;
      auVar51._8_4_ = auVar25._8_4_ * fVar312;
      auVar51._12_4_ = auVar25._12_4_ * fVar317;
      auVar51._16_4_ = auVar25._16_4_ * fVar271;
      auVar51._20_4_ = auVar25._20_4_ * fVar296;
      auVar51._24_4_ = auVar25._24_4_ * fVar149;
      auVar51._28_4_ = auVar18._28_4_;
      auVar18 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar26._4_4_ * fVar260;
      auVar52._0_4_ = auVar26._0_4_ * fVar259;
      auVar52._8_4_ = auVar26._8_4_ * fVar277;
      auVar52._12_4_ = auVar26._12_4_ * fVar287;
      auVar52._16_4_ = auVar26._16_4_ * fVar290;
      auVar52._20_4_ = auVar26._20_4_ * fVar292;
      auVar52._24_4_ = auVar26._24_4_ * fVar293;
      auVar52._28_4_ = auVar32._28_4_;
      auVar53._4_4_ = auVar25._4_4_ * fVar274;
      auVar53._0_4_ = auVar25._0_4_ * fVar203;
      auVar53._8_4_ = auVar25._8_4_ * fVar237;
      auVar53._12_4_ = auVar25._12_4_ * fVar238;
      auVar53._16_4_ = auVar25._16_4_ * fVar239;
      auVar53._20_4_ = auVar25._20_4_ * fVar269;
      auVar53._24_4_ = auVar25._24_4_ * fVar272;
      auVar53._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar53,auVar52);
      auVar217._0_4_ = auVar194._0_4_ * 0.0 + auVar25._0_4_ + auVar18._0_4_ * 0.0;
      auVar217._4_4_ = auVar194._4_4_ * 0.0 + auVar25._4_4_ + auVar18._4_4_ * 0.0;
      auVar217._8_4_ = auVar194._8_4_ * 0.0 + auVar25._8_4_ + auVar18._8_4_ * 0.0;
      auVar217._12_4_ = auVar194._12_4_ * 0.0 + auVar25._12_4_ + auVar18._12_4_ * 0.0;
      auVar217._16_4_ = auVar194._16_4_ * 0.0 + auVar25._16_4_ + auVar18._16_4_ * 0.0;
      auVar217._20_4_ = auVar194._20_4_ * 0.0 + auVar25._20_4_ + auVar18._20_4_ * 0.0;
      auVar217._24_4_ = auVar194._24_4_ * 0.0 + auVar25._24_4_ + auVar18._24_4_ * 0.0;
      auVar217._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar18._28_4_;
      auVar18 = vmaxps_avx(auVar158,auVar217);
      auVar18 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,2);
      auVar177 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
      auVar227 = vpand_avx(auVar177,auVar227);
      auVar177 = vpmovsxwd_avx(auVar227);
      auVar213 = vpunpckhwd_avx(auVar227,auVar227);
      auVar195._16_16_ = auVar213;
      auVar195._0_16_ = auVar177;
      if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar195 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar195 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar195 >> 0x7f,0) == '\0') &&
            (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar213 >> 0x3f,0) == '\0') &&
          (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar213[0xf]
         ) {
LAB_008e2306:
        auVar230._8_8_ = uStack_598;
        auVar230._0_8_ = local_5a0;
        auVar230._16_8_ = uStack_590;
        auVar230._24_8_ = uStack_588;
        auVar198 = ZEXT3264(auVar195);
        auVar164 = ZEXT3264(local_5e0);
      }
      else {
        auVar54._4_4_ = fVar325 * fVar275;
        auVar54._0_4_ = fVar256 * fVar301;
        auVar54._8_4_ = fVar312 * fVar314;
        auVar54._12_4_ = fVar317 * fVar199;
        auVar54._16_4_ = fVar271 * fVar268;
        auVar54._20_4_ = fVar296 * fVar270;
        auVar54._24_4_ = fVar149 * fVar144;
        auVar54._28_4_ = auVar213._12_4_;
        auVar321._0_4_ = fVar203 * fVar276;
        auVar321._4_4_ = fVar274 * fVar286;
        auVar321._8_4_ = fVar237 * fVar247;
        auVar321._12_4_ = fVar238 * fVar253;
        auVar321._16_4_ = fVar239 * fVar255;
        auVar321._20_4_ = fVar269 * fVar257;
        auVar321._24_4_ = fVar272 * fVar258;
        auVar321._28_4_ = 0;
        auVar18 = vsubps_avx(auVar321,auVar54);
        auVar55._4_4_ = fVar260 * fVar286;
        auVar55._0_4_ = fVar259 * fVar276;
        auVar55._8_4_ = fVar277 * fVar247;
        auVar55._12_4_ = fVar287 * fVar253;
        auVar55._16_4_ = fVar290 * fVar255;
        auVar55._20_4_ = fVar292 * fVar257;
        auVar55._24_4_ = fVar293 * fVar258;
        auVar55._28_4_ = auVar215._28_4_;
        auVar56._4_4_ = fVar325 * fVar291;
        auVar56._0_4_ = fVar256 * fVar254;
        auVar56._8_4_ = fVar312 * fVar310;
        auVar56._12_4_ = fVar317 * fVar315;
        auVar56._16_4_ = fVar271 * fVar202;
        auVar56._20_4_ = fVar296 * fVar170;
        auVar56._24_4_ = fVar149 * fVar148;
        auVar56._28_4_ = auVar30._28_4_;
        auVar26 = vsubps_avx(auVar56,auVar55);
        auVar57._4_4_ = fVar274 * fVar291;
        auVar57._0_4_ = fVar203 * fVar254;
        auVar57._8_4_ = fVar237 * fVar310;
        auVar57._12_4_ = fVar238 * fVar315;
        auVar57._16_4_ = fVar239 * fVar202;
        auVar57._20_4_ = fVar269 * fVar170;
        auVar57._24_4_ = fVar272 * fVar148;
        auVar57._28_4_ = auVar158._28_4_;
        auVar58._4_4_ = fVar260 * fVar275;
        auVar58._0_4_ = fVar259 * fVar301;
        auVar58._8_4_ = fVar277 * fVar314;
        auVar58._12_4_ = fVar287 * fVar199;
        auVar58._16_4_ = fVar290 * fVar268;
        auVar58._20_4_ = fVar292 * fVar270;
        auVar58._24_4_ = fVar293 * fVar144;
        auVar58._28_4_ = auVar306._28_4_;
        auVar32 = vsubps_avx(auVar58,auVar57);
        auVar251._0_4_ = auVar18._0_4_ * 0.0 + auVar32._0_4_ + auVar26._0_4_ * 0.0;
        auVar251._4_4_ = auVar18._4_4_ * 0.0 + auVar32._4_4_ + auVar26._4_4_ * 0.0;
        auVar251._8_4_ = auVar18._8_4_ * 0.0 + auVar32._8_4_ + auVar26._8_4_ * 0.0;
        auVar251._12_4_ = auVar18._12_4_ * 0.0 + auVar32._12_4_ + auVar26._12_4_ * 0.0;
        auVar251._16_4_ = auVar18._16_4_ * 0.0 + auVar32._16_4_ + auVar26._16_4_ * 0.0;
        auVar251._20_4_ = auVar18._20_4_ * 0.0 + auVar32._20_4_ + auVar26._20_4_ * 0.0;
        auVar251._24_4_ = auVar18._24_4_ * 0.0 + auVar32._24_4_ + auVar26._24_4_ * 0.0;
        auVar251._28_4_ = auVar306._28_4_ + auVar32._28_4_ + auVar158._28_4_;
        auVar25 = vrcpps_avx(auVar251);
        fVar301 = auVar25._0_4_;
        fVar254 = auVar25._4_4_;
        auVar59._4_4_ = auVar251._4_4_ * fVar254;
        auVar59._0_4_ = auVar251._0_4_ * fVar301;
        fVar256 = auVar25._8_4_;
        auVar59._8_4_ = auVar251._8_4_ * fVar256;
        fVar275 = auVar25._12_4_;
        auVar59._12_4_ = auVar251._12_4_ * fVar275;
        fVar291 = auVar25._16_4_;
        auVar59._16_4_ = auVar251._16_4_ * fVar291;
        fVar325 = auVar25._20_4_;
        auVar59._20_4_ = auVar251._20_4_ * fVar325;
        fVar314 = auVar25._24_4_;
        auVar59._24_4_ = auVar251._24_4_ * fVar314;
        auVar59._28_4_ = auVar30._28_4_;
        auVar322._8_4_ = 0x3f800000;
        auVar322._0_8_ = 0x3f8000003f800000;
        auVar322._12_4_ = 0x3f800000;
        auVar322._16_4_ = 0x3f800000;
        auVar322._20_4_ = 0x3f800000;
        auVar322._24_4_ = 0x3f800000;
        auVar322._28_4_ = 0x3f800000;
        auVar194 = vsubps_avx(auVar322,auVar59);
        fVar301 = auVar194._0_4_ * fVar301 + fVar301;
        fVar254 = auVar194._4_4_ * fVar254 + fVar254;
        fVar256 = auVar194._8_4_ * fVar256 + fVar256;
        fVar275 = auVar194._12_4_ * fVar275 + fVar275;
        fVar291 = auVar194._16_4_ * fVar291 + fVar291;
        fVar325 = auVar194._20_4_ * fVar325 + fVar325;
        fVar314 = auVar194._24_4_ * fVar314 + fVar314;
        auVar60._4_4_ =
             (auVar18._4_4_ * fVar289 + auVar26._4_4_ * fVar285 + auVar32._4_4_ * fVar151) * fVar254
        ;
        auVar60._0_4_ =
             (auVar18._0_4_ * fVar252 + auVar26._0_4_ * fVar246 + auVar32._0_4_ * fVar150) * fVar301
        ;
        auVar60._8_4_ =
             (auVar18._8_4_ * fVar316 + auVar26._8_4_ * fVar302 + auVar32._8_4_ * fVar129) * fVar256
        ;
        auVar60._12_4_ =
             (auVar18._12_4_ * fVar313 + auVar26._12_4_ * fVar266 + auVar32._12_4_ * fVar145) *
             fVar275;
        auVar60._16_4_ =
             (auVar18._16_4_ * fVar267 + auVar26._16_4_ * fVar265 + auVar32._16_4_ * fVar223) *
             fVar291;
        auVar60._20_4_ =
             (auVar18._20_4_ * fVar204 + auVar26._20_4_ * fVar273 + auVar32._20_4_ * fVar200) *
             fVar325;
        auVar60._24_4_ =
             (auVar18._24_4_ * fVar147 + auVar26._24_4_ * fVar146 + auVar32._24_4_ * fVar201) *
             fVar314;
        auVar60._28_4_ = auVar161._28_4_ + auVar19._28_4_ + auVar27._28_4_;
        auVar177 = vpermilps_avx(ZEXT416(local_7c0),0);
        auVar196._16_16_ = auVar177;
        auVar196._0_16_ = auVar177;
        auVar161 = vcmpps_avx(auVar196,auVar60,2);
        uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar228._4_4_ = uVar126;
        auVar228._0_4_ = uVar126;
        auVar228._8_4_ = uVar126;
        auVar228._12_4_ = uVar126;
        auVar228._16_4_ = uVar126;
        auVar228._20_4_ = uVar126;
        auVar228._24_4_ = uVar126;
        auVar228._28_4_ = uVar126;
        auVar18 = vcmpps_avx(auVar60,auVar228,2);
        auVar161 = vandps_avx(auVar18,auVar161);
        auVar177 = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
        auVar227 = vpand_avx(auVar227,auVar177);
        auVar177 = vpmovsxwd_avx(auVar227);
        auVar213 = vpshufd_avx(auVar227,0xee);
        auVar213 = vpmovsxwd_avx(auVar213);
        auVar195._16_16_ = auVar213;
        auVar195._0_16_ = auVar177;
        if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar195 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar195 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar195 >> 0x7f,0) == '\0') &&
              (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar213 >> 0x3f,0) == '\0') &&
            (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar213[0xf]) goto LAB_008e2306;
        auVar161 = vcmpps_avx(ZEXT832(0) << 0x20,auVar251,4);
        auVar177 = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
        auVar227 = vpand_avx(auVar227,auVar177);
        auVar177 = vpmovsxwd_avx(auVar227);
        auVar227 = vpunpckhwd_avx(auVar227,auVar227);
        auVar198 = ZEXT1664(auVar227);
        auVar244._16_16_ = auVar227;
        auVar244._0_16_ = auVar177;
        auVar230._8_8_ = uStack_598;
        auVar230._0_8_ = local_5a0;
        auVar230._16_8_ = uStack_590;
        auVar230._24_8_ = uStack_588;
        auVar164 = ZEXT3264(local_5e0);
        if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar244 >> 0x7f,0) != '\0') ||
              (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar227 >> 0x3f,0) != '\0') ||
            (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar227[0xf] < '\0') {
          auVar197._0_4_ = fVar301 * auVar158._0_4_;
          auVar197._4_4_ = fVar254 * auVar158._4_4_;
          auVar197._8_4_ = fVar256 * auVar158._8_4_;
          auVar197._12_4_ = fVar275 * auVar158._12_4_;
          auVar197._16_4_ = fVar291 * auVar158._16_4_;
          auVar197._20_4_ = fVar325 * auVar158._20_4_;
          auVar197._24_4_ = fVar314 * auVar158._24_4_;
          auVar197._28_4_ = 0;
          auVar61._4_4_ = auVar217._4_4_ * fVar254;
          auVar61._0_4_ = auVar217._0_4_ * fVar301;
          auVar61._8_4_ = auVar217._8_4_ * fVar256;
          auVar61._12_4_ = auVar217._12_4_ * fVar275;
          auVar61._16_4_ = auVar217._16_4_ * fVar291;
          auVar61._20_4_ = auVar217._20_4_ * fVar325;
          auVar61._24_4_ = auVar217._24_4_ * fVar314;
          auVar61._28_4_ = auVar194._28_4_ + auVar25._28_4_;
          auVar229._8_4_ = 0x3f800000;
          auVar229._0_8_ = 0x3f8000003f800000;
          auVar229._12_4_ = 0x3f800000;
          auVar229._16_4_ = 0x3f800000;
          auVar229._20_4_ = 0x3f800000;
          auVar229._24_4_ = 0x3f800000;
          auVar229._28_4_ = 0x3f800000;
          auVar161 = vsubps_avx(auVar229,auVar197);
          local_600 = vblendvps_avx(auVar161,auVar197,auVar250);
          auVar161 = vsubps_avx(auVar229,auVar61);
          auVar198 = ZEXT3264(auVar161);
          _local_4e0 = vblendvps_avx(auVar161,auVar61,auVar250);
          auVar164 = ZEXT3264(auVar60);
          auVar230 = auVar244;
        }
      }
      local_5e0 = auVar164._0_32_;
      if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar230 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar230 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar230 >> 0x7f,0) == '\0') &&
            (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar230 >> 0xbf,0) == '\0') &&
          (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar230[0x1f]) {
        uVar124 = 0;
      }
      else {
        auVar161 = vsubps_avx(local_7a0._0_32_,auVar135);
        fVar246 = auVar135._0_4_ + auVar161._0_4_ * local_600._0_4_;
        fVar252 = auVar135._4_4_ + auVar161._4_4_ * local_600._4_4_;
        fVar254 = auVar135._8_4_ + auVar161._8_4_ * local_600._8_4_;
        fVar256 = auVar135._12_4_ + auVar161._12_4_ * local_600._12_4_;
        fVar275 = auVar135._16_4_ + auVar161._16_4_ * local_600._16_4_;
        fVar285 = auVar135._20_4_ + auVar161._20_4_ * local_600._20_4_;
        fVar289 = auVar135._24_4_ + auVar161._24_4_ * local_600._24_4_;
        fVar291 = auVar161._28_4_ + 0.0;
        fVar301 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar62._4_4_ = (fVar252 + fVar252) * fVar301;
        auVar62._0_4_ = (fVar246 + fVar246) * fVar301;
        auVar62._8_4_ = (fVar254 + fVar254) * fVar301;
        auVar62._12_4_ = (fVar256 + fVar256) * fVar301;
        auVar62._16_4_ = (fVar275 + fVar275) * fVar301;
        auVar62._20_4_ = (fVar285 + fVar285) * fVar301;
        auVar62._24_4_ = (fVar289 + fVar289) * fVar301;
        auVar62._28_4_ = fVar291 + fVar291;
        auVar161 = vcmpps_avx(local_5e0,auVar62,6);
        auVar18 = auVar230 & auVar161;
        if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar18 >> 0x7f,0) != '\0') ||
              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0xbf,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar18[0x1f] < '\0') {
          local_360 = vandps_avx(auVar161,auVar230);
          local_400._0_4_ = (float)local_4e0._0_4_ + (float)local_4e0._0_4_ + -1.0;
          local_400._4_4_ = (float)local_4e0._4_4_ + (float)local_4e0._4_4_ + -1.0;
          fStack_3f8 = (float)uStack_4d8 + (float)uStack_4d8 + -1.0;
          fStack_3f4 = uStack_4d8._4_4_ + uStack_4d8._4_4_ + -1.0;
          fStack_3f0 = (float)uStack_4d0 + (float)uStack_4d0 + -1.0;
          fStack_3ec = uStack_4d0._4_4_ + uStack_4d0._4_4_ + -1.0;
          fStack_3e8 = (float)uStack_4c8 + (float)uStack_4c8 + -1.0;
          fStack_3e4 = uStack_4c8._4_4_ + uStack_4c8._4_4_ + -1.0;
          local_3c0 = 0;
          uStack_3a8 = uStack_758;
          uStack_398 = uStack_768;
          uStack_388 = uStack_688;
          uStack_378 = uStack_698;
          local_4e0._4_4_ = local_400._4_4_;
          local_4e0._0_4_ = local_400._0_4_;
          uStack_4d8._0_4_ = fStack_3f8;
          uStack_4d8._4_4_ = fStack_3f4;
          uStack_4d0._0_4_ = fStack_3f0;
          uStack_4d0._4_4_ = fStack_3ec;
          auVar156 = _local_4e0;
          uStack_4c8._0_4_ = fStack_3e8;
          uStack_4c8._4_4_ = fStack_3e4;
          auVar161 = _local_4e0;
          if ((pGVar125->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar124 = CONCAT71((int7)(uVar124 >> 8),1),
               pGVar125->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar179._0_4_ = 1.0 / auVar212._0_4_;
              auVar179._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar227 = vshufps_avx(auVar179,auVar179,0);
              local_340[0] = auVar227._0_4_ * (local_600._0_4_ + 0.0);
              local_340[1] = auVar227._4_4_ * (local_600._4_4_ + 1.0);
              local_340[2] = auVar227._8_4_ * (local_600._8_4_ + 2.0);
              local_340[3] = auVar227._12_4_ * (local_600._12_4_ + 3.0);
              fStack_330 = auVar227._0_4_ * (local_600._16_4_ + 4.0);
              fStack_32c = auVar227._4_4_ * (local_600._20_4_ + 5.0);
              fStack_328 = auVar227._8_4_ * (local_600._24_4_ + 6.0);
              fStack_324 = local_600._28_4_ + 7.0;
              uStack_4d0 = auVar156._16_8_;
              uStack_4c8 = auVar161._24_8_;
              local_320 = local_4e0;
              uStack_318 = uStack_4d8;
              uStack_310 = uStack_4d0;
              uStack_308 = uStack_4c8;
              local_300 = local_5e0;
              uVar126 = vmovmskps_avx(local_360);
              uVar124 = CONCAT44((int)(uVar124 >> 0x20),uVar126);
              uVar122 = 0;
              if (uVar124 != 0) {
                for (; (uVar124 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                }
              }
              auVar227 = vshufps_avx(ZEXT416(uVar119),ZEXT416(uVar119),0);
              local_620._16_16_ = auVar227;
              local_620._0_16_ = auVar227;
              auVar227 = vpermilps_avx(ZEXT416(uVar10),0);
              register0x00001210 = auVar227;
              _local_700 = auVar227;
              auVar18 = vcmpps_avx(local_600,local_600,0xf);
              auVar233 = ZEXT3264(auVar18);
              _local_4e0 = auVar161;
              local_420 = local_600;
              local_3e0 = local_5e0;
              local_3bc = uVar11;
              local_3b0 = local_760;
              local_3a0 = local_770;
              local_390 = local_690;
              local_380 = local_6a0;
              while( true ) {
                if (uVar124 == 0) break;
                uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_200 = local_340[uVar122];
                local_1e0 = *(undefined4 *)((long)&local_320 + uVar122 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar122 * 4);
                fVar246 = 1.0 - local_200;
                fVar301 = local_200 * fVar246 * 4.0;
                auVar227 = ZEXT416((uint)(local_200 * local_200 * 0.5));
                auVar227 = vshufps_avx(auVar227,auVar227,0);
                auVar177 = ZEXT416((uint)((fVar246 * fVar246 + fVar301) * 0.5));
                auVar177 = vshufps_avx(auVar177,auVar177,0);
                auVar213 = ZEXT416((uint)((-local_200 * local_200 - fVar301) * 0.5));
                auVar213 = vshufps_avx(auVar213,auVar213,0);
                local_730.context = context->user;
                auVar193 = ZEXT416((uint)(fVar246 * -fVar246 * 0.5));
                auVar193 = vshufps_avx(auVar193,auVar193,0);
                auVar180._0_4_ =
                     auVar193._0_4_ * (float)local_760._0_4_ +
                     auVar213._0_4_ * (float)local_770._0_4_ +
                     auVar227._0_4_ * (float)local_6a0._0_4_ +
                     auVar177._0_4_ * (float)local_690._0_4_;
                auVar180._4_4_ =
                     auVar193._4_4_ * (float)local_760._4_4_ +
                     auVar213._4_4_ * (float)local_770._4_4_ +
                     auVar227._4_4_ * (float)local_6a0._4_4_ +
                     auVar177._4_4_ * (float)local_690._4_4_;
                auVar180._8_4_ =
                     auVar193._8_4_ * (float)uStack_758 +
                     auVar213._8_4_ * (float)uStack_768 +
                     auVar227._8_4_ * (float)uStack_698 + auVar177._8_4_ * (float)uStack_688;
                auVar180._12_4_ =
                     auVar193._12_4_ * uStack_758._4_4_ +
                     auVar213._12_4_ * uStack_768._4_4_ +
                     auVar227._12_4_ * uStack_698._4_4_ + auVar177._12_4_ * uStack_688._4_4_;
                local_250 = vshufps_avx(auVar180,auVar180,0);
                local_260[0] = (RTCHitN)local_250[0];
                local_260[1] = (RTCHitN)local_250[1];
                local_260[2] = (RTCHitN)local_250[2];
                local_260[3] = (RTCHitN)local_250[3];
                local_260[4] = (RTCHitN)local_250[4];
                local_260[5] = (RTCHitN)local_250[5];
                local_260[6] = (RTCHitN)local_250[6];
                local_260[7] = (RTCHitN)local_250[7];
                local_260[8] = (RTCHitN)local_250[8];
                local_260[9] = (RTCHitN)local_250[9];
                local_260[10] = (RTCHitN)local_250[10];
                local_260[0xb] = (RTCHitN)local_250[0xb];
                local_260[0xc] = (RTCHitN)local_250[0xc];
                local_260[0xd] = (RTCHitN)local_250[0xd];
                local_260[0xe] = (RTCHitN)local_250[0xe];
                local_260[0xf] = (RTCHitN)local_250[0xf];
                local_230 = vshufps_avx(auVar180,auVar180,0x55);
                local_240 = local_230;
                local_210 = vshufps_avx(auVar180,auVar180,0xaa);
                local_220 = local_210;
                fStack_1fc = local_200;
                fStack_1f8 = local_200;
                fStack_1f4 = local_200;
                fStack_1f0 = local_200;
                fStack_1ec = local_200;
                fStack_1e8 = local_200;
                fStack_1e4 = local_200;
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = local_700;
                uStack_1b8 = uStack_6f8;
                uStack_1b0 = uStack_6f0;
                uStack_1a8 = uStack_6e8;
                local_1a0 = local_620._0_8_;
                uStack_198 = local_620._8_8_;
                uStack_190 = local_620._16_8_;
                uStack_188 = local_620._24_8_;
                local_738[1] = auVar233._0_32_;
                *local_738 = auVar233._0_32_;
                local_180 = (local_730.context)->instID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = (local_730.context)->instPrimID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_820 = *local_740;
                local_810 = *local_748;
                local_730.valid = (int *)local_820;
                local_730.geometryUserPtr = pGVar125->userPtr;
                local_730.hit = local_260;
                local_730.N = 8;
                local_730.ray = (RTCRayN *)ray;
                if (pGVar125->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  local_7a0._0_8_ = uVar122;
                  auVar161 = ZEXT1632(auVar233._0_16_);
                  (*pGVar125->occlusionFilterN)(&local_730);
                  auVar164 = ZEXT3264(local_5e0);
                  auVar161 = vcmpps_avx(auVar161,auVar161,0xf);
                  auVar233 = ZEXT3264(auVar161);
                  uVar122 = local_7a0._0_8_;
                  fVar224 = (float)local_7e0._0_4_;
                  fVar234 = (float)local_7e0._4_4_;
                  fVar235 = fStack_7d8;
                  fVar236 = fStack_7d4;
                  fVar300 = fStack_7d0;
                  fVar308 = fStack_7cc;
                  fVar309 = fStack_7c8;
                }
                auVar227 = vpcmpeqd_avx(local_820,ZEXT816(0) << 0x40);
                auVar177 = vpcmpeqd_avx(local_810,ZEXT816(0) << 0x40);
                auVar198 = ZEXT1664(auVar177);
                auVar184._16_16_ = auVar177;
                auVar184._0_16_ = auVar227;
                auVar161 = auVar233._0_32_ & ~auVar184;
                if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar161 >> 0x7f,0) == '\0') &&
                      (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar161 >> 0xbf,0) == '\0') &&
                    (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar161[0x1f]) {
                  auVar143._0_4_ = auVar227._0_4_ ^ auVar233._0_4_;
                  auVar143._4_4_ = auVar227._4_4_ ^ auVar233._4_4_;
                  auVar143._8_4_ = auVar227._8_4_ ^ auVar233._8_4_;
                  auVar143._12_4_ = auVar227._12_4_ ^ auVar233._12_4_;
                  auVar143._16_4_ = auVar177._0_4_ ^ auVar233._16_4_;
                  auVar143._20_4_ = auVar177._4_4_ ^ auVar233._20_4_;
                  auVar143._24_4_ = auVar177._8_4_ ^ auVar233._24_4_;
                  auVar143._28_4_ = auVar177._12_4_ ^ auVar233._28_4_;
                }
                else {
                  p_Var14 = context->args->filter;
                  if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar125->field_8).field_0x2 & 0x40) != 0)))) {
                    local_7a0._0_8_ = uVar122;
                    auVar198 = ZEXT1664(auVar177);
                    auVar161 = ZEXT1632(auVar233._0_16_);
                    (*p_Var14)(&local_730);
                    auVar164 = ZEXT3264(local_5e0);
                    auVar161 = vcmpps_avx(auVar161,auVar161,0xf);
                    auVar233 = ZEXT3264(auVar161);
                    uVar122 = local_7a0._0_8_;
                    fVar224 = (float)local_7e0._0_4_;
                    fVar234 = (float)local_7e0._4_4_;
                    fVar235 = fStack_7d8;
                    fVar236 = fStack_7d4;
                    fVar300 = fStack_7d0;
                    fVar308 = fStack_7cc;
                    fVar309 = fStack_7c8;
                  }
                  auVar227 = vpcmpeqd_avx(local_820,ZEXT816(0) << 0x40);
                  auVar177 = vpcmpeqd_avx(local_810,ZEXT816(0) << 0x40);
                  auVar163._16_16_ = auVar177;
                  auVar163._0_16_ = auVar227;
                  auVar143._0_4_ = auVar227._0_4_ ^ auVar233._0_4_;
                  auVar143._4_4_ = auVar227._4_4_ ^ auVar233._4_4_;
                  auVar143._8_4_ = auVar227._8_4_ ^ auVar233._8_4_;
                  auVar143._12_4_ = auVar227._12_4_ ^ auVar233._12_4_;
                  auVar143._16_4_ = auVar177._0_4_ ^ auVar233._16_4_;
                  auVar143._20_4_ = auVar177._4_4_ ^ auVar233._20_4_;
                  auVar143._24_4_ = auVar177._8_4_ ^ auVar233._24_4_;
                  auVar143._28_4_ = auVar177._12_4_ ^ auVar233._28_4_;
                  auVar185._8_4_ = 0xff800000;
                  auVar185._0_8_ = 0xff800000ff800000;
                  auVar185._12_4_ = 0xff800000;
                  auVar185._16_4_ = 0xff800000;
                  auVar185._20_4_ = 0xff800000;
                  auVar185._24_4_ = 0xff800000;
                  auVar185._28_4_ = 0xff800000;
                  auVar161 = vblendvps_avx(auVar185,*(undefined1 (*) [32])(local_730.ray + 0x100),
                                           auVar163);
                  *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar161;
                }
                if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar143 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar143 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar143 >> 0x7f,0) != '\0') ||
                      (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar143 >> 0xbf,0) != '\0') ||
                    (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar143[0x1f] < '\0') {
                  uVar124 = CONCAT71((int7)(uVar124 >> 8),1);
                  local_5e0 = auVar164._0_32_;
                  goto LAB_008e13e0;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar126;
                uVar124 = uVar124 ^ 1L << (uVar122 & 0x3f);
                uVar122 = 0;
                if (uVar124 != 0) {
                  for (; (uVar124 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                  }
                }
              }
              uVar124 = 0;
              local_5e0 = auVar164._0_32_;
            }
            goto LAB_008e13e0;
          }
        }
        uVar124 = 0;
      }
LAB_008e13e0:
      auVar227 = local_800._0_16_;
    }
    auVar233 = ZEXT3264(auVar214);
    auVar164 = ZEXT1664(auVar227);
    if (8 < (int)uVar11) {
      _local_680 = vpshufd_avx(ZEXT416(uVar11),0);
      auVar227 = vshufps_avx(auVar227,auVar227,0);
      local_4c0._16_16_ = auVar227;
      local_4c0._0_16_ = auVar227;
      auVar108._4_4_ = uStack_7bc;
      auVar108._0_4_ = local_7c0;
      auVar108._8_4_ = fStack_7b8;
      auVar108._12_4_ = fStack_7b4;
      auVar227 = vpermilps_avx(auVar108,0);
      local_100._16_16_ = auVar227;
      local_100._0_16_ = auVar227;
      auVar134._0_4_ = 1.0 / (float)local_540._0_4_;
      auVar134._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar227 = vshufps_avx(auVar134,auVar134,0);
      register0x00001210 = auVar227;
      _local_140 = auVar227;
      auVar227 = vshufps_avx(ZEXT416(uVar119),ZEXT416(uVar119),0);
      local_540._16_16_ = auVar227;
      local_540._0_16_ = auVar227;
      auVar227 = vpermilps_avx(local_6e0._0_16_,0);
      local_120._16_16_ = auVar227;
      local_120._0_16_ = auVar227;
      for (lVar128 = 8; lVar128 < (int)uVar11; lVar128 = lVar128 + 8) {
        pauVar7 = (undefined1 (*) [28])(bspline_basis0 + lVar128 * 4 + lVar127);
        fVar301 = *(float *)*pauVar7;
        fVar246 = *(float *)(*pauVar7 + 4);
        fVar252 = *(float *)(*pauVar7 + 8);
        fVar254 = *(float *)(*pauVar7 + 0xc);
        fVar256 = *(float *)(*pauVar7 + 0x10);
        fVar275 = *(float *)(*pauVar7 + 0x14);
        fVar285 = *(float *)(*pauVar7 + 0x18);
        auVar117 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar127 + 0x21fffac + lVar128 * 4);
        fVar289 = *(float *)*pauVar7;
        fVar291 = *(float *)(*pauVar7 + 4);
        fVar325 = *(float *)(*pauVar7 + 8);
        fVar314 = *(float *)(*pauVar7 + 0xc);
        fVar302 = *(float *)(*pauVar7 + 0x10);
        fVar316 = *(float *)(*pauVar7 + 0x14);
        fVar310 = *(float *)(*pauVar7 + 0x18);
        auVar116 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar127 + 0x2200430 + lVar128 * 4);
        fVar312 = *(float *)*pauVar7;
        fVar199 = *(float *)(*pauVar7 + 4);
        fVar266 = *(float *)(*pauVar7 + 8);
        fVar313 = *(float *)(*pauVar7 + 0xc);
        fVar315 = *(float *)(*pauVar7 + 0x10);
        fVar317 = *(float *)(*pauVar7 + 0x14);
        fVar268 = *(float *)(*pauVar7 + 0x18);
        auVar115 = *pauVar7;
        pfVar1 = (float *)(lVar127 + 0x22008b4 + lVar128 * 4);
        fVar265 = *pfVar1;
        fVar267 = pfVar1[1];
        fVar202 = pfVar1[2];
        fVar271 = pfVar1[3];
        fVar270 = pfVar1[4];
        fVar273 = pfVar1[5];
        fVar204 = pfVar1[6];
        fVar170 = auVar198._28_4_;
        fStack_7a4 = fVar170 + fVar170 + fStack_504;
        fVar223 = fVar170 + fVar170 + pfVar1[7];
        fVar200 = auVar233._0_4_;
        fVar201 = auVar233._4_4_;
        fVar203 = auVar233._8_4_;
        fVar274 = auVar233._12_4_;
        fVar237 = auVar233._16_4_;
        fVar238 = auVar233._20_4_;
        fVar239 = auVar233._24_4_;
        local_800._0_4_ =
             fVar200 * fVar301 +
             fVar289 * (float)local_460._0_4_ + fVar153 * fVar312 + (float)local_520._0_4_ * fVar265
        ;
        local_800._4_4_ =
             fVar201 * fVar246 +
             fVar291 * (float)local_460._4_4_ + fVar166 * fVar199 + (float)local_520._4_4_ * fVar267
        ;
        local_800._8_4_ =
             fVar203 * fVar252 + fVar325 * fStack_458 + fVar168 * fVar266 + fStack_518 * fVar202;
        local_800._12_4_ =
             fVar274 * fVar254 + fVar314 * fStack_454 + fVar169 * fVar313 + fStack_514 * fVar271;
        local_800._16_4_ =
             fVar237 * fVar256 + fVar302 * fStack_450 + fVar153 * fVar315 + fStack_510 * fVar270;
        local_800._20_4_ =
             fVar238 * fVar275 + fVar316 * fStack_44c + fVar166 * fVar317 + fStack_50c * fVar273;
        local_800._24_4_ =
             fVar239 * fVar285 + fVar310 * fStack_448 + fVar168 * fVar268 + fStack_508 * fVar204;
        local_800._28_4_ = fVar170 + pfVar1[7] + fStack_7a4;
        auVar263._0_4_ =
             fVar301 * (float)local_4a0._0_4_ +
             fVar224 * fVar289 + fVar171 * fVar312 + fVar326 * fVar265;
        auVar263._4_4_ =
             fVar246 * (float)local_4a0._4_4_ +
             fVar234 * fVar291 + fVar186 * fVar199 + fVar331 * fVar267;
        auVar263._8_4_ =
             fVar252 * fStack_498 + fVar235 * fVar325 + fVar187 * fVar266 + fVar332 * fVar202;
        auVar263._12_4_ =
             fVar254 * fStack_494 + fVar236 * fVar314 + fVar188 * fVar313 + fVar333 * fVar271;
        auVar263._16_4_ =
             fVar256 * fStack_490 + fVar300 * fVar302 + fVar171 * fVar315 + fVar326 * fVar270;
        auVar263._20_4_ =
             fVar275 * fStack_48c + fVar308 * fVar316 + fVar186 * fVar317 + fVar331 * fVar273;
        auVar263._24_4_ =
             fVar285 * fStack_488 + fVar309 * fVar310 + fVar187 * fVar268 + fVar332 * fVar204;
        auVar263._28_4_ = fStack_7a4 + fVar170 + fVar170 + auVar164._28_4_;
        fVar129 = (float)local_c0._0_4_ * fVar301 +
                  fVar289 * (float)local_280._0_4_ +
                  (float)local_80._0_4_ * fVar312 + (float)local_a0._0_4_ * fVar265;
        fVar145 = (float)local_c0._4_4_ * fVar246 +
                  fVar291 * (float)local_280._4_4_ +
                  (float)local_80._4_4_ * fVar199 + (float)local_a0._4_4_ * fVar267;
        fStack_7b8 = fStack_b8 * fVar252 +
                     fVar325 * fStack_278 + fStack_78 * fVar266 + fStack_98 * fVar202;
        fStack_7b4 = fStack_b4 * fVar254 +
                     fVar314 * fStack_274 + fStack_74 * fVar313 + fStack_94 * fVar271;
        fStack_7b0 = fStack_b0 * fVar256 +
                     fVar302 * fStack_270 + fStack_70 * fVar315 + fStack_90 * fVar270;
        fStack_7ac = fStack_ac * fVar275 +
                     fVar316 * fStack_26c + fStack_6c * fVar317 + fStack_8c * fVar273;
        fStack_7a8 = fStack_a8 * fVar285 +
                     fVar310 * fStack_268 + fStack_68 * fVar268 + fStack_88 * fVar204;
        fStack_7a4 = fStack_7a4 + fVar223;
        pfVar1 = (float *)(bspline_basis1 + lVar128 * 4 + lVar127);
        fVar275 = *pfVar1;
        fVar285 = pfVar1[1];
        fVar289 = pfVar1[2];
        fVar291 = pfVar1[3];
        fVar325 = pfVar1[4];
        fVar314 = pfVar1[5];
        fVar302 = pfVar1[6];
        pfVar2 = (float *)(lVar127 + 0x22023cc + lVar128 * 4);
        fVar316 = *pfVar2;
        fVar310 = pfVar2[1];
        fVar312 = pfVar2[2];
        fVar199 = pfVar2[3];
        fVar266 = pfVar2[4];
        fVar313 = pfVar2[5];
        fVar315 = pfVar2[6];
        pfVar3 = (float *)(lVar127 + 0x2202850 + lVar128 * 4);
        fVar317 = *pfVar3;
        fVar268 = pfVar3[1];
        fVar170 = pfVar3[2];
        fVar296 = pfVar3[3];
        fVar144 = pfVar3[4];
        fVar146 = pfVar3[5];
        fVar147 = pfVar3[6];
        pauVar7 = (undefined1 (*) [28])(lVar127 + 0x2202cd4 + lVar128 * 4);
        fVar246 = *(float *)*pauVar7;
        fVar252 = *(float *)(*pauVar7 + 4);
        fVar254 = *(float *)(*pauVar7 + 8);
        fVar256 = *(float *)(*pauVar7 + 0xc);
        fVar148 = *(float *)(*pauVar7 + 0x10);
        fVar149 = *(float *)(*pauVar7 + 0x14);
        fVar150 = *(float *)(*pauVar7 + 0x18);
        auVar118 = *pauVar7;
        fVar151 = *(float *)pauVar7[1];
        fVar301 = auVar233._28_4_;
        fVar223 = fVar151 + fVar151 + fVar223;
        local_6e0._0_4_ =
             fVar200 * fVar275 +
             (float)local_460._0_4_ * fVar316 + fVar153 * fVar317 + (float)local_520._0_4_ * fVar246
        ;
        local_6e0._4_4_ =
             fVar201 * fVar285 +
             (float)local_460._4_4_ * fVar310 + fVar166 * fVar268 + (float)local_520._4_4_ * fVar252
        ;
        local_6e0._8_4_ =
             fVar203 * fVar289 + fStack_458 * fVar312 + fVar168 * fVar170 + fStack_518 * fVar254;
        local_6e0._12_4_ =
             fVar274 * fVar291 + fStack_454 * fVar199 + fVar169 * fVar296 + fStack_514 * fVar256;
        local_6e0._16_4_ =
             fVar237 * fVar325 + fStack_450 * fVar266 + fVar153 * fVar144 + fStack_510 * fVar148;
        local_6e0._20_4_ =
             fVar238 * fVar314 + fStack_44c * fVar313 + fVar166 * fVar146 + fStack_50c * fVar149;
        local_6e0._24_4_ =
             fVar239 * fVar302 + fStack_448 * fVar315 + fVar168 * fVar147 + fStack_508 * fVar150;
        local_6e0._28_4_ = fVar151 + fStack_84 + fVar223;
        auVar231._0_4_ =
             (float)local_4a0._0_4_ * fVar275 +
             fVar224 * fVar316 + fVar171 * fVar317 + fVar326 * fVar246;
        auVar231._4_4_ =
             (float)local_4a0._4_4_ * fVar285 +
             fVar234 * fVar310 + fVar186 * fVar268 + fVar331 * fVar252;
        auVar231._8_4_ =
             fStack_498 * fVar289 + fVar235 * fVar312 + fVar187 * fVar170 + fVar332 * fVar254;
        auVar231._12_4_ =
             fStack_494 * fVar291 + fVar236 * fVar199 + fVar188 * fVar296 + fVar333 * fVar256;
        auVar231._16_4_ =
             fStack_490 * fVar325 + fVar300 * fVar266 + fVar171 * fVar144 + fVar326 * fVar148;
        auVar231._20_4_ =
             fStack_48c * fVar314 + fVar308 * fVar313 + fVar186 * fVar146 + fVar331 * fVar149;
        auVar231._24_4_ =
             fStack_488 * fVar302 + fVar309 * fVar315 + fVar187 * fVar147 + fVar332 * fVar150;
        auVar231._28_4_ = fVar223 + fVar151 + fVar151 + fVar301;
        auVar328._0_4_ =
             fVar316 * (float)local_280._0_4_ +
             (float)local_80._0_4_ * fVar317 + (float)local_a0._0_4_ * fVar246 +
             (float)local_c0._0_4_ * fVar275;
        auVar328._4_4_ =
             fVar310 * (float)local_280._4_4_ +
             (float)local_80._4_4_ * fVar268 + (float)local_a0._4_4_ * fVar252 +
             (float)local_c0._4_4_ * fVar285;
        auVar328._8_4_ =
             fVar312 * fStack_278 + fStack_78 * fVar170 + fStack_98 * fVar254 + fStack_b8 * fVar289;
        auVar328._12_4_ =
             fVar199 * fStack_274 + fStack_74 * fVar296 + fStack_94 * fVar256 + fStack_b4 * fVar291;
        auVar328._16_4_ =
             fVar266 * fStack_270 + fStack_70 * fVar144 + fStack_90 * fVar148 + fStack_b0 * fVar325;
        auVar328._20_4_ =
             fVar313 * fStack_26c + fStack_6c * fVar146 + fStack_8c * fVar149 + fStack_ac * fVar314;
        auVar328._24_4_ =
             fVar315 * fStack_268 + fStack_68 * fVar147 + fStack_88 * fVar150 + fStack_a8 * fVar302;
        auVar328._28_4_ = fVar151 + fVar151 + fStack_84 + fVar223;
        auVar18 = vsubps_avx(local_6e0,local_800);
        auVar27 = vsubps_avx(auVar231,auVar263);
        fVar300 = auVar18._0_4_;
        fVar308 = auVar18._4_4_;
        auVar63._4_4_ = auVar263._4_4_ * fVar308;
        auVar63._0_4_ = auVar263._0_4_ * fVar300;
        fVar309 = auVar18._8_4_;
        auVar63._8_4_ = auVar263._8_4_ * fVar309;
        fVar246 = auVar18._12_4_;
        auVar63._12_4_ = auVar263._12_4_ * fVar246;
        fVar252 = auVar18._16_4_;
        auVar63._16_4_ = auVar263._16_4_ * fVar252;
        fVar254 = auVar18._20_4_;
        auVar63._20_4_ = auVar263._20_4_ * fVar254;
        fVar256 = auVar18._24_4_;
        auVar63._24_4_ = auVar263._24_4_ * fVar256;
        auVar63._28_4_ = fVar223;
        fVar148 = auVar27._0_4_;
        fVar149 = auVar27._4_4_;
        auVar64._4_4_ = fVar149 * local_800._4_4_;
        auVar64._0_4_ = fVar148 * (float)local_800._0_4_;
        fVar224 = auVar27._8_4_;
        auVar64._8_4_ = fVar224 * local_800._8_4_;
        fVar234 = auVar27._12_4_;
        auVar64._12_4_ = fVar234 * local_800._12_4_;
        fVar235 = auVar27._16_4_;
        auVar64._16_4_ = fVar235 * local_800._16_4_;
        fVar236 = auVar27._20_4_;
        auVar64._20_4_ = fVar236 * local_800._20_4_;
        fVar150 = auVar27._24_4_;
        auVar64._24_4_ = fVar150 * local_800._24_4_;
        auVar64._28_4_ = auVar231._28_4_;
        auVar25 = vsubps_avx(auVar63,auVar64);
        auVar109._4_4_ = fVar145;
        auVar109._0_4_ = fVar129;
        auVar109._8_4_ = fStack_7b8;
        auVar109._12_4_ = fStack_7b4;
        auVar109._16_4_ = fStack_7b0;
        auVar109._20_4_ = fStack_7ac;
        auVar109._24_4_ = fStack_7a8;
        auVar109._28_4_ = fStack_7a4;
        auVar164 = ZEXT3264(auVar109);
        auVar161 = vmaxps_avx(auVar109,auVar328);
        auVar65._4_4_ = auVar161._4_4_ * auVar161._4_4_ * (fVar308 * fVar308 + fVar149 * fVar149);
        auVar65._0_4_ = auVar161._0_4_ * auVar161._0_4_ * (fVar300 * fVar300 + fVar148 * fVar148);
        auVar65._8_4_ = auVar161._8_4_ * auVar161._8_4_ * (fVar309 * fVar309 + fVar224 * fVar224);
        auVar65._12_4_ = auVar161._12_4_ * auVar161._12_4_ * (fVar246 * fVar246 + fVar234 * fVar234)
        ;
        auVar65._16_4_ = auVar161._16_4_ * auVar161._16_4_ * (fVar252 * fVar252 + fVar235 * fVar235)
        ;
        auVar65._20_4_ = auVar161._20_4_ * auVar161._20_4_ * (fVar254 * fVar254 + fVar236 * fVar236)
        ;
        auVar65._24_4_ = auVar161._24_4_ * auVar161._24_4_ * (fVar256 * fVar256 + fVar150 * fVar150)
        ;
        auVar65._28_4_ = local_6e0._28_4_ + auVar231._28_4_;
        auVar66._4_4_ = auVar25._4_4_ * auVar25._4_4_;
        auVar66._0_4_ = auVar25._0_4_ * auVar25._0_4_;
        auVar66._8_4_ = auVar25._8_4_ * auVar25._8_4_;
        auVar66._12_4_ = auVar25._12_4_ * auVar25._12_4_;
        auVar66._16_4_ = auVar25._16_4_ * auVar25._16_4_;
        auVar66._20_4_ = auVar25._20_4_ * auVar25._20_4_;
        auVar66._24_4_ = auVar25._24_4_ * auVar25._24_4_;
        auVar66._28_4_ = auVar25._28_4_;
        local_620 = vcmpps_avx(auVar66,auVar65,2);
        auVar198 = ZEXT3264(local_620);
        local_3c0 = (uint)lVar128;
        auVar177 = vpshufd_avx(ZEXT416(local_3c0),0);
        auVar227 = vpor_avx(auVar177,_DAT_01f4ad30);
        auVar177 = vpor_avx(auVar177,_DAT_01f7afa0);
        auVar227 = vpcmpgtd_avx(_local_680,auVar227);
        auVar177 = vpcmpgtd_avx(_local_680,auVar177);
        register0x00001290 = auVar177;
        _local_560 = auVar227;
        auVar161 = _local_560 & local_620;
        fVar224 = (float)local_7e0._0_4_;
        fVar234 = (float)local_7e0._4_4_;
        fVar235 = fStack_7d8;
        fVar236 = fStack_7d4;
        fVar300 = fStack_7d0;
        fVar308 = fStack_7cc;
        fVar309 = fStack_7c8;
        if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar161 >> 0x7f,0) == '\0') &&
              (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar161 >> 0xbf,0) == '\0') &&
            (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar161[0x1f]) {
          auVar233 = ZEXT3264(auVar233._0_32_);
        }
        else {
          local_6c0._0_4_ = auVar118._0_4_;
          local_6c0._4_4_ = auVar118._4_4_;
          fStack_6b8 = auVar118._8_4_;
          fStack_6b4 = auVar118._12_4_;
          fStack_6b0 = auVar118._16_4_;
          fStack_6ac = auVar118._20_4_;
          fStack_6a8 = auVar118._24_4_;
          local_6c0._0_4_ =
               fVar275 * (float)local_2a0._0_4_ +
               (float)local_e0._0_4_ * fVar316 +
               fVar317 * (float)local_480._0_4_ + fVar311 * (float)local_6c0._0_4_;
          local_6c0._4_4_ =
               fVar285 * (float)local_2a0._4_4_ +
               (float)local_e0._4_4_ * fVar310 +
               fVar268 * (float)local_480._4_4_ + fVar152 * (float)local_6c0._4_4_;
          fStack_6b8 = fVar289 * fStack_298 +
                       fStack_d8 * fVar312 + fVar170 * fStack_478 + fVar165 * fStack_6b8;
          fStack_6b4 = fVar291 * fStack_294 +
                       fStack_d4 * fVar199 + fVar296 * fStack_474 + fVar167 * fStack_6b4;
          fStack_6b0 = fVar325 * fStack_290 +
                       fStack_d0 * fVar266 + fVar144 * fStack_470 + fVar311 * fStack_6b0;
          fStack_6ac = fVar314 * fStack_28c +
                       fStack_cc * fVar313 + fVar146 * fStack_46c + fVar152 * fStack_6ac;
          fStack_6a8 = fVar302 * fStack_288 +
                       fStack_c8 * fVar315 + fVar147 * fStack_468 + fVar165 * fStack_6a8;
          fStack_6a4 = pfVar1[7] + pfVar2[7] + fStack_7a4 + 0.0;
          local_700._0_4_ = auVar116._0_4_;
          local_700._4_4_ = auVar116._4_4_;
          uStack_6f8._0_4_ = auVar116._8_4_;
          uStack_6f8._4_4_ = auVar116._12_4_;
          uStack_6f0._0_4_ = auVar116._16_4_;
          uStack_6f0._4_4_ = auVar116._20_4_;
          uStack_6e8._0_4_ = auVar116._24_4_;
          local_640._0_4_ = auVar115._0_4_;
          local_640._4_4_ = auVar115._4_4_;
          fStack_638 = auVar115._8_4_;
          fStack_634 = auVar115._12_4_;
          fStack_630 = auVar115._16_4_;
          fStack_62c = auVar115._20_4_;
          fStack_628 = auVar115._24_4_;
          pfVar1 = (float *)(lVar127 + 0x2201640 + lVar128 * 4);
          fVar246 = *pfVar1;
          fVar252 = pfVar1[1];
          fVar254 = pfVar1[2];
          fVar256 = pfVar1[3];
          fVar275 = pfVar1[4];
          fVar285 = pfVar1[5];
          fVar289 = pfVar1[6];
          pfVar2 = (float *)(lVar127 + 0x2201ac4 + lVar128 * 4);
          fVar291 = *pfVar2;
          fVar325 = pfVar2[1];
          fVar314 = pfVar2[2];
          fVar302 = pfVar2[3];
          fVar316 = pfVar2[4];
          fVar310 = pfVar2[5];
          fVar312 = pfVar2[6];
          pfVar3 = (float *)(lVar127 + 0x22011bc + lVar128 * 4);
          fVar199 = *pfVar3;
          fVar266 = pfVar3[1];
          fVar313 = pfVar3[2];
          fVar315 = pfVar3[3];
          fVar317 = pfVar3[4];
          fVar268 = pfVar3[5];
          fVar170 = pfVar3[6];
          fVar151 = pfVar1[7] + pfVar2[7];
          fStack_564 = pfVar2[7] + fVar301 + 0.0;
          fVar223 = fVar301 + auVar328._28_4_ + fVar301 + 0.0;
          pfVar1 = (float *)(lVar127 + 0x2200d38 + lVar128 * 4);
          fVar296 = *pfVar1;
          fVar144 = pfVar1[1];
          fVar146 = pfVar1[2];
          fVar147 = pfVar1[3];
          fVar148 = pfVar1[4];
          fVar149 = pfVar1[5];
          fVar150 = pfVar1[6];
          local_660 = fVar296 * fVar200 +
                      (float)local_460._0_4_ * fVar199 +
                      fVar153 * fVar246 + (float)local_520._0_4_ * fVar291;
          fStack_65c = fVar144 * fVar201 +
                       (float)local_460._4_4_ * fVar266 +
                       fVar166 * fVar252 + (float)local_520._4_4_ * fVar325;
          fStack_658 = fVar146 * fVar203 +
                       fStack_458 * fVar313 + fVar168 * fVar254 + fStack_518 * fVar314;
          fStack_654 = fVar147 * fVar274 +
                       fStack_454 * fVar315 + fVar169 * fVar256 + fStack_514 * fVar302;
          fStack_650 = fVar148 * fVar237 +
                       fStack_450 * fVar317 + fVar153 * fVar275 + fStack_510 * fVar316;
          fStack_64c = fVar149 * fVar238 +
                       fStack_44c * fVar268 + fVar166 * fVar285 + fStack_50c * fVar310;
          fStack_648 = fVar150 * fVar239 +
                       fStack_448 * fVar170 + fVar168 * fVar289 + fStack_508 * fVar312;
          fStack_644 = fVar151 + fStack_564;
          local_580 = (float)local_4a0._0_4_ * fVar296 +
                      fVar171 * fVar246 + fVar291 * fVar326 + (float)local_7e0._0_4_ * fVar199;
          fStack_57c = (float)local_4a0._4_4_ * fVar144 +
                       fVar186 * fVar252 + fVar325 * fVar331 + (float)local_7e0._4_4_ * fVar266;
          fStack_578 = fStack_498 * fVar146 +
                       fVar187 * fVar254 + fVar314 * fVar332 + fStack_7d8 * fVar313;
          fStack_574 = fStack_494 * fVar147 +
                       fVar188 * fVar256 + fVar302 * fVar333 + fStack_7d4 * fVar315;
          fStack_570 = fStack_490 * fVar148 +
                       fVar171 * fVar275 + fVar316 * fVar326 + fStack_7d0 * fVar317;
          fStack_56c = fStack_48c * fVar149 +
                       fVar186 * fVar285 + fVar310 * fVar331 + fStack_7cc * fVar268;
          fStack_568 = fStack_488 * fVar150 +
                       fVar187 * fVar289 + fVar312 * fVar332 + fStack_7c8 * fVar170;
          fStack_564 = fStack_564 + fVar223;
          auVar329._0_4_ =
               fVar199 * (float)local_e0._0_4_ +
               (float)local_480._0_4_ * fVar246 + fVar311 * fVar291 +
               fVar296 * (float)local_2a0._0_4_;
          auVar329._4_4_ =
               fVar266 * (float)local_e0._4_4_ +
               (float)local_480._4_4_ * fVar252 + fVar152 * fVar325 +
               fVar144 * (float)local_2a0._4_4_;
          auVar329._8_4_ =
               fVar313 * fStack_d8 + fStack_478 * fVar254 + fVar165 * fVar314 + fVar146 * fStack_298
          ;
          auVar329._12_4_ =
               fVar315 * fStack_d4 + fStack_474 * fVar256 + fVar167 * fVar302 + fVar147 * fStack_294
          ;
          auVar329._16_4_ =
               fVar317 * fStack_d0 + fStack_470 * fVar275 + fVar311 * fVar316 + fVar148 * fStack_290
          ;
          auVar329._20_4_ =
               fVar268 * fStack_cc + fStack_46c * fVar285 + fVar152 * fVar310 + fVar149 * fStack_28c
          ;
          auVar329._24_4_ =
               fVar170 * fStack_c8 + fStack_468 * fVar289 + fVar165 * fVar312 + fVar150 * fStack_288
          ;
          auVar329._28_4_ = pfVar3[7] + fVar151 + fVar223;
          pfVar1 = (float *)(lVar127 + 0x2203a60 + lVar128 * 4);
          fVar246 = *pfVar1;
          fVar252 = pfVar1[1];
          fVar254 = pfVar1[2];
          fVar256 = pfVar1[3];
          fVar275 = pfVar1[4];
          fVar285 = pfVar1[5];
          fVar289 = pfVar1[6];
          pfVar2 = (float *)(lVar127 + 0x2203ee4 + lVar128 * 4);
          fVar291 = *pfVar2;
          fVar325 = pfVar2[1];
          fVar314 = pfVar2[2];
          fVar302 = pfVar2[3];
          fVar316 = pfVar2[4];
          fVar310 = pfVar2[5];
          fVar312 = pfVar2[6];
          pfVar3 = (float *)(lVar127 + 0x22035dc + lVar128 * 4);
          fVar199 = *pfVar3;
          fVar266 = pfVar3[1];
          fVar313 = pfVar3[2];
          fVar315 = pfVar3[3];
          fVar317 = pfVar3[4];
          fVar268 = pfVar3[5];
          fVar170 = pfVar3[6];
          pfVar4 = (float *)(lVar127 + 0x2203158 + lVar128 * 4);
          fVar296 = *pfVar4;
          fVar144 = pfVar4[1];
          fVar146 = pfVar4[2];
          fVar147 = pfVar4[3];
          fVar148 = pfVar4[4];
          fVar149 = pfVar4[5];
          fVar150 = pfVar4[6];
          auVar283._0_4_ =
               fVar296 * fVar205 +
               (float)local_460._0_4_ * fVar199 +
               fVar153 * fVar246 + (float)local_520._0_4_ * fVar291;
          auVar283._4_4_ =
               fVar144 * fVar220 +
               (float)local_460._4_4_ * fVar266 +
               fVar166 * fVar252 + (float)local_520._4_4_ * fVar325;
          auVar283._8_4_ =
               fVar146 * fVar221 + fStack_458 * fVar313 + fVar168 * fVar254 + fStack_518 * fVar314;
          auVar283._12_4_ =
               fVar147 * fVar222 + fStack_454 * fVar315 + fVar169 * fVar256 + fStack_514 * fVar302;
          auVar283._16_4_ =
               fVar148 * fVar205 + fStack_450 * fVar317 + fVar153 * fVar275 + fStack_510 * fVar316;
          auVar283._20_4_ =
               fVar149 * fVar220 + fStack_44c * fVar268 + fVar166 * fVar285 + fStack_50c * fVar310;
          auVar283._24_4_ =
               fVar150 * fVar221 + fStack_448 * fVar170 + fVar168 * fVar289 + fStack_508 * fVar312;
          auVar283._28_4_ = fStack_484 + fStack_484 + fVar169 + fStack_564;
          auVar323._0_4_ =
               fVar296 * (float)local_4a0._0_4_ +
               (float)local_7e0._0_4_ * fVar199 + fVar171 * fVar246 + fVar291 * fVar326;
          auVar323._4_4_ =
               fVar144 * (float)local_4a0._4_4_ +
               (float)local_7e0._4_4_ * fVar266 + fVar186 * fVar252 + fVar325 * fVar331;
          auVar323._8_4_ =
               fVar146 * fStack_498 + fStack_7d8 * fVar313 + fVar187 * fVar254 + fVar314 * fVar332;
          auVar323._12_4_ =
               fVar147 * fStack_494 + fStack_7d4 * fVar315 + fVar188 * fVar256 + fVar302 * fVar333;
          auVar323._16_4_ =
               fVar148 * fStack_490 + fStack_7d0 * fVar317 + fVar171 * fVar275 + fVar316 * fVar326;
          auVar323._20_4_ =
               fVar149 * fStack_48c + fStack_7cc * fVar268 + fVar186 * fVar285 + fVar310 * fVar331;
          auVar323._24_4_ =
               fVar150 * fStack_488 + fStack_7c8 * fVar170 + fVar187 * fVar289 + fVar312 * fVar332;
          auVar323._28_4_ = fStack_484 + fStack_484 + fStack_504 + fVar301;
          auVar232._8_4_ = 0x7fffffff;
          auVar232._0_8_ = 0x7fffffff7fffffff;
          auVar232._12_4_ = 0x7fffffff;
          auVar232._16_4_ = 0x7fffffff;
          auVar232._20_4_ = 0x7fffffff;
          auVar232._24_4_ = 0x7fffffff;
          auVar232._28_4_ = 0x7fffffff;
          auVar112._4_4_ = fStack_65c;
          auVar112._0_4_ = local_660;
          auVar112._8_4_ = fStack_658;
          auVar112._12_4_ = fStack_654;
          auVar112._16_4_ = fStack_650;
          auVar112._20_4_ = fStack_64c;
          auVar112._24_4_ = fStack_648;
          auVar112._28_4_ = fStack_644;
          auVar161 = vandps_avx(auVar112,auVar232);
          auVar114._4_4_ = fStack_57c;
          auVar114._0_4_ = local_580;
          auVar114._8_4_ = fStack_578;
          auVar114._12_4_ = fStack_574;
          auVar114._16_4_ = fStack_570;
          auVar114._20_4_ = fStack_56c;
          auVar114._24_4_ = fStack_568;
          auVar114._28_4_ = fStack_564;
          auVar25 = vandps_avx(auVar114,auVar232);
          auVar25 = vmaxps_avx(auVar161,auVar25);
          auVar161 = vandps_avx(auVar329,auVar232);
          auVar25 = vmaxps_avx(auVar25,auVar161);
          auVar25 = vcmpps_avx(auVar25,local_4c0,1);
          auVar26 = vblendvps_avx(auVar112,auVar18,auVar25);
          auVar139._0_4_ =
               fVar296 * (float)local_2a0._0_4_ +
               fVar199 * (float)local_e0._0_4_ +
               fVar291 * fVar311 + (float)local_480._0_4_ * fVar246;
          auVar139._4_4_ =
               fVar144 * (float)local_2a0._4_4_ +
               fVar266 * (float)local_e0._4_4_ +
               fVar325 * fVar152 + (float)local_480._4_4_ * fVar252;
          auVar139._8_4_ =
               fVar146 * fStack_298 + fVar313 * fStack_d8 + fVar314 * fVar165 + fStack_478 * fVar254
          ;
          auVar139._12_4_ =
               fVar147 * fStack_294 + fVar315 * fStack_d4 + fVar302 * fVar167 + fStack_474 * fVar256
          ;
          auVar139._16_4_ =
               fVar148 * fStack_290 + fVar317 * fStack_d0 + fVar316 * fVar311 + fStack_470 * fVar275
          ;
          auVar139._20_4_ =
               fVar149 * fStack_28c + fVar268 * fStack_cc + fVar310 * fVar152 + fStack_46c * fVar285
          ;
          auVar139._24_4_ =
               fVar150 * fStack_288 + fVar170 * fStack_c8 + fVar312 * fVar165 + fStack_468 * fVar289
          ;
          auVar139._28_4_ = auVar161._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar32 = vblendvps_avx(auVar114,auVar27,auVar25);
          auVar161 = vandps_avx(auVar283,auVar232);
          auVar25 = vandps_avx(auVar323,auVar232);
          auVar19 = vmaxps_avx(auVar161,auVar25);
          auVar161 = vandps_avx(auVar139,auVar232);
          auVar161 = vmaxps_avx(auVar19,auVar161);
          local_880._0_4_ = auVar117._0_4_;
          local_880._4_4_ = auVar117._4_4_;
          fStack_878 = auVar117._8_4_;
          fStack_874 = auVar117._12_4_;
          fStack_870 = auVar117._16_4_;
          fStack_86c = auVar117._20_4_;
          fStack_868 = auVar117._24_4_;
          auVar25 = vcmpps_avx(auVar161,local_4c0,1);
          auVar161 = vblendvps_avx(auVar283,auVar18,auVar25);
          auVar140._0_4_ =
               (float)local_2a0._0_4_ * (float)local_880._0_4_ +
               (float)local_e0._0_4_ * (float)local_700._0_4_ +
               (float)local_480._0_4_ * (float)local_640._0_4_ + fVar311 * fVar265;
          auVar140._4_4_ =
               (float)local_2a0._4_4_ * (float)local_880._4_4_ +
               (float)local_e0._4_4_ * (float)local_700._4_4_ +
               (float)local_480._4_4_ * (float)local_640._4_4_ + fVar152 * fVar267;
          auVar140._8_4_ =
               fStack_298 * fStack_878 +
               fStack_d8 * (float)uStack_6f8 + fStack_478 * fStack_638 + fVar165 * fVar202;
          auVar140._12_4_ =
               fStack_294 * fStack_874 +
               fStack_d4 * uStack_6f8._4_4_ + fStack_474 * fStack_634 + fVar167 * fVar271;
          auVar140._16_4_ =
               fStack_290 * fStack_870 +
               fStack_d0 * (float)uStack_6f0 + fStack_470 * fStack_630 + fVar311 * fVar270;
          auVar140._20_4_ =
               fStack_28c * fStack_86c +
               fStack_cc * uStack_6f0._4_4_ + fStack_46c * fStack_62c + fVar152 * fVar273;
          auVar140._24_4_ =
               fStack_288 * fStack_868 +
               fStack_c8 * (float)uStack_6e8 + fStack_468 * fStack_628 + fVar165 * fVar204;
          auVar140._28_4_ = auVar19._28_4_ + fStack_6a4 + fStack_7a4 + 0.0;
          auVar18 = vblendvps_avx(auVar323,auVar27,auVar25);
          fVar150 = auVar26._0_4_;
          fVar151 = auVar26._4_4_;
          fVar223 = auVar26._8_4_;
          fVar200 = auVar26._12_4_;
          fVar201 = auVar26._16_4_;
          fVar203 = auVar26._20_4_;
          fVar274 = auVar26._24_4_;
          fVar237 = auVar26._28_4_;
          fVar312 = auVar161._0_4_;
          fVar266 = auVar161._4_4_;
          fVar315 = auVar161._8_4_;
          fVar268 = auVar161._12_4_;
          fVar267 = auVar161._16_4_;
          fVar271 = auVar161._20_4_;
          fVar273 = auVar161._24_4_;
          fVar301 = auVar32._0_4_;
          fVar252 = auVar32._4_4_;
          fVar256 = auVar32._8_4_;
          fVar285 = auVar32._12_4_;
          fVar291 = auVar32._16_4_;
          fVar314 = auVar32._20_4_;
          fVar316 = auVar32._24_4_;
          auVar299._0_4_ = fVar301 * fVar301 + fVar150 * fVar150;
          auVar299._4_4_ = fVar252 * fVar252 + fVar151 * fVar151;
          auVar299._8_4_ = fVar256 * fVar256 + fVar223 * fVar223;
          auVar299._12_4_ = fVar285 * fVar285 + fVar200 * fVar200;
          auVar299._16_4_ = fVar291 * fVar291 + fVar201 * fVar201;
          auVar299._20_4_ = fVar314 * fVar314 + fVar203 * fVar203;
          auVar299._24_4_ = fVar316 * fVar316 + fVar274 * fVar274;
          auVar299._28_4_ = fStack_444 + auVar27._28_4_;
          auVar27 = vrsqrtps_avx(auVar299);
          fVar246 = auVar27._0_4_;
          fVar254 = auVar27._4_4_;
          auVar67._4_4_ = fVar254 * 1.5;
          auVar67._0_4_ = fVar246 * 1.5;
          fVar275 = auVar27._8_4_;
          auVar67._8_4_ = fVar275 * 1.5;
          fVar289 = auVar27._12_4_;
          auVar67._12_4_ = fVar289 * 1.5;
          fVar325 = auVar27._16_4_;
          auVar67._16_4_ = fVar325 * 1.5;
          fVar302 = auVar27._20_4_;
          auVar67._20_4_ = fVar302 * 1.5;
          fVar310 = auVar27._24_4_;
          auVar67._24_4_ = fVar310 * 1.5;
          auVar67._28_4_ = auVar323._28_4_;
          auVar68._4_4_ = fVar254 * fVar254 * fVar254 * auVar299._4_4_ * 0.5;
          auVar68._0_4_ = fVar246 * fVar246 * fVar246 * auVar299._0_4_ * 0.5;
          auVar68._8_4_ = fVar275 * fVar275 * fVar275 * auVar299._8_4_ * 0.5;
          auVar68._12_4_ = fVar289 * fVar289 * fVar289 * auVar299._12_4_ * 0.5;
          auVar68._16_4_ = fVar325 * fVar325 * fVar325 * auVar299._16_4_ * 0.5;
          auVar68._20_4_ = fVar302 * fVar302 * fVar302 * auVar299._20_4_ * 0.5;
          auVar68._24_4_ = fVar310 * fVar310 * fVar310 * auVar299._24_4_ * 0.5;
          auVar68._28_4_ = auVar299._28_4_;
          auVar25 = vsubps_avx(auVar67,auVar68);
          fVar170 = auVar25._0_4_;
          fVar296 = auVar25._4_4_;
          fVar144 = auVar25._8_4_;
          fVar146 = auVar25._12_4_;
          fVar147 = auVar25._16_4_;
          fVar148 = auVar25._20_4_;
          fVar149 = auVar25._24_4_;
          fVar246 = auVar18._0_4_;
          fVar254 = auVar18._4_4_;
          fVar275 = auVar18._8_4_;
          fVar289 = auVar18._12_4_;
          fVar325 = auVar18._16_4_;
          fVar302 = auVar18._20_4_;
          fVar310 = auVar18._24_4_;
          auVar264._0_4_ = fVar246 * fVar246 + fVar312 * fVar312;
          auVar264._4_4_ = fVar254 * fVar254 + fVar266 * fVar266;
          auVar264._8_4_ = fVar275 * fVar275 + fVar315 * fVar315;
          auVar264._12_4_ = fVar289 * fVar289 + fVar268 * fVar268;
          auVar264._16_4_ = fVar325 * fVar325 + fVar267 * fVar267;
          auVar264._20_4_ = fVar302 * fVar302 + fVar271 * fVar271;
          auVar264._24_4_ = fVar310 * fVar310 + fVar273 * fVar273;
          auVar264._28_4_ = auVar27._28_4_ + auVar161._28_4_;
          auVar161 = vrsqrtps_avx(auVar264);
          fVar199 = auVar161._0_4_;
          fVar313 = auVar161._4_4_;
          auVar69._4_4_ = fVar313 * 1.5;
          auVar69._0_4_ = fVar199 * 1.5;
          fVar317 = auVar161._8_4_;
          auVar69._8_4_ = fVar317 * 1.5;
          fVar265 = auVar161._12_4_;
          auVar69._12_4_ = fVar265 * 1.5;
          fVar202 = auVar161._16_4_;
          auVar69._16_4_ = fVar202 * 1.5;
          fVar270 = auVar161._20_4_;
          auVar69._20_4_ = fVar270 * 1.5;
          fVar204 = auVar161._24_4_;
          auVar69._24_4_ = fVar204 * 1.5;
          auVar69._28_4_ = auVar323._28_4_;
          auVar70._4_4_ = fVar313 * fVar313 * fVar313 * auVar264._4_4_ * 0.5;
          auVar70._0_4_ = fVar199 * fVar199 * fVar199 * auVar264._0_4_ * 0.5;
          auVar70._8_4_ = fVar317 * fVar317 * fVar317 * auVar264._8_4_ * 0.5;
          auVar70._12_4_ = fVar265 * fVar265 * fVar265 * auVar264._12_4_ * 0.5;
          auVar70._16_4_ = fVar202 * fVar202 * fVar202 * auVar264._16_4_ * 0.5;
          auVar70._20_4_ = fVar270 * fVar270 * fVar270 * auVar264._20_4_ * 0.5;
          auVar70._24_4_ = fVar204 * fVar204 * fVar204 * auVar264._24_4_ * 0.5;
          auVar70._28_4_ = auVar264._28_4_;
          auVar18 = vsubps_avx(auVar69,auVar70);
          fVar199 = auVar18._0_4_;
          fVar313 = auVar18._4_4_;
          fVar317 = auVar18._8_4_;
          fVar265 = auVar18._12_4_;
          fVar202 = auVar18._16_4_;
          fVar270 = auVar18._20_4_;
          fVar204 = auVar18._24_4_;
          fVar301 = fVar129 * fVar170 * fVar301;
          fVar252 = fVar145 * fVar296 * fVar252;
          auVar71._4_4_ = fVar252;
          auVar71._0_4_ = fVar301;
          fVar256 = fStack_7b8 * fVar144 * fVar256;
          auVar71._8_4_ = fVar256;
          fVar285 = fStack_7b4 * fVar146 * fVar285;
          auVar71._12_4_ = fVar285;
          fVar291 = fStack_7b0 * fVar147 * fVar291;
          auVar71._16_4_ = fVar291;
          fVar314 = fStack_7ac * fVar148 * fVar314;
          auVar71._20_4_ = fVar314;
          fVar316 = fStack_7a8 * fVar149 * fVar316;
          auVar71._24_4_ = fVar316;
          auVar71._28_4_ = auVar161._28_4_;
          local_880._4_4_ = fVar252 + local_800._4_4_;
          local_880._0_4_ = fVar301 + (float)local_800._0_4_;
          fStack_878 = fVar256 + local_800._8_4_;
          fStack_874 = fVar285 + local_800._12_4_;
          fStack_870 = fVar291 + local_800._16_4_;
          fStack_86c = fVar314 + local_800._20_4_;
          fStack_868 = fVar316 + local_800._24_4_;
          fStack_864 = auVar161._28_4_ + local_800._28_4_;
          fVar301 = fVar129 * fVar170 * -fVar150;
          fVar252 = fVar145 * fVar296 * -fVar151;
          auVar72._4_4_ = fVar252;
          auVar72._0_4_ = fVar301;
          fVar256 = fStack_7b8 * fVar144 * -fVar223;
          auVar72._8_4_ = fVar256;
          fVar285 = fStack_7b4 * fVar146 * -fVar200;
          auVar72._12_4_ = fVar285;
          fVar291 = fStack_7b0 * fVar147 * -fVar201;
          auVar72._16_4_ = fVar291;
          fVar314 = fStack_7ac * fVar148 * -fVar203;
          auVar72._20_4_ = fVar314;
          fVar316 = fStack_7a8 * fVar149 * -fVar274;
          auVar72._24_4_ = fVar316;
          auVar72._28_4_ = -fVar237;
          local_640._4_4_ = auVar263._4_4_ + fVar252;
          local_640._0_4_ = auVar263._0_4_ + fVar301;
          fStack_638 = auVar263._8_4_ + fVar256;
          fStack_634 = auVar263._12_4_ + fVar285;
          fStack_630 = auVar263._16_4_ + fVar291;
          fStack_62c = auVar263._20_4_ + fVar314;
          fStack_628 = auVar263._24_4_ + fVar316;
          fStack_624 = auVar263._28_4_ + -fVar237;
          fVar301 = fVar170 * 0.0 * fVar129;
          fVar252 = fVar296 * 0.0 * fVar145;
          auVar73._4_4_ = fVar252;
          auVar73._0_4_ = fVar301;
          fVar256 = fVar144 * 0.0 * fStack_7b8;
          auVar73._8_4_ = fVar256;
          fVar285 = fVar146 * 0.0 * fStack_7b4;
          auVar73._12_4_ = fVar285;
          fVar291 = fVar147 * 0.0 * fStack_7b0;
          auVar73._16_4_ = fVar291;
          fVar314 = fVar148 * 0.0 * fStack_7ac;
          auVar73._20_4_ = fVar314;
          fVar316 = fVar149 * 0.0 * fStack_7a8;
          auVar73._24_4_ = fVar316;
          auVar73._28_4_ = fVar237;
          auVar161 = vsubps_avx(local_800,auVar71);
          auVar336._0_4_ = fVar301 + auVar140._0_4_;
          auVar336._4_4_ = fVar252 + auVar140._4_4_;
          auVar336._8_4_ = fVar256 + auVar140._8_4_;
          auVar336._12_4_ = fVar285 + auVar140._12_4_;
          auVar336._16_4_ = fVar291 + auVar140._16_4_;
          auVar336._20_4_ = fVar314 + auVar140._20_4_;
          auVar336._24_4_ = fVar316 + auVar140._24_4_;
          auVar336._28_4_ = fVar237 + auVar140._28_4_;
          fVar301 = auVar328._0_4_ * fVar199 * fVar246;
          fVar246 = auVar328._4_4_ * fVar313 * fVar254;
          auVar74._4_4_ = fVar246;
          auVar74._0_4_ = fVar301;
          fVar252 = auVar328._8_4_ * fVar317 * fVar275;
          auVar74._8_4_ = fVar252;
          fVar254 = auVar328._12_4_ * fVar265 * fVar289;
          auVar74._12_4_ = fVar254;
          fVar256 = auVar328._16_4_ * fVar202 * fVar325;
          auVar74._16_4_ = fVar256;
          fVar275 = auVar328._20_4_ * fVar270 * fVar302;
          auVar74._20_4_ = fVar275;
          fVar285 = auVar328._24_4_ * fVar204 * fVar310;
          auVar74._24_4_ = fVar285;
          auVar74._28_4_ = local_800._28_4_;
          auVar306 = vsubps_avx(auVar263,auVar72);
          auVar330._0_4_ = local_6e0._0_4_ + fVar301;
          auVar330._4_4_ = local_6e0._4_4_ + fVar246;
          auVar330._8_4_ = local_6e0._8_4_ + fVar252;
          auVar330._12_4_ = local_6e0._12_4_ + fVar254;
          auVar330._16_4_ = local_6e0._16_4_ + fVar256;
          auVar330._20_4_ = local_6e0._20_4_ + fVar275;
          auVar330._24_4_ = local_6e0._24_4_ + fVar285;
          auVar330._28_4_ = local_6e0._28_4_ + local_800._28_4_;
          fVar301 = fVar199 * -fVar312 * auVar328._0_4_;
          fVar246 = fVar313 * -fVar266 * auVar328._4_4_;
          auVar75._4_4_ = fVar246;
          auVar75._0_4_ = fVar301;
          fVar252 = fVar317 * -fVar315 * auVar328._8_4_;
          auVar75._8_4_ = fVar252;
          fVar254 = fVar265 * -fVar268 * auVar328._12_4_;
          auVar75._12_4_ = fVar254;
          fVar256 = fVar202 * -fVar267 * auVar328._16_4_;
          auVar75._16_4_ = fVar256;
          fVar275 = fVar270 * -fVar271 * auVar328._20_4_;
          auVar75._20_4_ = fVar275;
          fVar285 = fVar204 * -fVar273 * auVar328._24_4_;
          auVar75._24_4_ = fVar285;
          auVar75._28_4_ = fStack_7a4;
          auVar28 = vsubps_avx(auVar140,auVar73);
          auVar218._0_4_ = auVar231._0_4_ + fVar301;
          auVar218._4_4_ = auVar231._4_4_ + fVar246;
          auVar218._8_4_ = auVar231._8_4_ + fVar252;
          auVar218._12_4_ = auVar231._12_4_ + fVar254;
          auVar218._16_4_ = auVar231._16_4_ + fVar256;
          auVar218._20_4_ = auVar231._20_4_ + fVar275;
          auVar218._24_4_ = auVar231._24_4_ + fVar285;
          auVar218._28_4_ = auVar231._28_4_ + fStack_7a4;
          fVar301 = fVar199 * 0.0 * auVar328._0_4_;
          fVar246 = fVar313 * 0.0 * auVar328._4_4_;
          auVar76._4_4_ = fVar246;
          auVar76._0_4_ = fVar301;
          fVar252 = fVar317 * 0.0 * auVar328._8_4_;
          auVar76._8_4_ = fVar252;
          fVar254 = fVar265 * 0.0 * auVar328._12_4_;
          auVar76._12_4_ = fVar254;
          fVar256 = fVar202 * 0.0 * auVar328._16_4_;
          auVar76._16_4_ = fVar256;
          fVar275 = fVar270 * 0.0 * auVar328._20_4_;
          auVar76._20_4_ = fVar275;
          fVar285 = fVar204 * 0.0 * auVar328._24_4_;
          auVar76._24_4_ = fVar285;
          auVar76._28_4_ = auVar140._28_4_;
          auVar27 = vsubps_avx(local_6e0,auVar74);
          auVar284._0_4_ = (float)local_6c0._0_4_ + fVar301;
          auVar284._4_4_ = (float)local_6c0._4_4_ + fVar246;
          auVar284._8_4_ = fStack_6b8 + fVar252;
          auVar284._12_4_ = fStack_6b4 + fVar254;
          auVar284._16_4_ = fStack_6b0 + fVar256;
          auVar284._20_4_ = fStack_6ac + fVar275;
          auVar284._24_4_ = fStack_6a8 + fVar285;
          auVar284._28_4_ = fStack_6a4 + auVar140._28_4_;
          auVar25 = vsubps_avx(auVar231,auVar75);
          auVar26 = vsubps_avx(_local_6c0,auVar76);
          auVar32 = vsubps_avx(auVar218,auVar306);
          auVar19 = vsubps_avx(auVar284,auVar28);
          auVar77._4_4_ = auVar28._4_4_ * auVar32._4_4_;
          auVar77._0_4_ = auVar28._0_4_ * auVar32._0_4_;
          auVar77._8_4_ = auVar28._8_4_ * auVar32._8_4_;
          auVar77._12_4_ = auVar28._12_4_ * auVar32._12_4_;
          auVar77._16_4_ = auVar28._16_4_ * auVar32._16_4_;
          auVar77._20_4_ = auVar28._20_4_ * auVar32._20_4_;
          auVar77._24_4_ = auVar28._24_4_ * auVar32._24_4_;
          auVar77._28_4_ = auVar323._28_4_;
          auVar78._4_4_ = auVar306._4_4_ * auVar19._4_4_;
          auVar78._0_4_ = auVar306._0_4_ * auVar19._0_4_;
          auVar78._8_4_ = auVar306._8_4_ * auVar19._8_4_;
          auVar78._12_4_ = auVar306._12_4_ * auVar19._12_4_;
          auVar78._16_4_ = auVar306._16_4_ * auVar19._16_4_;
          auVar78._20_4_ = auVar306._20_4_ * auVar19._20_4_;
          auVar78._24_4_ = auVar306._24_4_ * auVar19._24_4_;
          auVar78._28_4_ = fStack_6a4;
          auVar135 = vsubps_avx(auVar78,auVar77);
          auVar79._4_4_ = auVar161._4_4_ * auVar19._4_4_;
          auVar79._0_4_ = auVar161._0_4_ * auVar19._0_4_;
          auVar79._8_4_ = auVar161._8_4_ * auVar19._8_4_;
          auVar79._12_4_ = auVar161._12_4_ * auVar19._12_4_;
          auVar79._16_4_ = auVar161._16_4_ * auVar19._16_4_;
          auVar79._20_4_ = auVar161._20_4_ * auVar19._20_4_;
          auVar79._24_4_ = auVar161._24_4_ * auVar19._24_4_;
          auVar79._28_4_ = auVar19._28_4_;
          auVar19 = vsubps_avx(auVar330,auVar161);
          auVar80._4_4_ = auVar28._4_4_ * auVar19._4_4_;
          auVar80._0_4_ = auVar28._0_4_ * auVar19._0_4_;
          auVar80._8_4_ = auVar28._8_4_ * auVar19._8_4_;
          auVar80._12_4_ = auVar28._12_4_ * auVar19._12_4_;
          auVar80._16_4_ = auVar28._16_4_ * auVar19._16_4_;
          auVar80._20_4_ = auVar28._20_4_ * auVar19._20_4_;
          auVar80._24_4_ = auVar28._24_4_ * auVar19._24_4_;
          auVar80._28_4_ = auVar18._28_4_;
          auVar194 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = auVar306._4_4_ * auVar19._4_4_;
          auVar81._0_4_ = auVar306._0_4_ * auVar19._0_4_;
          auVar81._8_4_ = auVar306._8_4_ * auVar19._8_4_;
          auVar81._12_4_ = auVar306._12_4_ * auVar19._12_4_;
          auVar81._16_4_ = auVar306._16_4_ * auVar19._16_4_;
          auVar81._20_4_ = auVar306._20_4_ * auVar19._20_4_;
          auVar81._24_4_ = auVar306._24_4_ * auVar19._24_4_;
          auVar81._28_4_ = auVar18._28_4_;
          auVar82._4_4_ = auVar161._4_4_ * auVar32._4_4_;
          auVar82._0_4_ = auVar161._0_4_ * auVar32._0_4_;
          auVar82._8_4_ = auVar161._8_4_ * auVar32._8_4_;
          auVar82._12_4_ = auVar161._12_4_ * auVar32._12_4_;
          auVar82._16_4_ = auVar161._16_4_ * auVar32._16_4_;
          auVar82._20_4_ = auVar161._20_4_ * auVar32._20_4_;
          auVar82._24_4_ = auVar161._24_4_ * auVar32._24_4_;
          auVar82._28_4_ = auVar32._28_4_;
          auVar18 = vsubps_avx(auVar82,auVar81);
          auVar159._0_4_ = auVar135._0_4_ * 0.0 + auVar18._0_4_ + auVar194._0_4_ * 0.0;
          auVar159._4_4_ = auVar135._4_4_ * 0.0 + auVar18._4_4_ + auVar194._4_4_ * 0.0;
          auVar159._8_4_ = auVar135._8_4_ * 0.0 + auVar18._8_4_ + auVar194._8_4_ * 0.0;
          auVar159._12_4_ = auVar135._12_4_ * 0.0 + auVar18._12_4_ + auVar194._12_4_ * 0.0;
          auVar159._16_4_ = auVar135._16_4_ * 0.0 + auVar18._16_4_ + auVar194._16_4_ * 0.0;
          auVar159._20_4_ = auVar135._20_4_ * 0.0 + auVar18._20_4_ + auVar194._20_4_ * 0.0;
          auVar159._24_4_ = auVar135._24_4_ * 0.0 + auVar18._24_4_ + auVar194._24_4_ * 0.0;
          auVar159._28_4_ = auVar135._28_4_ + auVar18._28_4_ + auVar194._28_4_;
          auVar250 = vcmpps_avx(auVar159,ZEXT432(0) << 0x20,2);
          auVar18 = vblendvps_avx(auVar27,_local_880,auVar250);
          auVar198 = ZEXT3264(auVar18);
          auVar27 = vblendvps_avx(auVar25,_local_640,auVar250);
          auVar25 = vblendvps_avx(auVar26,auVar336,auVar250);
          auVar26 = vblendvps_avx(auVar161,auVar330,auVar250);
          auVar32 = vblendvps_avx(auVar306,auVar218,auVar250);
          auVar19 = vblendvps_avx(auVar28,auVar284,auVar250);
          auVar135 = vblendvps_avx(auVar330,auVar161,auVar250);
          auVar194 = vblendvps_avx(auVar218,auVar306,auVar250);
          auVar215 = vblendvps_avx(auVar284,auVar28,auVar250);
          auVar161 = vandps_avx(local_620,_local_560);
          auVar135 = vsubps_avx(auVar135,auVar18);
          auVar29 = vsubps_avx(auVar194,auVar27);
          auVar30 = vsubps_avx(auVar215,auVar25);
          auVar215 = vsubps_avx(auVar27,auVar32);
          fVar301 = auVar29._0_4_;
          fVar247 = auVar25._0_4_;
          fVar289 = auVar29._4_4_;
          fVar253 = auVar25._4_4_;
          auVar83._4_4_ = fVar253 * fVar289;
          auVar83._0_4_ = fVar247 * fVar301;
          fVar312 = auVar29._8_4_;
          fVar255 = auVar25._8_4_;
          auVar83._8_4_ = fVar255 * fVar312;
          fVar265 = auVar29._12_4_;
          fVar257 = auVar25._12_4_;
          auVar83._12_4_ = fVar257 * fVar265;
          fVar170 = auVar29._16_4_;
          fVar258 = auVar25._16_4_;
          auVar83._16_4_ = fVar258 * fVar170;
          fVar150 = auVar29._20_4_;
          fVar259 = auVar25._20_4_;
          auVar83._20_4_ = fVar259 * fVar150;
          fVar237 = auVar29._24_4_;
          fVar260 = auVar25._24_4_;
          auVar83._24_4_ = fVar260 * fVar237;
          auVar83._28_4_ = auVar194._28_4_;
          fVar246 = auVar27._0_4_;
          fVar277 = auVar30._0_4_;
          fVar291 = auVar27._4_4_;
          fVar287 = auVar30._4_4_;
          auVar84._4_4_ = fVar287 * fVar291;
          auVar84._0_4_ = fVar277 * fVar246;
          fVar199 = auVar27._8_4_;
          fVar290 = auVar30._8_4_;
          auVar84._8_4_ = fVar290 * fVar199;
          fVar267 = auVar27._12_4_;
          fVar292 = auVar30._12_4_;
          auVar84._12_4_ = fVar292 * fVar267;
          fVar296 = auVar27._16_4_;
          fVar293 = auVar30._16_4_;
          auVar84._16_4_ = fVar293 * fVar296;
          fVar151 = auVar27._20_4_;
          fVar294 = auVar30._20_4_;
          auVar84._20_4_ = fVar294 * fVar151;
          fVar238 = auVar27._24_4_;
          fVar295 = auVar30._24_4_;
          uVar126 = auVar306._28_4_;
          auVar84._24_4_ = fVar295 * fVar238;
          auVar84._28_4_ = uVar126;
          auVar194 = vsubps_avx(auVar84,auVar83);
          fVar252 = auVar18._0_4_;
          fVar325 = auVar18._4_4_;
          auVar85._4_4_ = fVar287 * fVar325;
          auVar85._0_4_ = fVar277 * fVar252;
          fVar266 = auVar18._8_4_;
          auVar85._8_4_ = fVar290 * fVar266;
          fVar202 = auVar18._12_4_;
          auVar85._12_4_ = fVar292 * fVar202;
          fVar144 = auVar18._16_4_;
          auVar85._16_4_ = fVar293 * fVar144;
          fVar223 = auVar18._20_4_;
          auVar85._20_4_ = fVar294 * fVar223;
          fVar239 = auVar18._24_4_;
          auVar85._24_4_ = fVar295 * fVar239;
          auVar85._28_4_ = uVar126;
          fVar254 = auVar135._0_4_;
          fVar314 = auVar135._4_4_;
          auVar86._4_4_ = fVar253 * fVar314;
          auVar86._0_4_ = fVar247 * fVar254;
          fVar313 = auVar135._8_4_;
          auVar86._8_4_ = fVar255 * fVar313;
          fVar271 = auVar135._12_4_;
          auVar86._12_4_ = fVar257 * fVar271;
          fVar146 = auVar135._16_4_;
          auVar86._16_4_ = fVar258 * fVar146;
          fVar200 = auVar135._20_4_;
          auVar86._20_4_ = fVar259 * fVar200;
          fVar269 = auVar135._24_4_;
          auVar86._24_4_ = fVar260 * fVar269;
          auVar86._28_4_ = auVar330._28_4_;
          auVar306 = vsubps_avx(auVar86,auVar85);
          auVar87._4_4_ = fVar291 * fVar314;
          auVar87._0_4_ = fVar246 * fVar254;
          auVar87._8_4_ = fVar199 * fVar313;
          auVar87._12_4_ = fVar267 * fVar271;
          auVar87._16_4_ = fVar296 * fVar146;
          auVar87._20_4_ = fVar151 * fVar200;
          auVar87._24_4_ = fVar238 * fVar269;
          auVar87._28_4_ = uVar126;
          auVar88._4_4_ = fVar325 * fVar289;
          auVar88._0_4_ = fVar252 * fVar301;
          auVar88._8_4_ = fVar266 * fVar312;
          auVar88._12_4_ = fVar202 * fVar265;
          auVar88._16_4_ = fVar144 * fVar170;
          auVar88._20_4_ = fVar223 * fVar150;
          auVar88._24_4_ = fVar239 * fVar237;
          auVar88._28_4_ = auVar28._28_4_;
          auVar28 = vsubps_avx(auVar88,auVar87);
          auVar31 = vsubps_avx(auVar25,auVar19);
          fVar275 = auVar28._28_4_ + auVar306._28_4_;
          local_800._0_4_ = auVar28._0_4_ + auVar306._0_4_ * 0.0 + auVar194._0_4_ * 0.0;
          local_800._4_4_ = auVar28._4_4_ + auVar306._4_4_ * 0.0 + auVar194._4_4_ * 0.0;
          local_800._8_4_ = auVar28._8_4_ + auVar306._8_4_ * 0.0 + auVar194._8_4_ * 0.0;
          local_800._12_4_ = auVar28._12_4_ + auVar306._12_4_ * 0.0 + auVar194._12_4_ * 0.0;
          local_800._16_4_ = auVar28._16_4_ + auVar306._16_4_ * 0.0 + auVar194._16_4_ * 0.0;
          local_800._20_4_ = auVar28._20_4_ + auVar306._20_4_ * 0.0 + auVar194._20_4_ * 0.0;
          local_800._24_4_ = auVar28._24_4_ + auVar306._24_4_ * 0.0 + auVar194._24_4_ * 0.0;
          local_800._28_4_ = fVar275 + auVar194._28_4_;
          fVar256 = auVar215._0_4_;
          fVar302 = auVar215._4_4_;
          auVar89._4_4_ = auVar19._4_4_ * fVar302;
          auVar89._0_4_ = auVar19._0_4_ * fVar256;
          fVar315 = auVar215._8_4_;
          auVar89._8_4_ = auVar19._8_4_ * fVar315;
          fVar270 = auVar215._12_4_;
          auVar89._12_4_ = auVar19._12_4_ * fVar270;
          fVar147 = auVar215._16_4_;
          auVar89._16_4_ = auVar19._16_4_ * fVar147;
          fVar201 = auVar215._20_4_;
          auVar89._20_4_ = auVar19._20_4_ * fVar201;
          fVar272 = auVar215._24_4_;
          auVar89._24_4_ = auVar19._24_4_ * fVar272;
          auVar89._28_4_ = fVar275;
          fVar275 = auVar31._0_4_;
          fVar316 = auVar31._4_4_;
          auVar90._4_4_ = auVar32._4_4_ * fVar316;
          auVar90._0_4_ = auVar32._0_4_ * fVar275;
          fVar317 = auVar31._8_4_;
          auVar90._8_4_ = auVar32._8_4_ * fVar317;
          fVar273 = auVar31._12_4_;
          auVar90._12_4_ = auVar32._12_4_ * fVar273;
          fVar148 = auVar31._16_4_;
          auVar90._16_4_ = auVar32._16_4_ * fVar148;
          fVar203 = auVar31._20_4_;
          auVar90._20_4_ = auVar32._20_4_ * fVar203;
          fVar276 = auVar31._24_4_;
          auVar90._24_4_ = auVar32._24_4_ * fVar276;
          auVar90._28_4_ = auVar28._28_4_;
          auVar215 = vsubps_avx(auVar90,auVar89);
          auVar306 = vsubps_avx(auVar18,auVar26);
          fVar285 = auVar306._0_4_;
          fVar310 = auVar306._4_4_;
          auVar91._4_4_ = auVar19._4_4_ * fVar310;
          auVar91._0_4_ = auVar19._0_4_ * fVar285;
          fVar268 = auVar306._8_4_;
          auVar91._8_4_ = auVar19._8_4_ * fVar268;
          fVar204 = auVar306._12_4_;
          auVar91._12_4_ = auVar19._12_4_ * fVar204;
          fVar149 = auVar306._16_4_;
          auVar91._16_4_ = auVar19._16_4_ * fVar149;
          fVar274 = auVar306._20_4_;
          auVar91._20_4_ = auVar19._20_4_ * fVar274;
          fVar286 = auVar306._24_4_;
          auVar91._24_4_ = auVar19._24_4_ * fVar286;
          auVar91._28_4_ = auVar19._28_4_;
          auVar92._4_4_ = fVar316 * auVar26._4_4_;
          auVar92._0_4_ = fVar275 * auVar26._0_4_;
          auVar92._8_4_ = fVar317 * auVar26._8_4_;
          auVar92._12_4_ = fVar273 * auVar26._12_4_;
          auVar92._16_4_ = fVar148 * auVar26._16_4_;
          auVar92._20_4_ = fVar203 * auVar26._20_4_;
          auVar92._24_4_ = fVar276 * auVar26._24_4_;
          auVar92._28_4_ = auVar194._28_4_;
          auVar19 = vsubps_avx(auVar91,auVar92);
          auVar93._4_4_ = auVar32._4_4_ * fVar310;
          auVar93._0_4_ = auVar32._0_4_ * fVar285;
          auVar93._8_4_ = auVar32._8_4_ * fVar268;
          auVar93._12_4_ = auVar32._12_4_ * fVar204;
          auVar93._16_4_ = auVar32._16_4_ * fVar149;
          auVar93._20_4_ = auVar32._20_4_ * fVar274;
          auVar93._24_4_ = auVar32._24_4_ * fVar286;
          auVar93._28_4_ = auVar32._28_4_;
          auVar94._4_4_ = fVar302 * auVar26._4_4_;
          auVar94._0_4_ = fVar256 * auVar26._0_4_;
          auVar94._8_4_ = fVar315 * auVar26._8_4_;
          auVar94._12_4_ = fVar270 * auVar26._12_4_;
          auVar94._16_4_ = fVar147 * auVar26._16_4_;
          auVar94._20_4_ = fVar201 * auVar26._20_4_;
          auVar94._24_4_ = fVar272 * auVar26._24_4_;
          auVar94._28_4_ = auVar26._28_4_;
          auVar26 = vsubps_avx(auVar94,auVar93);
          auVar141._0_4_ = auVar215._0_4_ * 0.0 + auVar26._0_4_ + auVar19._0_4_ * 0.0;
          auVar141._4_4_ = auVar215._4_4_ * 0.0 + auVar26._4_4_ + auVar19._4_4_ * 0.0;
          auVar141._8_4_ = auVar215._8_4_ * 0.0 + auVar26._8_4_ + auVar19._8_4_ * 0.0;
          auVar141._12_4_ = auVar215._12_4_ * 0.0 + auVar26._12_4_ + auVar19._12_4_ * 0.0;
          auVar141._16_4_ = auVar215._16_4_ * 0.0 + auVar26._16_4_ + auVar19._16_4_ * 0.0;
          auVar141._20_4_ = auVar215._20_4_ * 0.0 + auVar26._20_4_ + auVar19._20_4_ * 0.0;
          auVar141._24_4_ = auVar215._24_4_ * 0.0 + auVar26._24_4_ + auVar19._24_4_ * 0.0;
          auVar141._28_4_ = auVar19._28_4_ + auVar26._28_4_ + auVar19._28_4_;
          auVar26 = vmaxps_avx(local_800,auVar141);
          auVar26 = vcmpps_avx(auVar26,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar32 = auVar161 & auVar26;
          if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar32 >> 0x7f,0) == '\0') &&
                (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar32 >> 0xbf,0) == '\0') &&
              (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar32[0x1f]) {
LAB_008e227b:
            auVar288 = auVar30._4_12_;
            auVar164 = ZEXT3264(CONCAT824(uStack_588,
                                          CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
            auVar161 = vcmpps_avx(auVar31,auVar31,0xf);
            auVar307 = ZEXT3264(auVar161);
          }
          else {
            auVar32 = vandps_avx(auVar26,auVar161);
            auVar95._4_4_ = fVar316 * fVar289;
            auVar95._0_4_ = fVar275 * fVar301;
            auVar95._8_4_ = fVar317 * fVar312;
            auVar95._12_4_ = fVar273 * fVar265;
            auVar95._16_4_ = fVar148 * fVar170;
            auVar95._20_4_ = fVar203 * fVar150;
            auVar95._24_4_ = fVar276 * fVar237;
            auVar95._28_4_ = auVar161._28_4_;
            auVar96._4_4_ = fVar302 * fVar287;
            auVar96._0_4_ = fVar256 * fVar277;
            auVar96._8_4_ = fVar315 * fVar290;
            auVar96._12_4_ = fVar270 * fVar292;
            auVar96._16_4_ = fVar147 * fVar293;
            auVar96._20_4_ = fVar201 * fVar294;
            auVar96._24_4_ = fVar272 * fVar295;
            auVar96._28_4_ = auVar26._28_4_;
            auVar26 = vsubps_avx(auVar96,auVar95);
            auVar97._4_4_ = fVar310 * fVar287;
            auVar97._0_4_ = fVar285 * fVar277;
            auVar97._8_4_ = fVar268 * fVar290;
            auVar97._12_4_ = fVar204 * fVar292;
            auVar97._16_4_ = fVar149 * fVar293;
            auVar97._20_4_ = fVar274 * fVar294;
            auVar97._24_4_ = fVar286 * fVar295;
            auVar97._28_4_ = auVar30._28_4_;
            auVar98._4_4_ = fVar316 * fVar314;
            auVar98._0_4_ = fVar275 * fVar254;
            auVar98._8_4_ = fVar317 * fVar313;
            auVar98._12_4_ = fVar273 * fVar271;
            auVar98._16_4_ = fVar148 * fVar146;
            auVar98._20_4_ = fVar203 * fVar200;
            auVar98._24_4_ = fVar276 * fVar269;
            auVar98._28_4_ = auVar31._28_4_;
            auVar30 = vsubps_avx(auVar98,auVar97);
            auVar288 = auVar30._4_12_;
            auVar99._4_4_ = fVar302 * fVar314;
            auVar99._0_4_ = fVar256 * fVar254;
            auVar99._8_4_ = fVar315 * fVar313;
            auVar99._12_4_ = fVar270 * fVar271;
            auVar99._16_4_ = fVar147 * fVar146;
            auVar99._20_4_ = fVar201 * fVar200;
            auVar99._24_4_ = fVar272 * fVar269;
            auVar99._28_4_ = auVar135._28_4_;
            auVar100._4_4_ = fVar310 * fVar289;
            auVar100._0_4_ = fVar285 * fVar301;
            auVar100._8_4_ = fVar268 * fVar312;
            auVar100._12_4_ = fVar204 * fVar265;
            auVar100._16_4_ = fVar149 * fVar170;
            auVar100._20_4_ = fVar274 * fVar150;
            auVar100._24_4_ = fVar286 * fVar237;
            auVar100._28_4_ = auVar29._28_4_;
            auVar19 = vsubps_avx(auVar100,auVar99);
            auVar160._0_4_ = auVar26._0_4_ * 0.0 + auVar19._0_4_ + auVar30._0_4_ * 0.0;
            auVar160._4_4_ = auVar26._4_4_ * 0.0 + auVar19._4_4_ + auVar30._4_4_ * 0.0;
            auVar160._8_4_ = auVar26._8_4_ * 0.0 + auVar19._8_4_ + auVar30._8_4_ * 0.0;
            auVar160._12_4_ = auVar26._12_4_ * 0.0 + auVar19._12_4_ + auVar30._12_4_ * 0.0;
            auVar160._16_4_ = auVar26._16_4_ * 0.0 + auVar19._16_4_ + auVar30._16_4_ * 0.0;
            auVar160._20_4_ = auVar26._20_4_ * 0.0 + auVar19._20_4_ + auVar30._20_4_ * 0.0;
            auVar160._24_4_ = auVar26._24_4_ * 0.0 + auVar19._24_4_ + auVar30._24_4_ * 0.0;
            auVar160._28_4_ = auVar29._28_4_ + auVar19._28_4_ + auVar135._28_4_;
            auVar161 = vrcpps_avx(auVar160);
            fVar301 = auVar161._0_4_;
            fVar254 = auVar161._4_4_;
            auVar101._4_4_ = auVar160._4_4_ * fVar254;
            auVar101._0_4_ = auVar160._0_4_ * fVar301;
            fVar256 = auVar161._8_4_;
            auVar101._8_4_ = auVar160._8_4_ * fVar256;
            fVar275 = auVar161._12_4_;
            auVar101._12_4_ = auVar160._12_4_ * fVar275;
            fVar285 = auVar161._16_4_;
            auVar101._16_4_ = auVar160._16_4_ * fVar285;
            fVar289 = auVar161._20_4_;
            auVar101._20_4_ = auVar160._20_4_ * fVar289;
            fVar314 = auVar161._24_4_;
            auVar101._24_4_ = auVar160._24_4_ * fVar314;
            auVar101._28_4_ = auVar31._28_4_;
            auVar324._8_4_ = 0x3f800000;
            auVar324._0_8_ = 0x3f8000003f800000;
            auVar324._12_4_ = 0x3f800000;
            auVar324._16_4_ = 0x3f800000;
            auVar324._20_4_ = 0x3f800000;
            auVar324._24_4_ = 0x3f800000;
            auVar324._28_4_ = 0x3f800000;
            auVar161 = vsubps_avx(auVar324,auVar101);
            fVar302 = auVar161._0_4_ * fVar301;
            fVar316 = auVar161._4_4_ * fVar254;
            auVar31._4_4_ = fVar316;
            auVar31._0_4_ = fVar302;
            fVar310 = auVar161._8_4_ * fVar256;
            auVar31._8_4_ = fVar310;
            fVar312 = auVar161._12_4_ * fVar275;
            auVar31._12_4_ = fVar312;
            fVar313 = auVar161._16_4_ * fVar285;
            auVar31._16_4_ = fVar313;
            fVar315 = auVar161._20_4_ * fVar289;
            auVar31._20_4_ = fVar315;
            fVar317 = auVar161._24_4_ * fVar314;
            auVar31._24_4_ = fVar317;
            auVar31._28_4_ = auVar161._28_4_;
            fVar302 = fVar302 + fVar301;
            fVar316 = fVar316 + fVar254;
            fVar310 = fVar310 + fVar256;
            fVar312 = fVar312 + fVar275;
            fVar313 = fVar313 + fVar285;
            fVar315 = fVar315 + fVar289;
            fVar317 = fVar317 + fVar314;
            auVar102._4_4_ =
                 (fVar325 * auVar26._4_4_ + auVar30._4_4_ * fVar291 + auVar19._4_4_ * fVar253) *
                 fVar316;
            auVar102._0_4_ =
                 (fVar252 * auVar26._0_4_ + auVar30._0_4_ * fVar246 + auVar19._0_4_ * fVar247) *
                 fVar302;
            auVar102._8_4_ =
                 (fVar266 * auVar26._8_4_ + auVar30._8_4_ * fVar199 + auVar19._8_4_ * fVar255) *
                 fVar310;
            auVar102._12_4_ =
                 (fVar202 * auVar26._12_4_ + auVar30._12_4_ * fVar267 + auVar19._12_4_ * fVar257) *
                 fVar312;
            auVar102._16_4_ =
                 (fVar144 * auVar26._16_4_ + auVar30._16_4_ * fVar296 + auVar19._16_4_ * fVar258) *
                 fVar313;
            auVar102._20_4_ =
                 (fVar223 * auVar26._20_4_ + auVar30._20_4_ * fVar151 + auVar19._20_4_ * fVar259) *
                 fVar315;
            auVar102._24_4_ =
                 (fVar239 * auVar26._24_4_ + auVar30._24_4_ * fVar238 + auVar19._24_4_ * fVar260) *
                 fVar317;
            auVar102._28_4_ = auVar18._28_4_ + auVar27._28_4_ + auVar25._28_4_;
            auVar198 = ZEXT3264(auVar102);
            uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar219._4_4_ = uVar126;
            auVar219._0_4_ = uVar126;
            auVar219._8_4_ = uVar126;
            auVar219._12_4_ = uVar126;
            auVar219._16_4_ = uVar126;
            auVar219._20_4_ = uVar126;
            auVar219._24_4_ = uVar126;
            auVar219._28_4_ = uVar126;
            auVar161 = vcmpps_avx(local_100,auVar102,2);
            auVar18 = vcmpps_avx(auVar102,auVar219,2);
            auVar161 = vandps_avx(auVar161,auVar18);
            auVar27 = auVar32 & auVar161;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) goto LAB_008e227b;
            auVar161 = vandps_avx(auVar32,auVar161);
            auVar27 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar160,4);
            auVar26 = auVar161 & auVar27;
            auVar164 = ZEXT3264(CONCAT824(uStack_588,
                                          CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
            auVar25 = vcmpps_avx(auVar31,auVar31,0xf);
            auVar307 = ZEXT3264(auVar25);
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar161 = vandps_avx(auVar27,auVar161);
              auVar164 = ZEXT3264(auVar161);
              auVar103._4_4_ = fVar316 * local_800._4_4_;
              auVar103._0_4_ = fVar302 * (float)local_800._0_4_;
              auVar103._8_4_ = fVar310 * local_800._8_4_;
              auVar103._12_4_ = fVar312 * local_800._12_4_;
              auVar103._16_4_ = fVar313 * local_800._16_4_;
              auVar103._20_4_ = fVar315 * local_800._20_4_;
              auVar103._24_4_ = fVar317 * local_800._24_4_;
              auVar103._28_4_ = auVar18._28_4_;
              auVar104._4_4_ = auVar141._4_4_ * fVar316;
              auVar104._0_4_ = auVar141._0_4_ * fVar302;
              auVar104._8_4_ = auVar141._8_4_ * fVar310;
              auVar104._12_4_ = auVar141._12_4_ * fVar312;
              auVar104._16_4_ = auVar141._16_4_ * fVar313;
              auVar104._20_4_ = auVar141._20_4_ * fVar315;
              auVar104._24_4_ = auVar141._24_4_ * fVar317;
              auVar104._28_4_ = auVar141._28_4_;
              auVar245._8_4_ = 0x3f800000;
              auVar245._0_8_ = 0x3f8000003f800000;
              auVar245._12_4_ = 0x3f800000;
              auVar245._16_4_ = 0x3f800000;
              auVar245._20_4_ = 0x3f800000;
              auVar245._24_4_ = 0x3f800000;
              auVar245._28_4_ = 0x3f800000;
              auVar161 = vsubps_avx(auVar245,auVar103);
              local_2c0 = vblendvps_avx(auVar161,auVar103,auVar250);
              auVar161 = vsubps_avx(auVar245,auVar104);
              _local_500 = vblendvps_avx(auVar161,auVar104,auVar250);
              local_2e0 = auVar102;
            }
          }
          auVar161 = auVar164._0_32_;
          if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar161 >> 0x7f,0) == '\0') &&
                (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar161 >> 0xbf,0) == '\0') &&
              (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar164[0x1f]) {
            auVar233 = ZEXT3264(auVar214);
          }
          else {
            auVar110._4_4_ = fVar145;
            auVar110._0_4_ = fVar129;
            auVar110._8_4_ = fStack_7b8;
            auVar110._12_4_ = fStack_7b4;
            auVar110._16_4_ = fStack_7b0;
            auVar110._20_4_ = fStack_7ac;
            auVar110._24_4_ = fStack_7a8;
            auVar110._28_4_ = fStack_7a4;
            auVar18 = vsubps_avx(auVar328,auVar110);
            auVar198 = ZEXT3264(local_2c0);
            fVar129 = fVar129 + auVar18._0_4_ * local_2c0._0_4_;
            fVar145 = fVar145 + auVar18._4_4_ * local_2c0._4_4_;
            fVar246 = fStack_7b8 + auVar18._8_4_ * local_2c0._8_4_;
            fVar252 = fStack_7b4 + auVar18._12_4_ * local_2c0._12_4_;
            fVar254 = fStack_7b0 + auVar18._16_4_ * local_2c0._16_4_;
            fVar256 = fStack_7ac + auVar18._20_4_ * local_2c0._20_4_;
            fVar275 = fStack_7a8 + auVar18._24_4_ * local_2c0._24_4_;
            fVar285 = fStack_7a4 + auVar18._28_4_;
            fVar301 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar105._4_4_ = (fVar145 + fVar145) * fVar301;
            auVar105._0_4_ = (fVar129 + fVar129) * fVar301;
            auVar105._8_4_ = (fVar246 + fVar246) * fVar301;
            auVar105._12_4_ = (fVar252 + fVar252) * fVar301;
            auVar105._16_4_ = (fVar254 + fVar254) * fVar301;
            auVar105._20_4_ = (fVar256 + fVar256) * fVar301;
            auVar105._24_4_ = (fVar275 + fVar275) * fVar301;
            auVar105._28_4_ = fVar285 + fVar285;
            auVar18 = vcmpps_avx(local_2e0,auVar105,6);
            auVar27 = auVar161 & auVar18;
            auVar233 = ZEXT3264(auVar214);
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              local_360 = vandps_avx(auVar18,auVar161);
              auVar155._0_8_ =
                   CONCAT44((float)local_500._4_4_ + (float)local_500._4_4_ + -1.0,
                            (float)local_500._0_4_ + (float)local_500._0_4_ + -1.0);
              auVar155._8_4_ = (float)uStack_4f8 + (float)uStack_4f8 + -1.0;
              auVar155._12_4_ = uStack_4f8._4_4_ + uStack_4f8._4_4_ + -1.0;
              auVar156._16_4_ = (float)uStack_4f0 + (float)uStack_4f0 + -1.0;
              auVar156._0_16_ = auVar155;
              auVar156._20_4_ = uStack_4f0._4_4_ + uStack_4f0._4_4_ + -1.0;
              fStack_3e8 = (float)uStack_4e8 + (float)uStack_4e8 + -1.0;
              _local_400 = auVar156;
              fStack_3e4 = uStack_4e8._4_4_ + uStack_4e8._4_4_ + -1.0;
              auVar164 = ZEXT3264(_local_400);
              local_420 = local_2c0;
              local_3e0 = local_2e0;
              local_3b0 = local_760;
              uStack_3a8 = uStack_758;
              local_3a0 = local_770;
              uStack_398 = uStack_768;
              local_390 = local_690;
              uStack_388 = uStack_688;
              local_380 = local_6a0;
              uStack_378 = uStack_698;
              pGVar125 = (context->scene->geometries).items[uVar119].ptr;
              _local_500 = _local_400;
              if ((pGVar125->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar121 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar121 = context->args;
                if ((pRVar121->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar121 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar121 >> 8),1),
                   pGVar125->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_7a0._4_28_ = auVar231._4_28_;
                  local_7a0._0_4_ = (int)uVar124;
                  auVar176._0_4_ = (float)(int)local_3c0;
                  auVar176._4_12_ = auVar288;
                  auVar227 = vshufps_avx(auVar176,auVar176,0);
                  local_340[0] = (auVar227._0_4_ + local_2c0._0_4_ + 0.0) * (float)local_140._0_4_;
                  local_340[1] = (auVar227._4_4_ + local_2c0._4_4_ + 1.0) * (float)local_140._4_4_;
                  local_340[2] = (auVar227._8_4_ + local_2c0._8_4_ + 2.0) * fStack_138;
                  local_340[3] = (auVar227._12_4_ + local_2c0._12_4_ + 3.0) * fStack_134;
                  fStack_330 = (auVar227._0_4_ + local_2c0._16_4_ + 4.0) * fStack_130;
                  fStack_32c = (auVar227._4_4_ + local_2c0._20_4_ + 5.0) * fStack_12c;
                  fStack_328 = (auVar227._8_4_ + local_2c0._24_4_ + 6.0) * fStack_128;
                  fStack_324 = auVar227._12_4_ + (float)local_2c0._28_4_ + 7.0;
                  uStack_4f8 = auVar155._8_8_;
                  uStack_4f0 = auVar156._16_8_;
                  uStack_4e8 = local_400._24_8_;
                  local_320 = auVar155._0_8_;
                  uStack_318 = uStack_4f8;
                  uStack_310 = uStack_4f0;
                  uStack_308 = uStack_4e8;
                  auVar164 = ZEXT3264(local_2e0);
                  local_300 = local_2e0;
                  uVar126 = vmovmskps_avx(local_360);
                  uVar124 = CONCAT44((int)((ulong)pRVar121 >> 0x20),uVar126);
                  uVar122 = 0;
                  if (uVar124 != 0) {
                    for (; (uVar124 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                    }
                  }
                  local_6e0._0_8_ = pGVar125;
                  _local_700 = auVar328;
                  local_3bc = uVar11;
                  while (auVar161 = auVar307._0_32_, uVar124 != 0) {
                    local_7c0 = (uint)uVar124;
                    uStack_7bc = (undefined4)(uVar124 >> 0x20);
                    local_800._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_200 = local_340[uVar122];
                    local_1e0 = *(undefined4 *)((long)&local_320 + uVar122 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar122 * 4);
                    fVar308 = 1.0 - local_200;
                    fVar300 = local_200 * fVar308 * 4.0;
                    auVar227 = ZEXT416((uint)(local_200 * local_200 * 0.5));
                    auVar227 = vshufps_avx(auVar227,auVar227,0);
                    auVar177 = ZEXT416((uint)((fVar308 * fVar308 + fVar300) * 0.5));
                    auVar177 = vshufps_avx(auVar177,auVar177,0);
                    auVar213 = ZEXT416((uint)((-local_200 * local_200 - fVar300) * 0.5));
                    auVar213 = vshufps_avx(auVar213,auVar213,0);
                    local_730.context = context->user;
                    auVar193 = ZEXT416((uint)(fVar308 * -fVar308 * 0.5));
                    auVar193 = vshufps_avx(auVar193,auVar193,0);
                    auVar178._0_4_ =
                         auVar193._0_4_ * (float)local_760._0_4_ +
                         auVar213._0_4_ * (float)local_770._0_4_ +
                         auVar227._0_4_ * (float)local_6a0._0_4_ +
                         auVar177._0_4_ * (float)local_690._0_4_;
                    auVar178._4_4_ =
                         auVar193._4_4_ * (float)local_760._4_4_ +
                         auVar213._4_4_ * (float)local_770._4_4_ +
                         auVar227._4_4_ * (float)local_6a0._4_4_ +
                         auVar177._4_4_ * (float)local_690._4_4_;
                    auVar178._8_4_ =
                         auVar193._8_4_ * (float)uStack_758 +
                         auVar213._8_4_ * (float)uStack_768 +
                         auVar227._8_4_ * (float)uStack_698 + auVar177._8_4_ * (float)uStack_688;
                    auVar178._12_4_ =
                         auVar193._12_4_ * uStack_758._4_4_ +
                         auVar213._12_4_ * uStack_768._4_4_ +
                         auVar227._12_4_ * uStack_698._4_4_ + auVar177._12_4_ * uStack_688._4_4_;
                    local_250 = vshufps_avx(auVar178,auVar178,0);
                    local_260[0] = (RTCHitN)local_250[0];
                    local_260[1] = (RTCHitN)local_250[1];
                    local_260[2] = (RTCHitN)local_250[2];
                    local_260[3] = (RTCHitN)local_250[3];
                    local_260[4] = (RTCHitN)local_250[4];
                    local_260[5] = (RTCHitN)local_250[5];
                    local_260[6] = (RTCHitN)local_250[6];
                    local_260[7] = (RTCHitN)local_250[7];
                    local_260[8] = (RTCHitN)local_250[8];
                    local_260[9] = (RTCHitN)local_250[9];
                    local_260[10] = (RTCHitN)local_250[10];
                    local_260[0xb] = (RTCHitN)local_250[0xb];
                    local_260[0xc] = (RTCHitN)local_250[0xc];
                    local_260[0xd] = (RTCHitN)local_250[0xd];
                    local_260[0xe] = (RTCHitN)local_250[0xe];
                    local_260[0xf] = (RTCHitN)local_250[0xf];
                    local_230 = vshufps_avx(auVar178,auVar178,0x55);
                    local_240 = local_230;
                    local_210 = vshufps_avx(auVar178,auVar178,0xaa);
                    local_220 = local_210;
                    fStack_1fc = local_200;
                    fStack_1f8 = local_200;
                    fStack_1f4 = local_200;
                    fStack_1f0 = local_200;
                    fStack_1ec = local_200;
                    fStack_1e8 = local_200;
                    fStack_1e4 = local_200;
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_120._0_8_;
                    uStack_1b8 = local_120._8_8_;
                    uStack_1b0 = local_120._16_8_;
                    uStack_1a8 = local_120._24_8_;
                    local_1a0 = local_540._0_8_;
                    uStack_198 = local_540._8_8_;
                    uStack_190 = local_540._16_8_;
                    uStack_188 = local_540._24_8_;
                    local_738[1] = auVar161;
                    *local_738 = auVar161;
                    local_180 = (local_730.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_730.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_820 = *local_740;
                    local_810 = *local_748;
                    local_730.valid = (int *)local_820;
                    local_730.geometryUserPtr = pGVar125->userPtr;
                    local_730.hit = local_260;
                    local_730.N = 8;
                    local_730.ray = (RTCRayN *)ray;
                    if (pGVar125->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar161 = ZEXT1632(auVar307._0_16_);
                      (*pGVar125->occlusionFilterN)(&local_730);
                    }
                    auVar164 = ZEXT1664(local_810);
                    auVar227 = vpcmpeqd_avx(local_820,ZEXT816(0) << 0x40);
                    auVar177 = vpcmpeqd_avx(local_810,ZEXT816(0) << 0x40);
                    auVar198 = ZEXT1664(auVar177);
                    auVar182._16_16_ = auVar177;
                    auVar182._0_16_ = auVar227;
                    auVar161 = vcmpps_avx(auVar161,auVar161,0xf);
                    auVar18 = auVar161 & ~auVar182;
                    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar18 >> 0x7f,0) == '\0') &&
                          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar18 >> 0xbf,0) == '\0') &&
                        (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar18[0x1f]) {
                      auVar142._0_4_ = auVar161._0_4_ ^ auVar227._0_4_;
                      auVar142._4_4_ = auVar161._4_4_ ^ auVar227._4_4_;
                      auVar142._8_4_ = auVar161._8_4_ ^ auVar227._8_4_;
                      auVar142._12_4_ = auVar161._12_4_ ^ auVar227._12_4_;
                      auVar142._16_4_ = auVar161._16_4_ ^ auVar177._0_4_;
                      auVar142._20_4_ = auVar161._20_4_ ^ auVar177._4_4_;
                      auVar142._24_4_ = auVar161._24_4_ ^ auVar177._8_4_;
                      auVar142._28_4_ = auVar161._28_4_ ^ auVar177._12_4_;
                    }
                    else {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_6e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar198 = ZEXT1664(auVar177);
                        auVar161 = ZEXT1632(auVar161._0_16_);
                        (*p_Var14)(&local_730);
                      }
                      auVar227 = vpcmpeqd_avx(local_820,ZEXT816(0) << 0x40);
                      auVar177 = vpcmpeqd_avx(local_810,ZEXT816(0) << 0x40);
                      auVar162._16_16_ = auVar177;
                      auVar162._0_16_ = auVar227;
                      auVar161 = vcmpps_avx(auVar161,auVar161,0xf);
                      auVar142._0_4_ = auVar161._0_4_ ^ auVar227._0_4_;
                      auVar142._4_4_ = auVar161._4_4_ ^ auVar227._4_4_;
                      auVar142._8_4_ = auVar161._8_4_ ^ auVar227._8_4_;
                      auVar142._12_4_ = auVar161._12_4_ ^ auVar227._12_4_;
                      auVar142._16_4_ = auVar161._16_4_ ^ auVar177._0_4_;
                      auVar142._20_4_ = auVar161._20_4_ ^ auVar177._4_4_;
                      auVar142._24_4_ = auVar161._24_4_ ^ auVar177._8_4_;
                      auVar142._28_4_ = auVar161._28_4_ ^ auVar177._12_4_;
                      auVar183._8_4_ = 0xff800000;
                      auVar183._0_8_ = 0xff800000ff800000;
                      auVar183._12_4_ = 0xff800000;
                      auVar183._16_4_ = 0xff800000;
                      auVar183._20_4_ = 0xff800000;
                      auVar183._24_4_ = 0xff800000;
                      auVar183._28_4_ = 0xff800000;
                      auVar18 = vblendvps_avx(auVar183,*(undefined1 (*) [32])(local_730.ray + 0x100)
                                              ,auVar162);
                      auVar164 = ZEXT3264(auVar18);
                      *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar18;
                    }
                    auVar307 = ZEXT3264(auVar161);
                    if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar142 >> 0x7f,0) != '\0') ||
                          (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar142 >> 0xbf,0) != '\0') ||
                        (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar142[0x1f] < '\0') {
                      pRVar121 = (RTCIntersectArguments *)0x1;
                      goto LAB_008e22a1;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_800._0_4_;
                    uVar124 = CONCAT44(uStack_7bc,local_7c0) ^ 1L << (uVar122 & 0x3f);
                    uVar122 = 0;
                    pGVar125 = (Geometry *)local_6e0._0_8_;
                    if (uVar124 != 0) {
                      for (; (uVar124 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                      }
                    }
                  }
                  pRVar121 = (RTCIntersectArguments *)0x0;
LAB_008e22a1:
                  uVar124 = (ulong)(uint)local_7a0._0_4_;
                  fVar224 = (float)local_7e0._0_4_;
                  fVar234 = (float)local_7e0._4_4_;
                  fVar235 = fStack_7d8;
                  fVar236 = fStack_7d4;
                  fVar300 = fStack_7d0;
                  fVar308 = fStack_7cc;
                  fVar309 = fStack_7c8;
                }
              }
              auVar233 = ZEXT3264(auVar214);
              uVar124 = CONCAT71((int7)(uVar124 >> 8),(byte)uVar124 | (byte)pRVar121);
            }
          }
        }
      }
    }
    if ((uVar124 & 1) != 0) break;
    uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar133._4_4_ = uVar126;
    auVar133._0_4_ = uVar126;
    auVar133._8_4_ = uVar126;
    auVar133._12_4_ = uVar126;
    auVar227 = vcmpps_avx(local_430,auVar133,2);
    uVar119 = vmovmskps_avx(auVar227);
  }
  return uVar120 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }